

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorCvodeJacobian.cpp
# Opt level: O1

int pele::physics::reactions::cvode::cJac
              (Real param_1,N_Vector u,N_Vector param_3,SUNMatrix J,void *user_data,N_Vector param_6
              ,N_Vector param_7,N_Vector param_8)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  int i;
  realtype *prVar4;
  long lVar5;
  double *pdVar6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 uVar12;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 uVar13;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  Real T_1;
  double dVar26;
  Real invT_1;
  double dVar27;
  Real invT;
  double dVar28;
  Real c [21];
  Real h_RT [21];
  Real T;
  Real dcRdT [21];
  Real c_R [21];
  Real massfrac [21];
  double local_1948 [22];
  undefined1 local_1898 [16];
  double local_1888 [22];
  undefined1 local_17d8 [16];
  undefined1 local_17c8 [16];
  undefined1 local_17b8 [16];
  undefined1 local_17a8 [16];
  double local_1790;
  undefined1 local_1788 [16];
  double local_1778;
  undefined8 uStack_1770;
  undefined1 local_1768 [16];
  double local_1758;
  ulong uStack_1750;
  undefined1 local_1748 [16];
  double local_1738;
  undefined8 uStack_1730;
  undefined1 local_1728 [16];
  undefined1 local_1718 [16];
  double local_1708;
  undefined8 uStack_1700;
  undefined1 local_16f8 [16];
  double local_16e8;
  double dStack_16e0;
  double local_16d8;
  double dStack_16d0;
  double local_16c8;
  double dStack_16c0;
  double local_16b8;
  double dStack_16b0;
  double local_16a8;
  double dStack_16a0;
  double local_1698;
  double dStack_1690;
  double local_1688;
  double dStack_1680;
  double local_1678;
  double dStack_1670;
  double local_1668;
  double dStack_1660;
  double local_1658;
  double dStack_1650;
  double local_1648;
  undefined1 local_1638 [16];
  undefined1 local_1628 [16];
  double local_1618;
  double dStack_1610;
  double local_1600;
  realtype local_15f8;
  ulong uStack_15f0;
  double local_15e8 [2];
  undefined1 auStack_15d8 [16];
  double dStack_15c8;
  double dStack_15c0;
  undefined1 local_15b8 [16];
  undefined1 local_15a8 [16];
  double local_1598;
  double dStack_1590;
  double dStack_1588;
  undefined1 local_1580 [16];
  undefined1 auStack_1570 [16];
  double dStack_1560;
  double local_1558;
  double local_1550;
  double local_1548;
  undefined1 local_1538 [16];
  double local_1528;
  double dStack_1520;
  double local_1518;
  double dStack_1510;
  undefined1 local_1508 [16];
  double local_14f8;
  double local_14e8;
  double dStack_14e0;
  undefined1 local_14d8 [16];
  undefined1 local_14c8 [16];
  undefined1 local_14b8 [16];
  undefined1 local_14a8 [16];
  double local_1490;
  double local_1488 [4];
  double local_1468;
  double local_1460;
  double local_1458;
  double local_1450;
  double local_1448;
  double local_1440;
  double local_1438;
  double local_1430;
  double local_1428;
  double local_1420;
  double local_1418;
  double local_1410;
  double local_1408;
  double local_1400;
  double local_13f8 [3];
  double local_13e0 [114];
  undefined1 local_1050 [16];
  double local_1040;
  double dStack_1038;
  double dStack_1030;
  double local_1020;
  double local_1018;
  double local_1010;
  double local_1008;
  double local_1000;
  double local_ff8;
  double local_ff0;
  double local_fe8;
  double local_fe0;
  double local_fb8;
  double local_fb0;
  double local_fa8;
  double local_fa0;
  double local_f98;
  double local_f90;
  double local_f88;
  double dStack_f80;
  double local_f78;
  double local_f70;
  double local_f68;
  double local_f50;
  double local_f48;
  double local_f38;
  double local_f08;
  double local_f00;
  double local_ef8;
  double local_ef0;
  double local_ee8;
  double local_ee0;
  double local_ed0;
  double local_ec8;
  double dStack_ec0;
  double local_eb8;
  double local_eb0;
  double local_ea8;
  double local_ea0;
  double local_e98;
  double local_e88;
  double local_e58;
  double local_e50;
  double local_e48;
  double local_e40;
  double local_e38;
  double local_e30;
  double local_e28;
  double local_e20;
  double local_e18;
  double dStack_e10;
  double local_e08;
  double dStack_e00;
  double local_df0;
  double local_de8;
  double local_de0;
  double local_dd8;
  double local_dd0;
  double local_dc8;
  double local_da8;
  double local_da0;
  double dStack_d98;
  double local_d90;
  double local_d88;
  double local_d80;
  double local_d78;
  double local_d70;
  double local_d68;
  double local_d60;
  double local_d58;
  double dStack_d50;
  double local_d48;
  double local_d40;
  double local_d38;
  double local_d30;
  double local_d28;
  double local_d20;
  double local_d18;
  double local_cf8;
  double local_cf0;
  double dStack_ce8;
  double local_ce0;
  double local_cd8;
  double local_cd0;
  double local_cc8;
  double local_cc0;
  double local_cb8;
  double local_cb0;
  double local_ca8;
  double dStack_ca0;
  double local_c98;
  double local_c90;
  double local_c88;
  double local_c80;
  double local_c78;
  double local_c70;
  double local_c68;
  double local_c48;
  double local_c40;
  double dStack_c38;
  double local_c30;
  double local_c28;
  double local_c18;
  double local_c10;
  double local_c08;
  double local_c00;
  double local_bf8;
  double local_bf0;
  double local_be8;
  double local_be0;
  double local_bd8;
  double local_bd0;
  double local_bc8;
  double local_bc0;
  double local_bb8;
  double local_b98;
  double local_b90;
  double local_b88;
  double local_b80;
  double local_b78;
  double local_b70;
  double local_b68;
  double local_b60;
  double local_b58;
  double local_b50;
  double local_b48;
  double dStack_b40;
  double local_b38;
  double local_b30;
  double local_b28;
  double local_b18;
  double local_ae8;
  double local_ae0;
  double local_ad8;
  double local_ad0;
  double local_ac8;
  double local_ac0;
  double local_ab8;
  double dStack_ab0;
  double local_aa8;
  double local_aa0;
  double local_a98;
  double local_a90;
  double local_a88;
  double local_a80;
  double local_a78;
  double local_a70;
  double local_a60;
  double local_a30;
  double local_a28;
  double local_a20;
  double local_a18;
  double local_a08;
  double local_9f0;
  double local_9c8;
  double local_9c0;
  double local_980;
  double local_978;
  double local_970;
  double local_958;
  double local_950;
  double local_948;
  double dStack_940;
  double local_920;
  double local_908;
  double local_900;
  double local_8d8;
  double local_8d0;
  double local_8c8;
  double local_8c0;
  double local_8b8;
  double local_8b0;
  double local_8a8;
  double local_890;
  double local_888;
  double local_868;
  double local_858;
  double local_850;
  double local_848;
  double local_828;
  double local_820;
  double dStack_818;
  double local_810;
  double local_808;
  double local_800;
  double local_7f8;
  double local_7f0;
  double local_7e0;
  double local_7d8;
  double local_7d0;
  double local_7c8;
  double local_7c0;
  double local_7b8;
  double local_7b0;
  double local_7a8;
  double local_7a0;
  double local_798;
  double local_770;
  double local_760;
  double local_748;
  double local_740;
  double local_738;
  double local_6c8;
  double local_6c0;
  double dStack_6b8;
  double local_6b0;
  double local_6a8;
  double local_6a0;
  double local_698;
  double local_690;
  double local_688;
  double local_680;
  double local_678;
  double local_670;
  double local_668;
  double local_660;
  double local_658;
  double local_648;
  double local_640;
  double local_638;
  double local_618 [10];
  undefined1 local_5c8 [16];
  double local_5b8;
  double local_5b0;
  double local_5a8;
  double local_5a0;
  double local_598;
  double local_590;
  double local_588;
  double local_570;
  double local_568;
  double dStack_560;
  double local_558;
  ulong uStack_550;
  double local_548;
  double dStack_540;
  double local_538;
  double dStack_530;
  double local_528;
  double dStack_520;
  double local_518;
  ulong uStack_510;
  double local_508;
  double dStack_500;
  double local_4f0;
  realtype *local_4e8;
  SUNMatrix local_4e0;
  double local_4d8;
  ulong uStack_4d0;
  double local_4c8;
  ulong uStack_4c0;
  double local_4b8;
  ulong uStack_4b0;
  double local_4a8 [22];
  double local_3f8 [22];
  undefined1 local_348 [16];
  long local_330;
  double local_328;
  long local_320;
  double local_318;
  ulong uStack_310;
  double local_308;
  ulong uStack_300;
  double local_2f8;
  ulong uStack_2f0;
  double local_2e8;
  double dStack_2e0;
  double local_2d8;
  double dStack_2d0;
  double local_2c8;
  double dStack_2c0;
  double local_2b8;
  double dStack_2b0;
  double local_2a8;
  double dStack_2a0;
  double local_298;
  double dStack_290;
  double local_288;
  double dStack_280;
  double local_278;
  double dStack_270;
  double local_268;
  double dStack_260;
  double local_258;
  double dStack_250;
  double local_248;
  double local_238 [22];
  double local_188 [22];
  double adStack_d8 [21];
  
  local_4e0 = J;
  prVar4 = N_VGetArrayPointer(u);
  local_330 = (long)*(int *)((long)user_data + 8);
  if (0 < local_330) {
    iVar1 = *(int *)((long)user_data + 0x14);
    lVar9 = 0;
    lVar8 = 0;
    local_4e8 = prVar4;
    do {
      local_320 = lVar8;
      memset(local_238,0,0xa8);
      local_238[0] = 2.016;
      local_238[1] = 1.008;
      local_238[2] = 15.999;
      local_238[3] = 31.998;
      local_238[4] = 17.007;
      local_238[5] = 18.015;
      local_238[6] = 33.006;
      local_238[7] = 14.027;
      local_238[8] = 14.027;
      local_238[9] = 15.035;
      local_238[10] = 16.043;
      local_238[0xb] = 28.01;
      local_238[0xc] = 44.009;
      local_238[0xd] = 29.018;
      local_238[0xe] = 30.026;
      local_238[0xf] = 31.034;
      local_238[0x10] = 28.054;
      local_238[0x11] = 29.062;
      local_238[0x12] = 30.07;
      local_238[0x13] = 28.014;
      local_238[0x14] = 39.95;
      lVar5 = 0;
      dVar14 = 0.0;
      do {
        dVar14 = dVar14 + prVar4[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x15);
      local_15f8 = local_4e8[lVar8 * 0x16 + 0x15];
      uStack_15f0 = 0;
      memset(local_188,0,0xa8);
      lVar5 = 0;
      do {
        local_188[lVar5] = prVar4[lVar5] / dVar14;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x15);
      memset(local_1488,0,0xf20);
      local_1888[0] = 0.49603174603174605;
      local_1888[1] = 0.9920634920634921;
      local_1888[2] = 0.06250390649415588;
      local_1888[3] = 0.03125195324707794;
      local_1888[4] = 0.05879931792791203;
      local_1888[5] = 0.055509297807382736;
      local_1888[6] = 0.030297521662727988;
      local_1888[7] = 0.07129108148570615;
      local_1888[8] = 0.07129108148570615;
      local_1888[9] = 0.06651147322913202;
      local_1888[10] = 0.06233248145608677;
      local_1888[0xb] = 0.035701535166012134;
      local_1888[0xc] = 0.022722624917630486;
      local_1888[0xd] = 0.03446136880556896;
      local_1888[0xe] = 0.033304469459801506;
      local_1888[0xf] = 0.032222723464587225;
      local_1888[0x10] = 0.035645540742853074;
      local_1888[0x11] = 0.034409194136673316;
      local_1888[0x12] = 0.03325573661456601;
      local_1888[0x13] = 0.03569643749553795;
      local_1888[0x14] = 0.025031289111389236;
      lVar5 = 0;
      do {
        adStack_d8[lVar5] = local_188[lVar5] * dVar14 * local_1888[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x15);
      lVar5 = 0;
      do {
        local_1948[lVar5] = adStack_d8[lVar5] * 1000000.0;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x15);
      memset(local_1488,0,0xf20);
      memset(local_1888,0,0xa8);
      dVar14 = log(local_15f8);
      local_1748._8_4_ = extraout_XMM0_Dc;
      local_1748._0_8_ = dVar14;
      local_1748._12_4_ = extraout_XMM0_Dd;
      local_1538._8_8_ = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
      local_4c8 = local_15f8 * local_15f8;
      local_4b8 = local_15f8 * local_4c8;
      dVar28 = 1.0 / local_15f8;
      local_1490 = 12186.6002121605 / local_15f8;
      dVar25 = 0.0;
      lVar5 = 0;
      do {
        dVar25 = dVar25 + local_1948[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x15);
      local_558 = local_15f8 * local_4b8;
      uStack_550 = uStack_15f0;
      if (1000.0 <= local_15f8) {
        local_1728._0_8_ =
             local_558 * -1.00127688e-15 +
             local_4b8 * 1.496386616666667e-11 +
             local_4c8 * -8.324279633333333e-08 +
             local_15f8 * 2.470123655e-05 + dVar14 * -3.3372792 + dVar28 * -950.158922 + 6.54230251;
        local_1758 = local_558 * -2.490986785e-23 +
                     local_4b8 * 3.945960291666667e-19 +
                     local_4c8 * -2.692699133333334e-15 +
                     local_15f8 * 1.154214865e-11 +
                     dVar14 * -2.50000001 + dVar28 * 25473.6599 + 2.946682924;
        local_1518 = local_558 * 2.667543555e-15 +
                     local_4b8 * -4.909681483333334e-11 +
                     local_4c8 * 4.140760216666667e-07 +
                     local_15f8 * -0.00247847763 +
                     dVar14 * -2.77217438 + dVar28 * 4011.91815 + -7.02617054;
        dStack_1510 = local_558 * 2.33577197e-15 +
                      local_4b8 * -4.9640387e-11 +
                      local_4c8 * 4.978572466666667e-07 +
                      local_15f8 * -0.003619950185 +
                      dVar14 * -2.28571772 + dVar28 * 16775.5843 + -6.19435407;
        local_14e8 = local_558 * 1.01823858e-15 +
                     local_4b8 * -1.9171084e-11 +
                     local_4c8 * 1.664709618333334e-07 +
                     local_15f8 * -0.001031263715 +
                     dVar14 * -2.71518561 + dVar28 * -14151.8724 + -5.10350211;
        dStack_14e0 = local_558 * -5.8706188e-16 +
                      local_4b8 * 7.3288463e-12 +
                      local_4c8 * -2.108420466666667e-08 +
                      local_15f8 * -0.000274214858 +
                      dVar14 * -3.09288767 + dVar28 * 3858.657 + -1.38380843;
        local_1628._8_8_ =
             local_558 * 4.419278200000001e-15 +
             local_4b8 * -8.386767666666666e-11 +
             local_4c8 * 7.370980216666666e-07 +
             local_15f8 * -0.00460000041 +
             dVar14 * -1.76069008 + dVar28 * -13995.8323 + -11.89563292;
        local_1628._0_8_ =
             local_558 * 1.08358897e-15 +
             local_4b8 * -1.745587958333333e-11 +
             local_4c8 * 1.263277781666667e-07 +
             local_15f8 * -0.00074154377 + dVar14 * -3.28253784 + dVar28 * -1088.45772 + -2.17069345
        ;
        local_1528 = local_558 * 1.698581825e-15 +
                     local_4b8 * -3.48255e-11 +
                     local_4c8 * 3.353199116666667e-07 +
                     local_15f8 * -0.002327943185 +
                     dVar14 * -2.29203842 + dVar28 * 50925.9997 + -6.33446327;
        dStack_1520 = local_558 * 9.38637835e-16 +
                      local_4b8 * -2.168162908333333e-11 +
                      local_4c8 * 2.348243283333333e-07 +
                      local_15f8 * -0.00182819646 +
                      dVar14 * -2.87410113 + dVar28 * 46263.604 + -3.29709211;
        local_538 = local_558 * 7.4820788e-15 +
                    local_4b8 * -1.460147408333333e-10 +
                    local_4c8 * 1.330344446666667e-06 +
                    local_15f8 * -0.0086986361 +
                    dVar14 * -1.95465642 + dVar28 * 12857.52 + -11.50777788;
        dStack_530 = local_558 * -6.141684549999999e-17 +
                     local_4b8 * 8.348149916666666e-13 +
                     local_4c8 * -6.991409816666667e-09 +
                     local_15f8 * 4.298705685e-05 +
                     dVar14 * -2.56942078 + dVar28 * 29217.5791 + -2.214917859999999;
        local_1718._0_8_ =
             local_558 * 5.39542675e-16 +
             local_4b8 * -9.520530833333334e-12 +
             local_4c8 * 1.056096916666667e-07 +
             local_15f8 * -0.001119910065 +
             dVar14 * -4.0172109 + dVar28 * 111.856713 + 0.2321087500000001;
        local_1718._8_8_ =
             local_558 * -8.4100496e-16 +
             local_4b8 * 8.08683225e-12 +
             local_4c8 * 2.734541966666666e-08 +
             local_15f8 * -0.00108845902 + dVar14 * -3.03399249 + dVar28 * -30004.2971 + -1.93277761
        ;
        local_528 = local_558 * 2.36042082e-15 +
                    local_4b8 * -4.362418233333334e-11 +
                    local_4c8 * 3.691356733333334e-07 +
                    local_15f8 * -0.00220718513 +
                    dVar14 * -3.85746029 + dVar28 * -48759.166 + 1.58582223;
        dStack_520 = local_558 * 5.0907615e-15 +
                     local_4b8 * -1.019104458333333e-10 +
                     local_4c8 * 9.554763483333333e-07 +
                     local_15f8 * -0.00669547335 +
                     dVar14 * -0.074851495 + dVar28 * -9468.34459 + -18.362466505;
        local_508 = local_558 * 6.28530305e-15 +
                    local_4b8 * -1.226857691666667e-10 +
                    local_4c8 * 1.118463191666667e-06 +
                    local_15f8 * -0.00732270755 +
                    dVar14 * -2.03611116 + dVar28 * 4939.88614 + -8.269258140000002;
        dStack_500 = local_558 * 1.056308e-15 +
                     local_4b8 * -3.287025833333333e-11 +
                     local_4c8 * 4.427306666666667e-07 +
                     local_15f8 * -0.0039357485 + dVar14 * -3.770799 + dVar28 * 127.83252 + 0.841224
        ;
        local_518 = local_558 * 9.5001445e-15 +
                    local_4b8 * -1.845100008333333e-10 +
                    local_4c8 * 1.67093445e-06 +
                    local_15f8 * -0.01084263385 +
                    dVar14 * -1.0718815 + dVar28 * -11426.3932 + -14.0437292;
        dVar15 = local_4b8 * -8.414198333333333e-12 +
                 local_4c8 * 9.474600000000001e-08 +
                 local_15f8 * -0.0007439884 + dVar14 * -2.92664 + dVar28 * -922.7977 + -3.053888;
        local_4d8 = local_558 * 3.3766755e-16;
      }
      else {
        local_1728._0_8_ =
             local_558 * 3.688058805e-13 +
             local_4b8 * -1.67976745e-09 +
             local_4c8 * 3.2463585e-06 +
             local_15f8 * -0.003990260375 +
             dVar14 * -2.34433112 + dVar28 * -917.935173 + 1.661320882;
        local_1758 = local_558 * 4.63866166e-23 +
                     local_4b8 * -1.917346933333333e-19 +
                     local_4c8 * 3.326532733333333e-16 +
                     local_15f8 * -3.526664095e-13 +
                     dVar14 * -2.5 + dVar28 * 25473.6599 + 2.946682853;
        local_1518 = local_558 * -2.168844325e-13 +
                     local_4b8 * 1.109534108333333e-09 +
                     local_4c8 * -2.296657433333333e-06 +
                     local_15f8 * 0.00162196266 +
                     dVar14 * -4.22118584 + dVar28 * 3839.56496 + 0.8268134100000002;
        dStack_1510 = local_558 * -1.27192867e-13 +
                      local_4b8 * 5.725978541666666e-10 +
                      local_4c8 * -9.550364266666668e-07 +
                      local_15f8 * -0.001005475875 +
                      dVar14 * -3.6735904 + dVar28 * 16444.9988 + 2.06902607;
        local_14e8 = local_558 * 4.522122495e-14 +
                     local_4b8 * -7.558382366666667e-11 +
                     local_4c8 * -1.69469055e-07 +
                     local_15f8 * 0.00030517684 +
                     dVar14 * -3.57953347 + dVar28 * -14344.086 + 0.07112418999999992;
        dStack_14e0 = local_558 * -6.8205735e-14 +
                      local_4b8 * 3.234277775e-10 +
                      local_4c8 * -7.696564016666666e-07 +
                      local_15f8 * 0.00120065876 +
                      dVar14 * -3.99201543 + dVar28 * 3615.08056 + 4.095940888;
        local_1628._8_8_ =
             local_558 * -6.5886326e-13 +
             local_4b8 * 3.160710508333333e-09 +
             local_4c8 * -6.220333466666666e-06 +
             local_15f8 * 0.004954166845 + dVar14 * -4.79372315 + dVar28 * -14308.9567 + 4.19091025;
        local_1628._0_8_ =
             local_558 * -1.621864185e-13 +
             local_4b8 * 8.067745908333334e-10 +
             local_4c8 * -1.641217001666667e-06 +
             local_15f8 * 0.00149836708 +
             dVar14 * -3.78245636 + dVar28 * -1063.94356 + 0.1247806300000001;
        local_1528 = local_558 * -9.71573685e-14 +
                     local_4b8 * 5.573466508333334e-10 +
                     local_4c8 * -1.372160366666667e-06 +
                     local_15f8 * 0.001183307095 +
                     dVar14 * -4.19860411 + dVar28 * 50496.8163 + 4.967723077;
        dStack_1520 = local_558 * -8.43708595e-14 +
                      local_4b8 * 3.209092941666667e-10 +
                      local_4c8 * -4.658164016666667e-07 +
                      local_15f8 * -0.0004844360715 +
                      dVar14 * -3.76267867 + dVar28 * 46004.0401 + 2.20014682;
        local_538 = local_558 * -1.15254502e-12 +
                    local_4b8 * 4.992721716666666e-09 +
                    local_4c8 * -8.28571345e-06 +
                    local_15f8 * 0.00209329446 +
                    dVar14 * -4.30646568 + dVar28 * 12841.6265 + -0.4007435600000004;
        dStack_530 = local_558 * -1.056329855e-13 +
                     local_4b8 * 5.106721866666666e-10 +
                     local_4c8 * -1.107177326666667e-06 +
                     local_15f8 * 0.00163965942 +
                     dVar14 * -3.1682671 + dVar28 * 29122.2592 + 1.11633364;
        local_1718._0_8_ =
             local_558 * -4.646125620000001e-13 +
             local_4b8 * 2.02303245e-09 +
             local_4c8 * -3.526381516666666e-06 +
             local_15f8 * 0.002374560255 +
             dVar14 * -4.30179801 + dVar28 * 294.80804 + 0.5851355599999999;
        local_1718._8_8_ =
             local_558 * -8.85989085e-14 +
             local_4b8 * 4.57330885e-10 +
             local_4c8 * -1.086733685e-06 +
             local_15f8 * 0.00101821705 + dVar14 * -4.19864056 + dVar28 * -30293.7267 + 5.047672768;
        local_528 = local_558 * 7.184977399999999e-15 +
                    local_4b8 * -2.049325183333333e-10 +
                    local_4c8 * 1.187260448333333e-06 +
                    local_15f8 * -0.004492298385 +
                    dVar14 * -2.35677352 + dVar28 * -48371.9697 + -7.5442787;
        dStack_520 = local_558 * -8.3346978e-13 +
                     local_4b8 * 4.039525216666667e-09 +
                     local_4c8 * -8.19667665e-06 +
                     local_15f8 * 0.0068354894 +
                     dVar14 * -5.14987613 + dVar28 * -10246.6476 + 9.791179889999999;
        local_508 = local_558 * -1.349421865e-12 +
                    local_4b8 * 5.763239608333333e-09 +
                    local_4c8 * -9.516504866666667e-06 +
                    local_15f8 * 0.003785261235 +
                    dVar14 * -3.95920148 + dVar28 * 5089.77593 + -0.1381294799999999;
        dStack_500 = local_558 * -1.037805e-13 +
                     local_4b8 * 6.14803e-10 +
                     local_4c8 * -8.897453333333333e-07 +
                     local_15f8 * -0.0036082975 +
                     dVar14 * -2.106204 + dVar28 * 978.6011 + -11.045973;
        local_518 = local_558 * -1.343428855e-12 +
                    local_4b8 * 5.903885708333334e-09 +
                    local_4c8 * -9.990638133333334e-06 +
                    local_15f8 * 0.00275077135 +
                    dVar14 * -4.29142492 + dVar28 * -11522.2055 + 1.62460176;
        dVar15 = local_4b8 * -4.701262500000001e-10 +
                 local_4c8 * 6.605369999999999e-07 +
                 local_15f8 * -0.0007041202 +
                 dVar14 * -3.298677 + dVar28 * -1020.8999 + -0.6516950000000001;
        local_4d8 = local_558 * 1.222427e-13;
      }
      local_1728._8_8_ = uStack_15f0;
      uStack_1750 = uStack_15f0;
      local_4d8 = local_4d8 + dVar15;
      uStack_4d0 = uStack_15f0;
      local_1778 = dVar28 * dVar28;
      uStack_1770 = 0;
      dVar15 = 1.0 / (12186.6002121605 / local_15f8);
      local_14a8._8_8_ = 0;
      local_14a8._0_8_ = dVar28 * -745.375 + -1.866;
      local_1538._0_8_ = dVar14 * -2.5;
      if (1000.0 <= local_15f8) {
        local_16e8 = dVar28 * -950.158922 +
                     local_558 * 4.00510752e-15 +
                     local_4b8 * -4.48915985e-11 +
                     local_4c8 * 1.66485593e-07 + local_15f8 * -2.47012365e-05 + 3.3372792;
        dStack_16e0 = dVar28 * 25473.6599 +
                      local_558 * 9.96394714e-23 +
                      local_4b8 * -1.18378809e-18 +
                      local_4c8 * 5.38539827e-15 + local_15f8 * -1.15421486e-11 + 2.50000001;
        local_16d8 = dVar28 * 29217.5791 +
                     local_558 * 2.45667382e-16 +
                     local_4b8 * -2.50444497e-12 +
                     local_4c8 * 1.39828196e-08 + local_15f8 * -4.29870569e-05 + 2.56942078;
        dStack_16d0 = dVar28 * -1088.45772 +
                      local_558 * -4.33435588e-15 +
                      local_4b8 * 5.23676387e-11 +
                      local_4c8 * -2.52655556e-07 + local_15f8 * 0.00074154377 + 3.28253784;
        local_16c8 = dVar28 * 3858.657 +
                     local_558 * 2.34824752e-15 +
                     local_4b8 * -2.19865389e-11 +
                     local_4c8 * 4.21684093e-08 + local_15f8 * 0.000274214858 + 3.09288767;
        dStack_16c0 = dVar28 * -30004.2971 +
                      local_558 * 3.36401984e-15 +
                      local_4b8 * -2.42604967e-11 +
                      local_4c8 * -5.46908393e-08 + local_15f8 * 0.00108845902 + 3.03399249;
        local_16b8 = dVar28 * 111.856713 +
                     local_558 * -2.1581707e-15 +
                     local_4b8 * 2.85615925e-11 +
                     local_4c8 * -2.11219383e-07 + local_15f8 * 0.00111991006 + 4.0172109;
        dStack_16b0 = dVar28 * 46263.604 +
                      local_558 * -3.75455134e-15 +
                      local_4b8 * 6.50448872e-11 +
                      local_4c8 * -4.69648657e-07 + local_15f8 * 0.00182819646 + 2.87410113;
        local_16a8 = dVar28 * 50925.9997 +
                     local_558 * -6.7943273e-15 +
                     local_4b8 * 1.044765e-10 +
                     local_4c8 * -6.70639823e-07 + local_15f8 * 0.00232794318 + 2.29203842;
        dStack_16a0 = dVar28 * 16775.5843 +
                      local_558 * -9.34308788e-15 +
                      local_4b8 * 1.48921161e-10 +
                      local_4c8 * -9.95714493e-07 + local_15f8 * 0.00361995018 + 2.28571772;
        local_1698 = dVar28 * -9468.34459 +
                     local_558 * -2.0363046e-14 +
                     local_4b8 * 3.05731338e-10 +
                     local_4c8 * -1.9109527e-06 + local_15f8 * 0.00669547335 + 0.074851495;
        dStack_1690 = dVar28 * -14151.8724 +
                      local_558 * -4.07295432e-15 +
                      local_4b8 * 5.7513252e-11 +
                      local_4c8 * -3.32941924e-07 + local_15f8 * 0.00103126372 + 2.71518561;
        local_1688 = dVar28 * -48759.166 +
                     local_558 * -9.44168328e-15 +
                     local_4b8 * 1.30872547e-10 +
                     local_4c8 * -7.38271347e-07 + local_15f8 * 0.00220718513 + 3.85746029;
        dStack_1680 = dVar28 * 4011.91815 +
                      local_558 * -1.06701742e-14 +
                      local_4b8 * 1.47290445e-10 +
                      local_4c8 * -8.28152043e-07 + local_15f8 * 0.00247847763 + 2.77217438;
        local_1678 = dVar28 * -13995.8323 +
                     local_558 * -1.76771128e-14 +
                     local_4b8 * 2.5160303e-10 +
                     local_4c8 * -1.47419604e-06 + local_15f8 * 0.00460000041 + 1.76069008;
        dStack_1670 = dVar28 * 127.83252 +
                      local_558 * -4.225232e-15 +
                      local_4b8 * 9.8610775e-11 +
                      local_4c8 * -8.85461333e-07 + local_15f8 * 0.0039357485 + 3.770799;
        local_1668 = dVar28 * 4939.88614 +
                     local_558 * -2.51412122e-14 +
                     local_4b8 * 3.68057308e-10 +
                     local_4c8 * -2.23692638e-06 + local_15f8 * 0.00732270755 + 2.03611116;
        dStack_1660 = dVar28 * 12857.52 +
                      local_558 * -2.99283152e-14 +
                      local_4b8 * 4.38044223e-10 +
                      local_4c8 * -2.66068889e-06 + local_15f8 * 0.0086986361 + 1.95465642;
        local_1658 = local_558 * -3.8000578e-14 +
                     local_4b8 * 5.53530003e-10 +
                     local_4c8 * -3.3418689e-06 + local_15f8 * 0.0108426339 + 1.0718815;
        dStack_1650 = local_558 * -1.3506702e-15 +
                      local_4b8 * 2.5242595e-11 +
                      local_4c8 * -1.89492e-07 + local_15f8 * 0.0007439884 + 2.92664;
        dVar16 = -11426.3932;
        dVar17 = -922.7977;
      }
      else {
        local_16e8 = dVar28 * -917.935173 +
                     local_558 * -1.47522352e-12 +
                     local_4b8 * 5.03930235e-09 +
                     local_4c8 * -6.492717e-06 + local_15f8 * 0.00399026037 + 2.34433112;
        dStack_16e0 = dVar28 * 25473.6599 +
                      local_558 * -1.85546466e-22 +
                      local_4b8 * 5.7520408e-19 +
                      local_4c8 * -6.65306547e-16 + local_15f8 * 3.52666409e-13 + 2.5;
        local_16d8 = dVar28 * 29122.2592 +
                     local_558 * 4.22531942e-13 +
                     local_4b8 * -1.53201656e-09 +
                     local_4c8 * 2.21435465e-06 + local_15f8 * -0.00163965942 + 3.1682671;
        dStack_16d0 = dVar28 * -1063.94356 +
                      local_558 * 6.48745674e-13 +
                      local_4b8 * -2.42032377e-09 +
                      local_4c8 * 3.282434e-06 + local_15f8 * -0.00149836708 + 3.78245636;
        local_16c8 = dVar28 * 3615.08056 +
                     local_558 * 2.7282294e-13 +
                     local_4b8 * -9.70283332e-10 +
                     local_4c8 * 1.5393128e-06 + local_15f8 * -0.00120065876 + 3.99201543;
        dStack_16c0 = dVar28 * -30293.7267 +
                      local_558 * 3.54395634e-13 +
                      local_4b8 * -1.37199266e-09 +
                      local_4c8 * 2.17346737e-06 + local_15f8 * -0.00101821705 + 4.19864056;
        local_16b8 = dVar28 * 294.80804 +
                     local_558 * 1.85845025e-12 +
                     local_4b8 * -6.06909735e-09 +
                     local_4c8 * 7.05276303e-06 + local_15f8 * -0.00237456025 + 4.30179801;
        dStack_16b0 = dVar28 * 46004.0401 +
                      local_558 * 3.37483438e-13 +
                      local_4b8 * -9.62727883e-10 +
                      local_4c8 * 9.31632803e-07 + local_15f8 * 0.000484436072 + 3.76267867;
        local_16a8 = dVar28 * 50496.8163 +
                     local_558 * 3.88629474e-13 +
                     local_4b8 * -1.67203995e-09 +
                     local_4c8 * 2.74432073e-06 + local_15f8 * -0.0011833071 + 4.19860411;
        dStack_16a0 = dVar28 * 16444.9988 +
                      local_558 * 5.08771468e-13 +
                      local_4b8 * -1.71779356e-09 +
                      local_4c8 * 1.91007285e-06 + local_15f8 * 0.00100547588 + 3.6735904;
        local_1698 = dVar28 * -10246.6476 +
                     local_558 * 3.33387912e-12 +
                     local_4b8 * -1.21185757e-08 +
                     local_4c8 * 1.63933533e-05 + local_15f8 * -0.0068354894 + 5.14987613;
        dStack_1690 = dVar28 * -14344.086 +
                      local_558 * -1.808849e-13 +
                      local_4b8 * 2.26751471e-10 +
                      local_4c8 * 3.3893811e-07 + local_15f8 * -0.00030517684 + 3.57953347;
        local_1688 = dVar28 * -48371.9697 +
                     local_558 * -2.87399096e-14 +
                     local_4b8 * 6.14797555e-10 +
                     local_4c8 * -2.3745209e-06 + local_15f8 * 0.00449229839 + 2.35677352;
        dStack_1680 = dVar28 * 3839.56496 +
                      local_558 * 8.6753773e-13 +
                      local_4b8 * -3.32860233e-09 +
                      local_4c8 * 4.59331487e-06 + local_15f8 * -0.00162196266 + 4.22118584;
        local_1678 = dVar28 * -14308.9567 +
                     local_558 * 2.63545304e-12 +
                     local_4b8 * -9.48213152e-09 +
                     local_4c8 * 1.24406669e-05 + local_15f8 * -0.00495416684 + 4.79372315;
        dStack_1670 = dVar28 * 978.6011 +
                      local_558 * 4.15122e-13 +
                      local_4b8 * -1.844409e-09 +
                      local_4c8 * 1.77949067e-06 + local_15f8 * 0.0036082975 + 2.106204;
        local_1668 = dVar28 * 5089.77593 +
                     local_558 * 5.39768746e-12 +
                     local_4b8 * -1.72897188e-08 +
                     local_4c8 * 1.90330097e-05 + local_15f8 * -0.00378526124 + 3.95920148;
        dStack_1660 = dVar28 * 12841.6265 +
                      local_558 * 4.61018008e-12 +
                      local_4b8 * -1.49781651e-08 +
                      local_4c8 * 1.65714269e-05 + local_15f8 * -0.00209329446 + 4.30646568;
        local_1658 = local_558 * 5.37371542e-12 +
                     local_4b8 * -1.77116571e-08 +
                     local_4c8 * 1.99812763e-05 + local_15f8 * -0.00275077135 + 4.29142492;
        dStack_1650 = local_558 * -4.889708e-13 +
                      local_4b8 * 1.41037875e-09 +
                      local_4c8 * -1.321074e-06 + local_15f8 * 0.0007041202 + 3.298677;
        dVar16 = -11522.2055;
        dVar17 = -1020.8999;
      }
      local_1658 = dVar28 * dVar16 + local_1658;
      dStack_1650 = dVar28 * dVar17 + dStack_1650;
      local_348._8_4_ = (int)uStack_15f0;
      local_348._0_8_ = local_15f8 * 0.0;
      local_348._12_4_ = (int)(uStack_15f0 >> 0x20);
      uStack_4c0 = uStack_15f0;
      local_308 = local_4c8 * 0.0;
      uStack_300 = uStack_15f0;
      uStack_4b0 = uStack_15f0;
      local_2f8 = local_4b8 * 0.0;
      uStack_2f0 = uStack_15f0;
      local_318 = local_558 * 0.0;
      uStack_310 = uStack_15f0;
      local_1648 = dVar28 * -745.375 + local_15f8 * 0.0 + 2.5 + local_308 + local_2f8 + local_318;
      local_1738 = local_1948[0x14] * -0.30000000000000004 +
                   local_1948[0x12] + local_1948[0x12] +
                   local_1948[0xb] * 0.5 +
                   local_1948[5] * 5.0 + local_1948[0] + dVar25 + local_1948[10] + local_1948[0xc];
      local_1788._8_8_ = 0;
      local_1788._0_8_ = dVar28 * -0.0;
      local_14d8._0_8_ = dVar14 * -0.8 + dVar28 * -0.0;
      local_14d8._8_8_ = local_1748._8_8_;
      uStack_510 = uStack_1750;
      local_1898._0_8_ = local_1948[1] * local_1948[7];
      dVar14 = exp((double)local_14d8._0_8_);
      local_1768._0_8_ = dVar14 * 25000000000.0;
      dVar14 = exp((double)local_1748._0_8_ * -3.14 + dVar28 * -618.9564989398057);
      dVar14 = ((local_1738 * 1e-12) / (double)local_1768._0_8_) * dVar14 * 3.2e+27;
      local_17d8._0_8_ = dVar14;
      dVar14 = log10(dVar14);
      local_1638._0_8_ = dVar14;
      dVar14 = exp(local_15f8 / -78.0);
      local_17a8._0_8_ = dVar14 * 0.31999999999999995;
      local_1618 = exp(local_15f8 / -1995.0);
      local_1618 = local_1618 * 0.68;
      local_1708 = exp(dVar28 * -5590.0);
      local_14f8 = (double)local_17a8._0_8_ + local_1618 + local_1708;
      dVar14 = log10(local_14f8);
      local_16f8._0_8_ = dVar14 * -1.27 + 0.75;
      dVar16 = dVar14 * -0.67 + -0.4 + (double)local_1638._0_8_;
      dVar19 = 1.0 / (dVar16 * -0.14 + (double)local_16f8._0_8_);
      dVar16 = dVar16 * dVar19;
      dVar17 = 1.0 / (dVar16 * dVar16 + 1.0);
      local_14c8._0_8_ = dVar16;
      local_17b8._0_8_ = dVar19;
      local_548 = pow(10.0,dVar14 * dVar17);
      local_568 = local_1948[9];
      local_14b8._8_4_ = SUB84(dStack_1520,0);
      local_14b8._0_8_ = dStack_1520;
      local_14b8._12_4_ = (int)((ulong)dStack_1520 >> 0x20);
      local_1638._8_8_ = dStack_1510;
      local_1638._0_8_ = dStack_1510;
      dVar16 = exp((dStack_1520 + local_1758) - dStack_1510);
      dVar21 = (double)local_17a8._0_8_ / -78.0;
      dVar23 = (dVar14 + dVar14) * dVar17 * dVar17 * (double)local_14c8._0_8_ *
               (double)local_17b8._0_8_;
      dVar19 = -(double)local_16f8._0_8_ * dVar23 * (double)local_17b8._0_8_;
      local_17a8._8_8_ = uStack_1770;
      local_17a8._0_8_ = local_1778 * 0.0;
      dVar24 = dVar28 * -0.8 + local_1778 * 0.0;
      dVar23 = dVar23 * (double)local_14c8._0_8_;
      dVar18 = (double)local_17d8._0_8_ + 1.0;
      dVar14 = ((dVar28 * -3.14 + local_1778 * 618.9564989398057) - dVar24) * 0.43429448190325176;
      dVar16 = (double)local_1768._0_8_ / (dVar16 * dVar15);
      dVar27 = ((double)local_17d8._0_8_ / dVar18) * local_548;
      local_14c8._8_8_ = 0;
      local_14c8._0_8_ = dVar24;
      dVar20 = ((double)local_1768._0_8_ * (double)local_1898._0_8_ - local_568 * dVar16) * dVar27;
      dVar14 = (dVar24 * (double)local_1768._0_8_ * (double)local_1898._0_8_ -
               (dVar24 - ((dStack_16a0 - (dStack_16e0 + dStack_16b0)) + 1.0) * dVar28) * dVar16 *
               local_568) * dVar27 +
               (dVar14 * dVar19 +
                (dVar23 * -1.27 + dVar19 * -0.67 + dVar17) *
                (local_1708 * 5590.0 * local_1778 + local_1618 / -1995.0 + dVar21) *
                (0.43429448190325176 / local_14f8) + dVar14 / dVar18) * 2.302585092994046 * dVar20;
      local_1888[1] = local_1888[1] - dVar20;
      local_1888[7] = local_1888[7] - dVar20;
      local_1888[9] = local_1888[9] + dVar20;
      dVar17 = (double)local_1768._0_8_ * dVar27;
      dVar27 = dVar27 * dVar16;
      dVar16 = (1.0 / dVar18 + dVar19) * (dVar20 / local_1738);
      if (iVar1 == 2) {
        local_1488[1] = local_1488[1] - dVar16;
        local_1450 = local_1450 - dVar16;
        local_1440 = local_1440 + dVar16;
        dVar19 = local_1948[7] * dVar17;
        local_13e0[2] = local_13e0[2] - dVar19;
        local_13e0[8] = local_13e0[8] - dVar19;
        local_13e0[10] = dVar19 + local_13e0[10];
        dVar19 = dVar16 * 5.0;
        local_13e0[0x5a] = local_13e0[0x5a] - dVar19;
        local_13e0[0x60] = local_13e0[0x60] - dVar19;
        local_13e0[0x62] = dVar19 + local_13e0[0x62];
        dVar17 = dVar17 * local_1948[1];
        local_fb0 = local_fb0 - dVar17;
        dStack_f80 = dStack_f80 - dVar17;
        local_f70 = dVar17 + local_f70;
        local_e50 = local_e50 + dVar27;
        local_e20 = local_e20 + dVar27;
        dStack_e10 = dStack_e10 - dVar27;
        local_da0 = local_da0 - dVar16;
        local_d70 = local_d70 - dVar16;
        local_d60 = local_d60 + dVar16;
        dVar17 = dVar16 * 0.5;
        local_cf0 = local_cf0 - dVar17;
        local_cc0 = local_cc0 - dVar17;
        local_cb0 = dVar17 + local_cb0;
        local_c40 = local_c40 - dVar16;
        local_c10 = local_c10 - dVar16;
        local_c00 = local_c00 + dVar16;
        dVar17 = dVar16 + dVar16;
        local_820 = local_820 - dVar17;
        local_7f0 = local_7f0 - dVar17;
        local_7e0 = dVar17 + local_7e0;
        dVar16 = dVar16 * -0.30000000000000004;
        local_6c0 = local_6c0 - dVar16;
        local_690 = local_690 - dVar16;
        local_680 = dVar16 + local_680;
      }
      else {
        local_15e8[0] = dVar16 * 2.0;
        local_15e8[1] = local_1948[7] * dVar17 + dVar16;
        auStack_15d8._8_8_ = dVar16;
        auStack_15d8._0_8_ = dVar16;
        dStack_15c8 = dVar16;
        dStack_15c0 = dVar16 * 6.0;
        local_15b8._8_8_ = dVar17 * local_1948[1] + dVar16;
        local_15b8._0_8_ = dVar16;
        local_15a8._8_8_ = dVar16 - dVar27;
        local_15a8._0_8_ = dVar16;
        local_1598 = local_15e8[0];
        dStack_1590 = dVar16 * 1.5;
        dStack_1588 = local_15e8[0];
        auStack_1570._8_8_ = dVar16;
        auStack_1570._0_8_ = dVar16;
        local_1580._8_8_ = dVar16;
        local_1580._0_8_ = dVar16;
        dStack_1560 = dVar16;
        local_1558 = dVar16 * 3.0;
        local_1550 = dVar16;
        local_1548 = dVar16 * 0.7;
        pdVar6 = &local_1440;
        lVar5 = 0;
        do {
          dVar16 = local_15e8[lVar5];
          pdVar6[-8] = pdVar6[-8] - dVar16;
          pdVar6[-2] = pdVar6[-2] - dVar16;
          *pdVar6 = dVar16 + *pdVar6;
          lVar5 = lVar5 + 1;
          pdVar6 = pdVar6 + 0x16;
        } while (lVar5 != 0x15);
      }
      local_618[1] = local_618[1] - dVar14;
      local_618[7] = local_618[7] - dVar14;
      local_618[9] = dVar14 + local_618[9];
      local_1738 = local_1948[0x14] * -0.30000000000000004 +
                   local_1948[0x12] + local_1948[0x12] +
                   local_1948[0xb] * 0.5 +
                   local_1948[5] * 5.0 + local_1948[0] + dVar25 + local_1948[10] + local_1948[0xc];
      local_17d8._0_8_ = local_1948[1] * local_1948[9];
      dVar14 = exp((double)local_1748._0_8_ * -0.63 + dVar28 * -192.73198300320777);
      local_1768._8_4_ = extraout_XMM0_Dc_00;
      local_1768._0_8_ = dVar14 * 12700000000.0;
      local_1768._12_4_ = extraout_XMM0_Dd_00;
      dVar14 = exp((double)local_1748._0_8_ * -4.76 + dVar28 * -1227.8486645635169);
      local_568 = ((local_1738 * 1e-12) / (double)local_1768._0_8_) * dVar14 * 2.477e+33;
      dStack_560 = 0.0;
      local_548 = log10(local_568);
      local_1618 = exp(local_15f8 / -74.0);
      local_1618 = local_1618 * 0.21699999999999997;
      local_1898._0_8_ = exp(local_15f8 / -2941.0);
      local_1898._0_8_ = (double)local_1898._0_8_ * 0.783;
      local_17b8._0_8_ = exp(dVar28 * -6964.0);
      dVar17 = local_1618 + (double)local_1898._0_8_ + (double)local_17b8._0_8_;
      dVar14 = log10(dVar17);
      local_14f8 = dVar14 * -1.27 + 0.75;
      dVar18 = dVar14 * -0.67 + -0.4 + local_548;
      dVar23 = 1.0 / (dVar18 * -0.14 + local_14f8);
      dVar18 = dVar18 * dVar23;
      dVar16 = 1.0 / (dVar18 * dVar18 + 1.0);
      local_17c8._0_8_ = dVar16;
      local_16f8._0_8_ = pow(10.0,dVar14 * dVar16);
      local_1708 = local_1948[10];
      local_548 = dStack_520;
      dStack_540 = dStack_520;
      dVar16 = exp(((double)local_1638._0_8_ + local_1758) - dStack_520);
      dVar19 = dVar28 * -0.63 + local_1778 * 192.73198300320777;
      dVar20 = (dVar14 + dVar14) * (double)local_17c8._0_8_ * (double)local_17c8._0_8_ * dVar18 *
               dVar23;
      dVar23 = -local_14f8 * dVar20 * dVar23;
      dVar27 = local_568 + 1.0;
      dVar24 = ((dVar28 * -4.76 + local_1778 * 1227.8486645635169) - dVar19) * 0.43429448190325176;
      dVar21 = (double)local_1768._0_8_ / (dVar16 * dVar15);
      dVar22 = (local_568 / dVar27) * (double)local_16f8._0_8_;
      dVar14 = ((double)local_1768._0_8_ * (double)local_17d8._0_8_ - local_1708 * dVar21) * dVar22;
      dVar16 = (dVar19 * (double)local_1768._0_8_ * (double)local_17d8._0_8_ -
               (dVar19 - ((local_1698 - (dStack_16e0 + dStack_16a0)) + 1.0) * dVar28) * dVar21 *
               local_1708) * dVar22 +
               (dVar24 * dVar23 +
                (dVar20 * dVar18 * -1.27 + dVar23 * -0.67 + (double)local_17c8._0_8_) *
                ((double)local_17b8._0_8_ * 6964.0 * local_1778 +
                (double)local_1898._0_8_ / -2941.0 + local_1618 / -74.0) *
                (0.43429448190325176 / dVar17) + dVar24 / dVar27) * 2.302585092994046 * dVar14;
      local_1888[1] = local_1888[1] - dVar14;
      local_1888[9] = local_1888[9] - dVar14;
      local_1888[10] = local_1888[10] + dVar14;
      dVar17 = dVar22 * (double)local_1768._0_8_;
      dVar14 = (1.0 / dVar27 + dVar23) * (dVar14 / local_1738);
      uVar12 = SUB84(dVar14,0);
      uVar13 = (undefined4)((ulong)dVar14 >> 0x20);
      if (iVar1 == 2) {
        local_1488[1] = local_1488[1] - dVar14;
        local_1440 = local_1440 - dVar14;
        local_1438 = local_1438 + dVar14;
        dVar19 = local_1948[9] * dVar17;
        local_13e0[2] = local_13e0[2] - dVar19;
        local_13e0[10] = local_13e0[10] - dVar19;
        local_13e0[0xb] = dVar19 + local_13e0[0xb];
        dVar19 = dVar14 * 5.0;
        local_13e0[0x5a] = local_13e0[0x5a] - dVar19;
        local_13e0[0x62] = local_13e0[0x62] - dVar19;
        local_13e0[99] = dVar19 + local_13e0[99];
        dVar17 = dVar17 * local_1948[1];
        local_e50 = local_e50 - dVar17;
        dStack_e10 = dStack_e10 - dVar17;
        local_e08 = dVar17 + local_e08;
        dVar17 = dVar14 - dVar21 * dVar22;
        local_da0 = local_da0 - dVar17;
        local_d60 = local_d60 - dVar17;
        local_d58 = dVar17 + local_d58;
        dVar17 = dVar14 * 0.5;
        local_cf0 = local_cf0 - dVar17;
        local_cb0 = local_cb0 - dVar17;
        local_ca8 = dVar17 + local_ca8;
        local_c40 = local_c40 - dVar14;
        local_c00 = local_c00 - dVar14;
        local_bf8 = local_bf8 + dVar14;
        dVar17 = dVar14 + dVar14;
        local_820 = local_820 - dVar17;
        local_7e0 = local_7e0 - dVar17;
        local_7d8 = dVar17 + local_7d8;
        dVar14 = dVar14 * -0.30000000000000004;
        local_6c0 = local_6c0 - dVar14;
        local_680 = local_680 - dVar14;
        local_678 = dVar14 + local_678;
      }
      else {
        local_15e8[0] = dVar14 * 2.0;
        local_15e8[1] = local_1948[9] * dVar17 + dVar14;
        auStack_15d8._8_4_ = uVar12;
        auStack_15d8._0_8_ = dVar14;
        auStack_15d8._12_4_ = uVar13;
        dStack_15c8 = dVar14;
        dStack_15c0 = dVar14 * 6.0;
        local_15b8._8_4_ = uVar12;
        local_15b8._0_8_ = dVar14;
        local_15b8._12_4_ = uVar13;
        local_15a8._8_8_ = local_1948[1] * dVar17 + dVar14;
        local_15a8._0_8_ = dVar14;
        local_1598 = dVar14 * 2.0 + -(dVar21 * dVar22);
        dStack_1590 = dVar14 * 1.5;
        dStack_1588 = dVar14 * 2.0;
        auStack_1570._8_4_ = uVar12;
        auStack_1570._0_8_ = dVar14;
        auStack_1570._12_4_ = uVar13;
        local_1580._8_4_ = uVar12;
        local_1580._0_8_ = dVar14;
        local_1580._12_4_ = uVar13;
        dStack_1560 = dVar14;
        local_1558 = dVar14 * 3.0;
        local_1550 = dVar14;
        local_1548 = dVar14 * 0.7;
        pdVar6 = &local_1438;
        lVar5 = 0;
        do {
          dVar14 = local_15e8[lVar5];
          pdVar6[-9] = pdVar6[-9] - dVar14;
          pdVar6[-1] = pdVar6[-1] - dVar14;
          *pdVar6 = dVar14 + *pdVar6;
          lVar5 = lVar5 + 1;
          pdVar6 = pdVar6 + 0x16;
        } while (lVar5 != 0x15);
      }
      local_618[1] = local_618[1] - dVar16;
      local_618[9] = local_618[9] - dVar16;
      local_5c8._0_8_ = dVar16 + (double)local_5c8._0_8_;
      local_1738 = local_1948[0x14] * -0.30000000000000004 +
                   local_1948[0x12] + local_1948[0x12] +
                   local_1948[0xb] * 0.5 +
                   local_1948[5] * 5.0 + local_1948[0] + dVar25 + local_1948[10] + local_1948[0xc];
      local_568 = local_1948[1] * local_1948[0xd];
      dVar14 = exp((double)local_1748._0_8_ * 0.48 + dVar28 * 130.8363331092272);
      local_1768._0_8_ = dVar14 * 1090000.0;
      dVar14 = exp((double)local_1748._0_8_ * -2.57 + dVar28 * -717.083748771726);
      dVar16 = ((local_1738 * 1e-12) / (double)local_1768._0_8_) * dVar14 * 1.35e+24;
      local_1618 = log10(dVar16);
      local_1898._0_8_ = exp(local_15f8 / -271.0);
      local_1898._0_8_ = (double)local_1898._0_8_ * 0.21760000000000002;
      local_17d8._0_8_ = exp(local_15f8 / -2755.0);
      local_17d8._0_8_ = (double)local_17d8._0_8_ * 0.7824;
      local_17b8._0_8_ = exp(dVar28 * -6570.0);
      dVar17 = (double)local_1898._0_8_ + (double)local_17d8._0_8_ + (double)local_17b8._0_8_;
      local_1790 = log10(dVar17);
      local_14f8 = local_1790 * -1.27 + 0.75;
      local_17c8._0_8_ = local_1790 * -0.67 + -0.4 + local_1618;
      dVar21 = 1.0 / ((double)local_17c8._0_8_ * -0.14 + local_14f8);
      local_17c8._0_8_ = (double)local_17c8._0_8_ * dVar21;
      dVar18 = 1.0 / ((double)local_17c8._0_8_ * (double)local_17c8._0_8_ + 1.0);
      local_16f8._0_8_ = pow(10.0,local_1790 * dVar18);
      local_1708 = local_1948[0xe];
      local_1618 = (double)local_1628._8_8_;
      dStack_1610 = (double)local_1628._8_8_;
      dVar14 = exp((local_1518 + local_1758) - (double)local_1628._8_8_);
      dVar19 = dVar28 * 0.48 + local_1778 * -130.8363331092272;
      dVar24 = (local_1790 + local_1790) * dVar18 * dVar18 * (double)local_17c8._0_8_ * dVar21;
      dVar21 = -local_14f8 * dVar24 * dVar21;
      dVar23 = dVar16 + 1.0;
      dVar20 = ((dVar28 * -2.57 + local_1778 * 717.083748771726) - dVar19) * 0.43429448190325176;
      dVar14 = (double)local_1768._0_8_ / (dVar14 * dVar15);
      dVar22 = (dVar16 / dVar23) * (double)local_16f8._0_8_;
      dVar27 = ((double)local_1768._0_8_ * local_568 - local_1708 * dVar14) * dVar22;
      dVar16 = (dVar19 * (double)local_1768._0_8_ * local_568 -
               (dVar19 - ((local_1678 - (dStack_16e0 + dStack_1680)) + 1.0) * dVar28) * dVar14 *
               local_1708) * dVar22 +
               (dVar20 * dVar21 +
                (dVar24 * (double)local_17c8._0_8_ * -1.27 + dVar21 * -0.67 + dVar18) *
                ((double)local_17b8._0_8_ * 6570.0 * local_1778 +
                (double)local_17d8._0_8_ / -2755.0 + (double)local_1898._0_8_ / -271.0) *
                (0.43429448190325176 / dVar17) + dVar20 / dVar23) * 2.302585092994046 * dVar27;
      local_1888[1] = local_1888[1] - dVar27;
      local_1888[0xd] = local_1888[0xd] - dVar27;
      local_1888[0xe] = local_1888[0xe] + dVar27;
      dVar17 = (double)local_1768._0_8_ * dVar22;
      dVar22 = dVar22 * dVar14;
      dVar14 = (1.0 / dVar23 + dVar21) * (dVar27 / local_1738);
      if (iVar1 == 2) {
        local_1488[1] = local_1488[1] - dVar14;
        local_1420 = local_1420 - dVar14;
        local_1418 = local_1418 + dVar14;
        dVar19 = local_1948[0xd] * dVar17;
        local_13e0[2] = local_13e0[2] - dVar19;
        local_13e0[0xe] = local_13e0[0xe] - dVar19;
        local_13e0[0xf] = dVar19 + local_13e0[0xf];
        dVar19 = dVar14 * 5.0;
        local_13e0[0x5a] = local_13e0[0x5a] - dVar19;
        local_13e0[0x66] = local_13e0[0x66] - dVar19;
        local_13e0[0x67] = dVar19 + local_13e0[0x67];
        local_da0 = local_da0 - dVar14;
        local_d40 = local_d40 - dVar14;
        local_d38 = local_d38 + dVar14;
        dVar19 = dVar14 * 0.5;
        local_cf0 = local_cf0 - dVar19;
        local_c90 = local_c90 - dVar19;
        local_c88 = dVar19 + local_c88;
        local_c40 = local_c40 - dVar14;
        local_be0 = local_be0 - dVar14;
        local_bd8 = local_bd8 + dVar14;
        dVar17 = dVar17 * local_1948[1];
        local_b90 = local_b90 - dVar17;
        local_b30 = local_b30 - dVar17;
        local_b28 = dVar17 + local_b28;
        local_ae0 = local_ae0 + dVar22;
        local_a80 = local_a80 + dVar22;
        local_a78 = local_a78 - dVar22;
        dVar17 = dVar14 + dVar14;
        local_820 = local_820 - dVar17;
        local_7c0 = local_7c0 - dVar17;
        local_7b8 = dVar17 + local_7b8;
        dVar14 = dVar14 * -0.30000000000000004;
        local_6c0 = local_6c0 - dVar14;
        local_660 = local_660 - dVar14;
        local_658 = dVar14 + local_658;
      }
      else {
        local_15e8[0] = dVar14 * 2.0;
        local_15e8[1] = local_1948[0xd] * dVar17 + dVar14;
        auStack_15d8._8_8_ = dVar14;
        auStack_15d8._0_8_ = dVar14;
        dStack_15c8 = dVar14;
        dStack_15c0 = dVar14 * 6.0;
        local_15a8._8_8_ = dVar14;
        local_15a8._0_8_ = dVar14;
        local_15b8._8_8_ = dVar14;
        local_15b8._0_8_ = dVar14;
        local_1598 = local_15e8[0];
        dStack_1590 = dVar14 * 1.5;
        dStack_1588 = local_15e8[0];
        local_1580._8_8_ = dVar14 - dVar22;
        local_1580._0_8_ = dVar17 * local_1948[1] + dVar14;
        auStack_1570._8_8_ = dVar14;
        auStack_1570._0_8_ = dVar14;
        dStack_1560 = dVar14;
        local_1558 = dVar14 * 3.0;
        local_1550 = dVar14;
        local_1548 = dVar14 * 0.7;
        pdVar6 = &local_1418;
        lVar5 = 0;
        do {
          dVar14 = local_15e8[lVar5];
          pdVar6[-0xd] = pdVar6[-0xd] - dVar14;
          pdVar6[-1] = pdVar6[-1] - dVar14;
          *pdVar6 = dVar14 + *pdVar6;
          lVar5 = lVar5 + 1;
          pdVar6 = pdVar6 + 0x16;
        } while (lVar5 != 0x15);
      }
      local_618[1] = local_618[1] - dVar16;
      local_5b0 = local_5b0 - dVar16;
      local_5a8 = dVar16 + local_5a8;
      local_1738 = local_1948[0x12] + local_1948[0x12] +
                   local_1948[0xb] * 0.5 +
                   local_1948[5] * 5.0 + local_1948[0] + dVar25 + local_1948[10] + local_1948[0xc];
      local_17b8._0_8_ = local_1948[1] * local_1948[0xe];
      local_1708 = (double)local_1748._0_8_ * 0.454;
      uStack_1700 = local_1748._8_8_;
      local_1768._0_8_ = exp(dVar28 * -1308.3633310922721 + local_1708);
      local_1768._0_8_ = (double)local_1768._0_8_ * 540000.0;
      dVar14 = exp((double)local_1748._0_8_ * -4.8 + dVar28 * -2797.884661874243);
      dVar19 = ((local_1738 * 1e-12) / (double)local_1768._0_8_) * dVar14 * 2.2e+30;
      local_568 = log10(dVar19);
      local_1898._0_8_ = exp(local_15f8 / -94.0);
      local_1898._0_8_ = (double)local_1898._0_8_ * 0.242;
      local_17d8._0_8_ = exp(local_15f8 / -1555.0);
      local_17d8._0_8_ = (double)local_17d8._0_8_ * 0.758;
      dVar14 = exp(dVar28 * -4200.0);
      local_1790 = (double)local_1898._0_8_ + (double)local_17d8._0_8_ + dVar14;
      local_1600 = log10(local_1790);
      local_16f8._0_8_ = local_1600 * -1.27 + 0.75;
      dVar20 = local_1600 * -0.67 + -0.4 + local_568;
      local_17c8._0_8_ = 1.0 / (dVar20 * -0.14 + (double)local_16f8._0_8_);
      dVar20 = dVar20 * (double)local_17c8._0_8_;
      dVar16 = 1.0 / (dVar20 * dVar20 + 1.0);
      local_1508._0_8_ = dVar16;
      local_14f8 = pow(10.0,local_1600 * dVar16);
      dVar17 = local_1948[0xf];
      local_568 = dStack_500;
      dStack_560 = dStack_500;
      dVar16 = exp((local_1618 + local_1758) - dStack_500);
      dVar23 = (local_1600 + local_1600) * (double)local_1508._0_8_ * (double)local_1508._0_8_ *
               dVar20 * (double)local_17c8._0_8_;
      dVar22 = -(double)local_16f8._0_8_ * dVar23 * (double)local_17c8._0_8_;
      local_16f8._8_8_ = 0;
      local_16f8._0_8_ = dVar28 * 0.454;
      dVar18 = local_1778 * 1308.3633310922721 + dVar28 * 0.454;
      dVar24 = dVar19 + 1.0;
      dVar21 = ((dVar28 * -4.8 + local_1778 * 2797.884661874243) - dVar18) * 0.43429448190325176;
      dVar27 = (double)local_1768._0_8_ / (dVar16 * dVar15);
      dVar26 = (dVar19 / dVar24) * local_14f8;
      dVar19 = ((double)local_1768._0_8_ * (double)local_17b8._0_8_ - dVar17 * dVar27) * dVar26;
      dVar16 = (dVar18 * (double)local_1768._0_8_ * (double)local_17b8._0_8_ -
               (dVar18 - ((dStack_1670 - (dStack_16e0 + local_1678)) + 1.0) * dVar28) * dVar27 *
               dVar17) * dVar26 +
               (dVar21 * dVar22 +
                (dVar23 * dVar20 * -1.27 + dVar22 * -0.67 + (double)local_1508._0_8_) *
                (dVar14 * 4200.0 * local_1778 +
                (double)local_17d8._0_8_ / -1555.0 + (double)local_1898._0_8_ / -94.0) *
                (0.43429448190325176 / local_1790) + dVar21 / dVar24) * 2.302585092994046 * dVar19;
      local_1888[1] = local_1888[1] - dVar19;
      local_1888[0xe] = local_1888[0xe] - dVar19;
      local_1888[0xf] = local_1888[0xf] + dVar19;
      dVar17 = (double)local_1768._0_8_ * dVar26;
      dVar26 = dVar26 * dVar27;
      dVar14 = (1.0 / dVar24 + dVar22) * (dVar19 / local_1738);
      if (iVar1 == 2) {
        local_1488[1] = local_1488[1] - dVar14;
        local_1418 = local_1418 - dVar14;
        local_1410 = local_1410 + dVar14;
        dVar19 = local_1948[0xe] * dVar17;
        local_13e0[2] = local_13e0[2] - dVar19;
        local_13e0[0xf] = local_13e0[0xf] - dVar19;
        local_13e0[0x10] = dVar19 + local_13e0[0x10];
        dVar19 = dVar14 * 5.0;
        local_13e0[0x5a] = local_13e0[0x5a] - dVar19;
        local_13e0[0x67] = local_13e0[0x67] - dVar19;
        local_13e0[0x68] = dVar19 + local_13e0[0x68];
        local_da0 = local_da0 - dVar14;
        local_d38 = local_d38 - dVar14;
        local_d30 = local_d30 + dVar14;
        dVar19 = dVar14 * 0.5;
        local_cf0 = local_cf0 - dVar19;
        local_c88 = local_c88 - dVar19;
        local_c80 = dVar19 + local_c80;
        local_c40 = local_c40 - dVar14;
        local_bd8 = local_bd8 - dVar14;
        local_bd0 = local_bd0 + dVar14;
        dVar17 = dVar17 * local_1948[1];
        local_ae0 = local_ae0 - dVar17;
        local_a78 = local_a78 - dVar17;
        local_a70 = dVar17 + local_a70;
        local_a30 = local_a30 + dVar26;
        local_9c8 = local_9c8 + dVar26;
        local_9c0 = local_9c0 - dVar26;
        dVar14 = dVar14 + dVar14;
        local_820 = local_820 - dVar14;
        local_7b8 = local_7b8 - dVar14;
        local_7b0 = dVar14 + local_7b0;
      }
      else {
        local_15e8[0] = dVar14 * 2.0;
        local_15e8[1] = local_1948[0xe] * dVar17 + dVar14;
        auStack_15d8._8_8_ = dVar14;
        auStack_15d8._0_8_ = dVar14;
        dStack_15c8 = dVar14;
        dStack_15c0 = dVar14 * 6.0;
        local_15a8._8_8_ = dVar14;
        local_15a8._0_8_ = dVar14;
        local_15b8._8_8_ = dVar14;
        local_15b8._0_8_ = dVar14;
        local_1598 = local_15e8[0];
        dStack_1590 = dVar14 * 1.5;
        dStack_1588 = local_15e8[0];
        local_1580._8_8_ = dVar17 * local_1948[1] + dVar14;
        local_1580._0_8_ = dVar14;
        auStack_1570._8_8_ = dVar14;
        auStack_1570._0_8_ = dVar14 - dVar26;
        dStack_1560 = dVar14;
        local_1558 = dVar14 * 3.0;
        local_1550 = dVar14;
        local_1548 = dVar14;
        pdVar6 = &local_1410;
        lVar5 = 0;
        do {
          dVar14 = local_15e8[lVar5];
          pdVar6[-0xe] = pdVar6[-0xe] - dVar14;
          pdVar6[-1] = pdVar6[-1] - dVar14;
          *pdVar6 = dVar14 + *pdVar6;
          lVar5 = lVar5 + 1;
          pdVar6 = pdVar6 + 0x16;
        } while (lVar5 != 0x15);
      }
      local_618[1] = local_618[1] - dVar16;
      local_5a8 = local_5a8 - dVar16;
      local_5a0 = dVar16 + local_5a0;
      local_17b8._0_8_ = local_1948[1] * local_1948[0x10];
      local_1738 = local_1948[0x14] * -0.30000000000000004 +
                   local_1948[0x12] + local_1948[0x12] +
                   local_1948[0xb] * 0.5 +
                   local_1948[5] * 5.0 + local_1948[0] + dVar25 + local_1948[10] + local_1948[0xc];
      dVar14 = exp(local_1708 + dVar28 * -915.8543317645905);
      local_1768._0_8_ = dVar14 * 1080000.0;
      dVar14 = exp((double)local_1748._0_8_ * -7.62 + dVar28 * -3507.4201606588986);
      dVar17 = ((local_1738 * 1e-12) / (double)local_1768._0_8_) * dVar14 * 1.2e+42;
      local_1708 = log10(dVar17);
      local_1898._0_8_ = exp(local_15f8 / -210.0);
      local_1898._0_8_ = (double)local_1898._0_8_ * 0.024700000000000055;
      local_17d8._0_8_ = exp(local_15f8 / -984.0);
      local_17d8._0_8_ = (double)local_17d8._0_8_ * 0.9753;
      dVar14 = exp(dVar28 * -4374.0);
      dVar19 = (double)local_1898._0_8_ + (double)local_17d8._0_8_ + dVar14;
      local_1600 = log10(dVar19);
      dVar18 = local_1600 * -1.27 + 0.75;
      local_1790 = local_1600 * -0.67 + -0.4 + local_1708;
      local_17c8._0_8_ = 1.0 / (local_1790 * -0.14 + dVar18);
      local_1790 = local_1790 * (double)local_17c8._0_8_;
      local_1508._0_8_ = 1.0 / (local_1790 * local_1790 + 1.0);
      local_1708 = pow(10.0,local_1600 * (double)local_1508._0_8_);
      local_14f8 = local_1948[0x11];
      dVar16 = exp((local_508 + local_1758) - local_538);
      dVar24 = (double)local_16f8._0_8_ + local_1778 * 915.8543317645905;
      dVar23 = (local_1600 + local_1600) * (double)local_1508._0_8_ * (double)local_1508._0_8_ *
               local_1790 * (double)local_17c8._0_8_;
      dVar20 = -dVar18 * dVar23 * (double)local_17c8._0_8_;
      dVar21 = dVar17 + 1.0;
      dVar18 = ((dVar28 * -7.62 + local_1778 * 3507.4201606588986) - dVar24) * 0.43429448190325176;
      dVar16 = (double)local_1768._0_8_ / (dVar16 * dVar15);
      dVar27 = (dVar17 / dVar21) * local_1708;
      dVar17 = ((double)local_1768._0_8_ * (double)local_17b8._0_8_ - local_14f8 * dVar16) * dVar27;
      dVar18 = (dVar24 * (double)local_1768._0_8_ * (double)local_17b8._0_8_ -
               (dVar24 - ((dStack_1660 - (dStack_16e0 + local_1668)) + 1.0) * dVar28) * dVar16 *
               local_14f8) * dVar27 +
               (dVar18 * dVar20 +
                (dVar23 * local_1790 * -1.27 + dVar20 * -0.67 + (double)local_1508._0_8_) *
                (dVar14 * 4374.0 * local_1778 +
                (double)local_17d8._0_8_ / -984.0 + (double)local_1898._0_8_ / -210.0) *
                (0.43429448190325176 / dVar19) + dVar18 / dVar21) * 2.302585092994046 * dVar17;
      local_1888[1] = local_1888[1] - dVar17;
      local_1888[0x10] = local_1888[0x10] - dVar17;
      local_1888[0x11] = local_1888[0x11] + dVar17;
      dVar19 = (double)local_1768._0_8_ * dVar27;
      dVar27 = dVar27 * dVar16;
      dVar14 = (1.0 / dVar21 + dVar20) * (dVar17 / local_1738);
      if (iVar1 == 2) {
        local_1488[1] = local_1488[1] - dVar14;
        local_1408 = local_1408 - dVar14;
        local_1400 = local_1400 + dVar14;
        dVar16 = local_1948[0x10] * dVar19;
        local_13e0[2] = local_13e0[2] - dVar16;
        local_13e0[0x11] = local_13e0[0x11] - dVar16;
        local_13e0[0x12] = dVar16 + local_13e0[0x12];
        dVar16 = dVar14 * 5.0;
        local_13e0[0x5a] = local_13e0[0x5a] - dVar16;
        local_13e0[0x69] = local_13e0[0x69] - dVar16;
        local_13e0[0x6a] = dVar16 + local_13e0[0x6a];
        local_da0 = local_da0 - dVar14;
        local_d28 = local_d28 - dVar14;
        local_d20 = local_d20 + dVar14;
        dVar16 = dVar14 * 0.5;
        local_cf0 = local_cf0 - dVar16;
        local_c78 = local_c78 - dVar16;
        local_c70 = dVar16 + local_c70;
        local_c40 = local_c40 - dVar14;
        local_bc8 = local_bc8 - dVar14;
        local_bc0 = local_bc0 + dVar14;
        dVar19 = dVar19 * local_1948[1];
        local_980 = local_980 - dVar19;
        local_908 = local_908 - dVar19;
        local_900 = dVar19 + local_900;
        local_8d0 = local_8d0 + dVar27;
        local_858 = local_858 + dVar27;
        local_850 = local_850 - dVar27;
        dVar16 = dVar14 + dVar14;
        local_820 = local_820 - dVar16;
        local_7a8 = local_7a8 - dVar16;
        local_7a0 = dVar16 + local_7a0;
        dVar14 = dVar14 * -0.30000000000000004;
        local_6c0 = local_6c0 - dVar14;
        local_648 = local_648 - dVar14;
        local_640 = dVar14 + local_640;
      }
      else {
        local_15e8[0] = dVar14 * 2.0;
        local_15e8[1] = local_1948[0x10] * dVar19 + dVar14;
        auStack_15d8._8_8_ = dVar14;
        auStack_15d8._0_8_ = dVar14;
        dStack_15c8 = dVar14;
        dStack_15c0 = dVar14 * 6.0;
        local_15a8._8_8_ = dVar14;
        local_15a8._0_8_ = dVar14;
        local_15b8._8_8_ = dVar14;
        local_15b8._0_8_ = dVar14;
        local_1598 = local_15e8[0];
        dStack_1590 = dVar14 * 1.5;
        dStack_1588 = local_15e8[0];
        local_1580._8_8_ = dVar14;
        local_1580._0_8_ = dVar14;
        auStack_1570._8_8_ = dVar19 * local_1948[1] + dVar14;
        auStack_1570._0_8_ = dVar14;
        dStack_1560 = dVar14 - dVar27;
        local_1558 = dVar14 * 3.0;
        local_1550 = dVar14;
        local_1548 = dVar14 * 0.7;
        pdVar6 = &local_1400;
        lVar5 = 0;
        do {
          dVar14 = local_15e8[lVar5];
          pdVar6[-0x10] = pdVar6[-0x10] - dVar14;
          pdVar6[-1] = pdVar6[-1] - dVar14;
          *pdVar6 = dVar14 + *pdVar6;
          lVar5 = lVar5 + 1;
          pdVar6 = pdVar6 + 0x16;
        } while (lVar5 != 0x15);
      }
      local_618[1] = local_618[1] - dVar18;
      local_598 = local_598 - dVar18;
      local_590 = dVar18 + local_590;
      local_1738 = local_1948[0x14] * -0.30000000000000004 +
                   local_1948[0x12] + local_1948[0x12] +
                   local_1948[0xb] * 0.5 +
                   local_1948[5] * 5.0 + local_1948[0] + dVar25 + local_1948[10] + local_1948[0xc];
      local_16f8._0_8_ = local_1948[1] * local_1948[0x11];
      dVar14 = exp((double)local_1748._0_8_ * -0.99 + dVar28 * -795.0823319714576);
      local_1768._8_4_ = extraout_XMM0_Dc_01;
      local_1768._0_8_ = dVar14 * 521000000000.0;
      local_1768._12_4_ = extraout_XMM0_Dd_01;
      dVar14 = exp((double)local_1748._0_8_ * -7.08 + dVar28 * -3364.003410904553);
      local_1708 = ((local_1738 * 1e-12) / (double)local_1768._0_8_) * dVar14 * 1.99e+41;
      uStack_1700 = 0;
      local_17b8._0_8_ = log10(local_1708);
      local_1898._0_8_ = exp(local_15f8 / -125.0);
      local_1898._0_8_ = (double)local_1898._0_8_ * 0.15780000000000005;
      local_17d8._0_8_ = exp(local_15f8 / -2219.0);
      local_17d8._0_8_ = (double)local_17d8._0_8_ * 0.8422;
      dVar14 = exp(dVar28 * -6882.0);
      local_17c8._0_8_ = (double)local_1898._0_8_ + (double)local_17d8._0_8_ + dVar14;
      local_1508._0_8_ = log10((double)local_17c8._0_8_);
      dVar17 = (double)local_1508._0_8_ * -1.27 + 0.75;
      dVar18 = (double)local_1508._0_8_ * -0.67 + -0.4 + (double)local_17b8._0_8_;
      dVar23 = 1.0 / (dVar18 * -0.14 + dVar17);
      dVar18 = dVar18 * dVar23;
      local_1790 = 1.0 / (dVar18 * dVar18 + 1.0);
      local_17b8._0_8_ = pow(10.0,(double)local_1508._0_8_ * local_1790);
      local_14f8 = local_1948[0x12];
      dVar16 = exp((local_538 + local_1758) - local_518);
      dVar19 = dVar28 * -0.99 + local_1778 * 795.0823319714576;
      dVar20 = ((double)local_1508._0_8_ + (double)local_1508._0_8_) * local_1790 * local_1790 *
               dVar18 * dVar23;
      dVar23 = -dVar17 * dVar20 * dVar23;
      dVar24 = local_1708 + 1.0;
      dVar17 = ((dVar28 * -7.08 + local_1778 * 3364.003410904553) - dVar19) * 0.43429448190325176;
      dVar21 = (double)local_1768._0_8_ / (dVar16 * dVar15);
      local_17b8._0_8_ = (local_1708 / dVar24) * (double)local_17b8._0_8_;
      dVar16 = ((double)local_1768._0_8_ * (double)local_16f8._0_8_ - local_14f8 * dVar21) *
               (double)local_17b8._0_8_;
      dVar17 = (dVar19 * (double)local_1768._0_8_ * (double)local_16f8._0_8_ -
               (dVar19 - ((local_1658 - (dStack_16e0 + dStack_1660)) + 1.0) * dVar28) * dVar21 *
               local_14f8) * (double)local_17b8._0_8_ +
               (dVar17 * dVar23 +
                (dVar20 * dVar18 * -1.27 + dVar23 * -0.67 + local_1790) *
                (dVar14 * 6882.0 * local_1778 +
                (double)local_17d8._0_8_ / -2219.0 + (double)local_1898._0_8_ / -125.0) *
                (0.43429448190325176 / (double)local_17c8._0_8_) + dVar17 / dVar24) *
               2.302585092994046 * dVar16;
      local_1888[1] = local_1888[1] - dVar16;
      local_1888[0x11] = local_1888[0x11] - dVar16;
      local_1888[0x12] = local_1888[0x12] + dVar16;
      dVar19 = (double)local_17b8._0_8_ * (double)local_1768._0_8_;
      dVar14 = (1.0 / dVar24 + dVar23) * (dVar16 / local_1738);
      uVar12 = SUB84(dVar14,0);
      uVar13 = (undefined4)((ulong)dVar14 >> 0x20);
      if (iVar1 == 2) {
        local_1488[1] = local_1488[1] - dVar14;
        local_1400 = local_1400 - dVar14;
        local_13f8[0] = local_13f8[0] + dVar14;
        dVar16 = local_1948[0x11] * dVar19;
        local_13e0[2] = local_13e0[2] - dVar16;
        local_13e0[0x12] = local_13e0[0x12] - dVar16;
        local_13e0[0x13] = dVar16 + local_13e0[0x13];
        dVar16 = dVar14 * 5.0;
        local_13e0[0x5a] = local_13e0[0x5a] - dVar16;
        local_13e0[0x6a] = local_13e0[0x6a] - dVar16;
        local_13e0[0x6b] = dVar16 + local_13e0[0x6b];
        local_da0 = local_da0 - dVar14;
        local_d20 = local_d20 - dVar14;
        local_d18 = local_d18 + dVar14;
        dVar16 = dVar14 * 0.5;
        local_cf0 = local_cf0 - dVar16;
        local_c70 = local_c70 - dVar16;
        local_c68 = dVar16 + local_c68;
        local_c40 = local_c40 - dVar14;
        local_bc0 = local_bc0 - dVar14;
        local_bb8 = local_bb8 + dVar14;
        dVar19 = dVar19 * local_1948[1];
        local_8d0 = local_8d0 - dVar19;
        local_850 = local_850 - dVar19;
        local_848 = dVar19 + local_848;
        dVar16 = (dVar14 + dVar14) - dVar21 * (double)local_17b8._0_8_;
        local_820 = local_820 - dVar16;
        local_7a0 = local_7a0 - dVar16;
        local_798 = dVar16 + local_798;
        dVar14 = dVar14 * -0.30000000000000004;
        local_6c0 = local_6c0 - dVar14;
        local_640 = local_640 - dVar14;
        local_638 = dVar14 + local_638;
      }
      else {
        local_15e8[0] = dVar14 * 2.0;
        local_15e8[1] = local_1948[0x11] * dVar19 + dVar14;
        auStack_15d8._8_4_ = uVar12;
        auStack_15d8._0_8_ = dVar14;
        auStack_15d8._12_4_ = uVar13;
        dStack_15c8 = dVar14;
        dStack_15c0 = dVar14 * 6.0;
        local_15a8._8_4_ = uVar12;
        local_15a8._0_8_ = dVar14;
        local_15a8._12_4_ = uVar13;
        local_15b8._8_4_ = uVar12;
        local_15b8._0_8_ = dVar14;
        local_15b8._12_4_ = uVar13;
        local_1598 = local_15e8[0];
        dStack_1590 = dVar14 * 1.5;
        dStack_1588 = local_15e8[0];
        auStack_1570._8_4_ = uVar12;
        auStack_1570._0_8_ = dVar14;
        auStack_1570._12_4_ = uVar13;
        local_1580._8_4_ = uVar12;
        local_1580._0_8_ = dVar14;
        local_1580._12_4_ = uVar13;
        dStack_1560 = local_1948[1] * dVar19 + dVar14;
        local_1558 = dVar14 * 3.0 + -(dVar21 * (double)local_17b8._0_8_);
        local_1550 = dVar14;
        local_1548 = dVar14 * 0.7;
        pdVar6 = local_13f8;
        lVar5 = 0;
        do {
          dVar14 = local_15e8[lVar5];
          pdVar6[-0x11] = pdVar6[-0x11] - dVar14;
          pdVar6[-1] = pdVar6[-1] - dVar14;
          *pdVar6 = dVar14 + *pdVar6;
          lVar5 = lVar5 + 1;
          pdVar6 = pdVar6 + 0x16;
        } while (lVar5 != 0x15);
      }
      local_618[1] = local_618[1] - dVar17;
      local_590 = local_590 - dVar17;
      local_588 = dVar17 + local_588;
      local_1708 = local_1948[0];
      local_17b8._0_8_ = local_1948[0xb];
      local_1738 = local_1948[0x14] * -0.30000000000000004 +
                   local_1948[0x12] + local_1948[0x12] +
                   local_1948[0xb] * 0.5 +
                   local_1948[5] * 5.0 + dVar25 + local_1948[0] + local_1948[10] + local_1948[0xc];
      dVar19 = (double)local_1748._0_8_ * 1.5;
      dVar14 = exp(dVar28 * -40056.04659805571 + dVar19);
      local_1768._0_8_ = dVar14 * 43.0;
      dVar14 = exp((double)local_1748._0_8_ * -3.42 + dVar28 * -42446.32576062813);
      local_16f8._0_8_ = ((local_1738 * 1e-12) / (double)local_1768._0_8_) * dVar14 * 5.07e+27;
      local_14f8 = log10((double)local_16f8._0_8_);
      local_1898._0_8_ = exp(local_15f8 / -197.0);
      local_1898._0_8_ = (double)local_1898._0_8_ * 0.06799999999999995;
      local_17d8._0_8_ = exp(local_15f8 / -1540.0);
      local_17d8._0_8_ = (double)local_17d8._0_8_ * 0.932;
      local_17c8._0_8_ = exp(dVar28 * -10300.0);
      local_1508._0_8_ =
           (double)local_1898._0_8_ + (double)local_17d8._0_8_ + (double)local_17c8._0_8_;
      local_4f0 = log10((double)local_1508._0_8_);
      dVar17 = local_4f0 * -1.27 + 0.75;
      local_1790 = local_4f0 * -0.67 + -0.4 + local_14f8;
      dVar20 = 1.0 / (local_1790 * -0.14 + dVar17);
      local_1790 = local_1790 * dVar20;
      local_1600 = 1.0 / (local_1790 * local_1790 + 1.0);
      local_14f8 = pow(10.0,local_4f0 * local_1600);
      dVar16 = local_1948[0xe];
      dVar14 = exp((local_14e8 + (double)local_1728._0_8_) - local_1618);
      local_17b8._0_8_ = local_1708 * (double)local_17b8._0_8_;
      dVar21 = (local_4f0 + local_4f0) * local_1600 * local_1600 * local_1790 * dVar20;
      dVar20 = -dVar17 * dVar21 * dVar20;
      local_1708 = dVar28 * 1.5;
      uStack_1700 = 0;
      dVar17 = local_1778 * 40056.04659805571 + local_1708;
      dVar23 = (double)local_16f8._0_8_ + 1.0;
      dVar18 = ((dVar28 * -3.42 + local_1778 * 42446.32576062813) - dVar17) * 0.43429448190325176;
      dVar14 = (double)local_1768._0_8_ / (dVar14 * dVar15);
      dVar27 = ((double)local_16f8._0_8_ / dVar23) * local_14f8;
      dVar24 = ((double)local_1768._0_8_ * (double)local_17b8._0_8_ - dVar16 * dVar14) * dVar27;
      dVar16 = (dVar17 * (double)local_1768._0_8_ * (double)local_17b8._0_8_ -
               (dVar17 - ((local_1678 - (local_16e8 + dStack_1690)) + 1.0) * dVar28) * dVar14 *
               dVar16) * dVar27 +
               (dVar18 * dVar20 +
                (dVar21 * local_1790 * -1.27 + dVar20 * -0.67 + local_1600) *
                ((double)local_17c8._0_8_ * 10300.0 * local_1778 +
                (double)local_17d8._0_8_ / -1540.0 + (double)local_1898._0_8_ / -197.0) *
                (0.43429448190325176 / (double)local_1508._0_8_) + dVar18 / dVar23) *
               2.302585092994046 * dVar24;
      local_1888[0] = local_1888[0] - dVar24;
      local_1888[0xb] = local_1888[0xb] - dVar24;
      local_1888[0xe] = local_1888[0xe] + dVar24;
      dVar17 = (double)local_1768._0_8_ * dVar27;
      dVar27 = dVar27 * dVar14;
      dVar14 = (1.0 / dVar23 + dVar20) * (dVar24 / local_1738);
      if (iVar1 == 2) {
        dVar18 = local_1948[0xb] * dVar17 + dVar14;
        local_1488[0] = local_1488[0] - dVar18;
        local_1430 = local_1430 - dVar18;
        local_1418 = dVar18 + local_1418;
        dVar18 = dVar14 * 5.0;
        local_13e0[0x59] = local_13e0[0x59] - dVar18;
        local_13e0[100] = local_13e0[100] - dVar18;
        local_13e0[0x67] = dVar18 + local_13e0[0x67];
        local_da8 = local_da8 - dVar14;
        dStack_d50 = dStack_d50 - dVar14;
        local_d38 = local_d38 + dVar14;
        dVar17 = dVar14 * 0.5 + dVar17 * local_1948[0];
        local_cf8 = local_cf8 - dVar17;
        dStack_ca0 = dStack_ca0 - dVar17;
        local_c88 = dVar17 + local_c88;
        local_c48 = local_c48 - dVar14;
        local_bf0 = local_bf0 - dVar14;
        local_bd8 = local_bd8 + dVar14;
        local_ae8 = local_ae8 + dVar27;
        local_a90 = local_a90 + dVar27;
        local_a78 = local_a78 - dVar27;
        dVar17 = dVar14 + dVar14;
        local_828 = local_828 - dVar17;
        local_7d0 = local_7d0 - dVar17;
        local_7b8 = dVar17 + local_7b8;
        dVar14 = dVar14 * -0.30000000000000004;
        local_6c8 = local_6c8 - dVar14;
        local_670 = local_670 - dVar14;
        local_658 = dVar14 + local_658;
      }
      else {
        local_1598 = dVar14 + dVar14;
        local_15e8[0] = local_1948[0xb] * dVar17 + local_1598;
        dStack_15c8 = dVar14;
        local_15e8[1] = dVar14;
        auStack_15d8._8_8_ = dVar14;
        auStack_15d8._0_8_ = dVar14;
        dStack_15c0 = dVar14 * 6.0;
        local_15a8._8_8_ = dVar14;
        local_15a8._0_8_ = dVar14;
        local_15b8._8_8_ = dVar14;
        local_15b8._0_8_ = dVar14;
        dStack_1590 = dVar14 * 1.5 + dVar17 * local_1948[0];
        dStack_1588 = local_1598;
        local_1580._8_8_ = dVar14 - dVar27;
        local_1580._0_8_ = dVar14;
        auStack_1570._8_8_ = dVar14;
        auStack_1570._0_8_ = dVar14;
        dStack_1560 = dVar14;
        local_1558 = dVar14 * 3.0;
        local_1550 = dVar14;
        local_1548 = dVar14 * 0.7;
        pdVar6 = &local_1418;
        lVar5 = 0;
        do {
          dVar14 = local_15e8[lVar5];
          pdVar6[-0xe] = pdVar6[-0xe] - dVar14;
          pdVar6[-3] = pdVar6[-3] - dVar14;
          *pdVar6 = dVar14 + *pdVar6;
          lVar5 = lVar5 + 1;
          pdVar6 = pdVar6 + 0x16;
        } while (lVar5 != 0x15);
      }
      local_618[0] = local_618[0] - dVar16;
      local_5c8._8_8_ = (double)local_5c8._8_8_ - dVar16;
      local_5a8 = dVar16 + local_5a8;
      local_16f8._0_8_ = local_1948[9];
      local_1738 = local_1948[0x14] * -0.30000000000000004 +
                   local_1948[0x12] + local_1948[0x12] +
                   local_1948[0xb] * 0.5 +
                   local_1948[5] * 5.0 + local_1948[0] + dVar25 + local_1948[10] + local_1948[0xc];
      local_1768._0_8_ = exp((double)local_1748._0_8_ * -0.97 + dVar28 * -311.9943327989264);
      local_1768._0_8_ = (double)local_1768._0_8_ * 21200000000.0;
      dVar14 = exp((double)local_1748._0_8_ * -9.67 + dVar28 * -3130.0076613053584);
      dVar20 = ((local_1738 * 1e-12) / (double)local_1768._0_8_) * dVar14 * 1.77e+50;
      local_17b8._0_8_ = log10(dVar20);
      local_1898._0_8_ = exp(local_15f8 / -151.0);
      local_1898._0_8_ = (double)local_1898._0_8_ * 0.4675;
      dVar14 = exp(local_15f8 / -1038.0);
      local_17d8._0_8_ = dVar14 * 0.5325;
      dVar14 = exp(dVar28 * -4970.0);
      local_1508._0_8_ = (double)local_1898._0_8_ + (double)local_17d8._0_8_ + dVar14;
      local_328 = log10((double)local_1508._0_8_);
      local_17c8._12_4_ = extraout_XMM0_Dd_02;
      local_17c8._8_4_ = extraout_XMM0_Dc_02;
      local_17c8._0_8_ = local_328 * -1.27 + 0.75;
      local_1600 = local_328 * -0.67 + -0.4 + (double)local_17b8._0_8_;
      local_1790 = 1.0 / (local_1600 * -0.14 + (double)local_17c8._0_8_);
      local_1600 = local_1600 * local_1790;
      local_4f0 = 1.0 / (local_1600 * local_1600 + 1.0);
      local_17b8._0_8_ = pow(10.0,local_328 * local_4f0);
      dVar17 = local_1948[0x12];
      local_14f8 = (double)local_1638._0_8_ + (double)local_1638._0_8_;
      dVar16 = exp(local_14f8 - local_518);
      dVar18 = local_1948[0x12];
      dVar21 = dVar28 * -0.97 + local_1778 * 311.9943327989264;
      dVar22 = (local_328 + local_328) * local_4f0 * local_4f0 * local_1600 * local_1790;
      dVar24 = -(double)local_17c8._0_8_ * dVar22 * local_1790;
      dVar27 = dVar20 + 1.0;
      dVar23 = ((dVar28 * -9.67 + local_1778 * 3130.0076613053584) - dVar21) * 0.43429448190325176;
      dVar26 = (double)local_1768._0_8_ / (dVar16 * dVar15);
      local_17b8._0_8_ = (dVar20 / dVar27) * (double)local_17b8._0_8_;
      dVar20 = ((double)local_1768._0_8_ * (double)local_16f8._0_8_ * (double)local_16f8._0_8_ -
               dVar17 * dVar26) * (double)local_17b8._0_8_;
      dVar16 = (dVar21 * (double)local_1768._0_8_ *
                (double)local_16f8._0_8_ * (double)local_16f8._0_8_ -
               (dVar21 - ((local_1658 - (dStack_16a0 + dStack_16a0)) + 1.0) * dVar28) * dVar26 *
               dVar17) * (double)local_17b8._0_8_ +
               (dVar23 * dVar24 +
                (dVar22 * local_1600 * -1.27 + dVar24 * -0.67 + local_4f0) *
                (dVar14 * 4970.0 * local_1778 +
                (double)local_17d8._0_8_ / -1038.0 + (double)local_1898._0_8_ / -151.0) *
                (0.43429448190325176 / (double)local_1508._0_8_) + dVar23 / dVar27) *
               2.302585092994046 * dVar20;
      local_1888[9] = local_1888[9] - (dVar20 + dVar20);
      local_1888[0x12] = local_1888[0x12] + dVar20;
      local_1768._0_8_ = (double)local_1768._0_8_ * (double)local_17b8._0_8_;
      dVar14 = (1.0 / dVar27 + dVar24) * (dVar20 / local_1738);
      if (iVar1 == 2) {
        dVar17 = dVar14 * -2.0;
        local_1440 = local_1440 + dVar17;
        local_13f8[0] = local_13f8[0] + dVar14;
        dVar20 = dVar14 * 5.0;
        local_13e0[0x62] = local_13e0[0x62] - (dVar20 + dVar20);
        local_13e0[0x6b] = dVar20 + local_13e0[0x6b];
        dVar20 = ((double)local_1768._0_8_ + (double)local_1768._0_8_) * local_1948[9];
        dStack_e10 = dStack_e10 - (dVar20 + dVar20);
        local_dc8 = dVar20 + local_dc8;
        local_d60 = local_d60 + dVar17;
        local_d18 = local_d18 + dVar14;
        dVar20 = dVar14 * 0.5;
        local_cb0 = local_cb0 - (dVar20 + dVar20);
        local_c68 = dVar20 + local_c68;
        local_c00 = dVar17 + local_c00;
        local_bb8 = local_bb8 + dVar14;
        dVar17 = (dVar14 + dVar14) - (double)local_17b8._0_8_ * dVar26;
        local_7e0 = local_7e0 - (dVar17 + dVar17);
        local_798 = dVar17 + local_798;
        dVar14 = dVar14 * -0.30000000000000004;
        local_680 = local_680 - (dVar14 + dVar14);
        local_638 = dVar14 + local_638;
      }
      else {
        local_15e8[0] = dVar14 * 2.0;
        dStack_15c8 = dVar14;
        local_15e8[1] = dVar14;
        auStack_15d8._8_8_ = dVar14;
        auStack_15d8._0_8_ = dVar14;
        dStack_15c0 = dVar14 * 6.0;
        local_15b8._8_8_ = dVar14;
        local_15b8._0_8_ = dVar14;
        local_15a8._8_8_ =
             ((double)local_1768._0_8_ + (double)local_1768._0_8_) * local_1948[9] + dVar14;
        local_15a8._0_8_ = dVar14;
        local_1598 = local_15e8[0];
        dStack_1590 = dVar14 * 1.5;
        dStack_1588 = local_15e8[0];
        auStack_1570._8_8_ = dVar14;
        auStack_1570._0_8_ = dVar14;
        local_1580._8_8_ = dVar14;
        local_1580._0_8_ = dVar14;
        dStack_1560 = dVar14;
        local_1558 = dVar14 * 3.0 - (double)local_17b8._0_8_ * dVar26;
        local_1550 = dVar14;
        local_1548 = dVar14 * 0.7;
        pdVar6 = &local_1440;
        lVar5 = 0;
        do {
          dVar14 = local_15e8[lVar5];
          *pdVar6 = *pdVar6 - (dVar14 + dVar14);
          pdVar6[9] = dVar14 + pdVar6[9];
          lVar5 = lVar5 + 1;
          pdVar6 = pdVar6 + 0x16;
        } while (lVar5 != 0x15);
      }
      local_618[9] = local_618[9] - (dVar16 + dVar16);
      local_588 = dVar16 + local_588;
      local_17b8._0_8_ =
           local_1948[0xb] * 0.5 + local_1948[5] * 5.0 + local_1948[0] + dVar25 + local_1948[10] +
           local_1948[0xc];
      local_1738 = local_1948[1] * local_1948[2];
      uStack_1730 = 0;
      dVar14 = local_1788._0_8_ - (double)local_1748._0_8_;
      local_1768._8_8_ = 0;
      local_1768._0_8_ = local_1948[0x14];
      dVar16 = exp(dVar14);
      local_17c8._8_4_ = extraout_XMM0_Dc_03;
      local_17c8._0_8_ = dVar16;
      local_17c8._12_4_ = extraout_XMM0_Dd_03;
      local_16f8._0_8_ = local_1948[4];
      local_17d8._8_4_ = SUB84(dStack_530,0);
      local_17d8._0_8_ = dStack_530;
      local_17d8._12_4_ = (int)((ulong)dStack_530 >> 0x20);
      local_1898._0_8_ = dStack_14e0;
      local_1898._8_8_ = dStack_14e0;
      dVar16 = exp((dStack_530 + local_1758) - dStack_14e0);
      dVar23 = (double)local_17c8._0_8_ * 500000.0;
      dVar21 = (double)local_17a8._0_8_ - dVar28;
      dVar20 = dVar23 / (dVar16 * dVar15);
      dVar18 = (double)local_1768._0_8_ * -0.30000000000000004 +
               dVar18 + dVar18 + (double)local_17b8._0_8_;
      dVar17 = local_1738 * dVar23 + -dVar20 * (double)local_16f8._0_8_;
      dVar16 = dVar18 * dVar17;
      local_1888[1] = local_1888[1] - dVar16;
      local_1888[2] = local_1888[2] - dVar16;
      local_1888[4] = dVar16 + local_1888[4];
      dVar16 = (dVar21 * dVar23 * local_1738 -
               (dVar21 - ((local_16c8 - (dStack_16e0 + local_16d8)) + 1.0) * dVar28) * dVar20 *
               (double)local_16f8._0_8_) * dVar18;
      dVar23 = dVar23 * dVar18;
      dVar18 = dVar18 * dVar20;
      if (iVar1 == 2) {
        local_1488[1] = local_1488[1] - dVar17;
        local_1488[2] = local_1488[2] - dVar17;
        local_1468 = local_1468 + dVar17;
        dVar20 = local_1948[2] * dVar23;
        local_13e0[2] = local_13e0[2] - dVar20;
        local_13e0[3] = local_13e0[3] - dVar20;
        local_13e0[5] = dVar20 + local_13e0[5];
        dVar23 = dVar23 * local_1948[1];
        local_13e0[0x18] = local_13e0[0x18] - dVar23;
        local_13e0[0x19] = local_13e0[0x19] - dVar23;
        local_13e0[0x1b] = dVar23 + local_13e0[0x1b];
        local_13e0[0x44] = dVar18 + local_13e0[0x44];
        local_13e0[0x45] = dVar18 + local_13e0[0x45];
        local_13e0[0x47] = local_13e0[0x47] - dVar18;
        dVar18 = dVar17 * 5.0;
        local_13e0[0x5a] = local_13e0[0x5a] - dVar18;
        local_13e0[0x5b] = local_13e0[0x5b] - dVar18;
        local_13e0[0x5d] = dVar18 + local_13e0[0x5d];
        local_da0 = local_da0 - dVar17;
        dStack_d98 = dStack_d98 - dVar17;
        local_d88 = local_d88 + dVar17;
        dVar18 = dVar17 * 0.5;
        local_cf0 = local_cf0 - dVar18;
        dStack_ce8 = dStack_ce8 - dVar18;
        local_cd8 = dVar18 + local_cd8;
        local_c40 = local_c40 - dVar17;
        dStack_c38 = dStack_c38 - dVar17;
        local_c28 = local_c28 + dVar17;
        dVar18 = dVar17 + dVar17;
        local_820 = local_820 - dVar18;
        dStack_818 = dStack_818 - dVar18;
        local_808 = dVar18 + local_808;
        dVar17 = dVar17 * -0.30000000000000004;
        local_6c0 = local_6c0 - dVar17;
        dStack_6b8 = dStack_6b8 - dVar17;
        local_6a8 = dVar17 + local_6a8;
      }
      else {
        local_15e8[0] = dVar17 * 2.0;
        local_15e8[1] = dVar23 * local_1948[2] + dVar17;
        auStack_15d8._8_8_ = dVar17;
        auStack_15d8._0_8_ = dVar23 * local_1948[1] + dVar17;
        dStack_15c8 = dVar17 - dVar18;
        dStack_15c0 = dVar17 * 6.0;
        local_15a8._8_8_ = dVar17;
        local_15a8._0_8_ = dVar17;
        local_15b8._8_8_ = dVar17;
        local_15b8._0_8_ = dVar17;
        local_1598 = local_15e8[0];
        dStack_1590 = dVar17 * 1.5;
        dStack_1588 = local_15e8[0];
        auStack_1570._8_8_ = dVar17;
        auStack_1570._0_8_ = dVar17;
        local_1580._8_8_ = dVar17;
        local_1580._0_8_ = dVar17;
        dStack_1560 = dVar17;
        local_1558 = dVar17 * 3.0;
        local_1550 = dVar17;
        local_1548 = dVar17 * 0.7;
        pdVar6 = local_1488 + 1;
        lVar5 = 0;
        do {
          dVar17 = local_15e8[lVar5];
          *pdVar6 = *pdVar6 - dVar17;
          pdVar6[1] = pdVar6[1] - dVar17;
          pdVar6[3] = dVar17 + pdVar6[3];
          lVar5 = lVar5 + 1;
          pdVar6 = pdVar6 + 0x16;
        } while (lVar5 != 0x15);
      }
      local_1538._0_8_ = (double)local_1538._0_8_ + (double)local_14a8._0_8_;
      local_16f8._8_8_ = uStack_15f0;
      local_16f8._0_8_ = local_15f8 * -0.0;
      local_618[1] = local_618[1] - dVar16;
      local_618[2] = local_618[2] - dVar16;
      local_618[4] = dVar16 + local_618[4];
      dVar18 = local_1948[5] * 5.0 + local_1948[3] * 5.0 + local_1948[0] + dVar25 + local_1948[10];
      local_1600 = local_1948[0xb];
      local_1790 = local_1948[0xc];
      local_17c8._0_8_ = local_1948[0x12];
      local_1768._0_8_ = local_1948[0x14];
      local_1738 = (double)local_1748._0_8_ * 0.0;
      uStack_1730 = local_1748._8_8_;
      local_14a8._0_8_ = local_1948[2] * local_1948[0xb];
      dVar16 = exp(dVar28 * -1509.64999741416 + local_1738);
      local_1508._8_4_ = extraout_XMM0_Dc_04;
      local_1508._0_8_ = dVar16;
      local_1508._12_4_ = extraout_XMM0_Dd_04;
      local_17b8._0_8_ = local_1948[0xc];
      dVar16 = exp((local_14e8 + (double)local_17d8._0_8_) - local_528);
      local_14a8._8_8_ = uStack_4c0;
      dVar17 = local_4c8;
      dVar27 = (double)local_1768._0_8_ * -0.5 +
               (double)local_17c8._0_8_ + (double)local_17c8._0_8_ +
               local_1790 * 2.5 + local_1600 * 0.5 + dVar18;
      dVar24 = (double)local_1508._0_8_ * 602.0;
      local_1768._8_8_ = 0;
      local_1768._0_8_ = dVar28 * 0.0;
      dVar18 = local_1778 * 1509.64999741416 + dVar28 * 0.0;
      dVar20 = dVar24 / (dVar16 * dVar15);
      dVar16 = dVar24 * (double)local_14a8._0_8_ - (double)local_17b8._0_8_ * dVar20;
      dVar23 = dVar27 * dVar16;
      local_1888[2] = local_1888[2] - dVar23;
      local_1888[0xb] = local_1888[0xb] - dVar23;
      local_1888[0xc] = dVar23 + local_1888[0xc];
      dVar18 = (dVar18 * dVar24 * (double)local_14a8._0_8_ -
               (dVar18 - ((local_1688 - (local_16d8 + dStack_1690)) + 1.0) * dVar28) * dVar20 *
               (double)local_17b8._0_8_) * dVar27;
      dVar24 = dVar24 * dVar27;
      if (iVar1 == 2) {
        local_1488[2] = local_1488[2] - dVar16;
        local_1430 = local_1430 - dVar16;
        local_1428 = local_1428 + dVar16;
        dVar23 = local_1948[0xb] * dVar24;
        local_13e0[0x19] = local_13e0[0x19] - dVar23;
        local_13e0[0x22] = local_13e0[0x22] - dVar23;
        local_13e0[0x23] = dVar23 + local_13e0[0x23];
        dVar23 = dVar16 * 5.0;
        local_13e0[0x2f] = local_13e0[0x2f] - dVar23;
        local_13e0[0x38] = local_13e0[0x38] - dVar23;
        local_13e0[0x39] = local_13e0[0x39] + dVar23;
        local_13e0[0x5b] = local_13e0[0x5b] - dVar23;
        local_13e0[100] = local_13e0[100] - dVar23;
        local_13e0[0x65] = dVar23 + local_13e0[0x65];
        dStack_d98 = dStack_d98 - dVar16;
        dStack_d50 = dStack_d50 - dVar16;
        local_d48 = local_d48 + dVar16;
        dVar23 = dVar16 * 0.5 + dVar24 * local_1948[2];
        dStack_ce8 = dStack_ce8 - dVar23;
        dStack_ca0 = dStack_ca0 - dVar23;
        local_c98 = dVar23 + local_c98;
        dVar20 = dVar16 * 2.5 - dVar20 * dVar27;
        dStack_c38 = dStack_c38 - dVar20;
        local_bf0 = local_bf0 - dVar20;
        local_be8 = dVar20 + local_be8;
        dVar20 = dVar16 + dVar16;
        dStack_818 = dStack_818 - dVar20;
        local_7d0 = local_7d0 - dVar20;
        local_7c8 = dVar20 + local_7c8;
        dVar16 = dVar16 * -0.5;
        dStack_6b8 = dStack_6b8 - dVar16;
        local_670 = local_670 - dVar16;
        local_668 = dVar16 + local_668;
      }
      else {
        local_15e8[0] = dVar16 + dVar16;
        local_15e8[1] = dVar16;
        auStack_15d8._8_8_ = dVar16 * 6.0;
        auStack_15d8._0_8_ = local_1948[0xb] * dVar24 + dVar16;
        dStack_15c8 = dVar16;
        dStack_15c0 = dVar16 * 6.0;
        local_15a8._8_8_ = dVar16;
        local_15a8._0_8_ = dVar16;
        local_15b8._8_8_ = dVar16;
        local_15b8._0_8_ = dVar16;
        local_1598 = dVar16 + dVar16;
        dStack_1590 = dVar16 * 1.5 + dVar24 * local_1948[2];
        dStack_1588 = dVar16 * 3.5 + -(dVar20 * dVar27);
        auStack_1570._8_8_ = dVar16;
        auStack_1570._0_8_ = dVar16;
        local_1580._8_8_ = dVar16;
        local_1580._0_8_ = dVar16;
        dStack_1560 = dVar16;
        local_1558 = dVar16 * 3.0;
        local_1550 = dVar16;
        local_1548 = dVar16 * 0.5;
        pdVar6 = &local_1428;
        lVar5 = 0;
        do {
          dVar16 = local_15e8[lVar5];
          pdVar6[-10] = pdVar6[-10] - dVar16;
          pdVar6[-1] = pdVar6[-1] - dVar16;
          *pdVar6 = dVar16 + *pdVar6;
          lVar5 = lVar5 + 1;
          pdVar6 = pdVar6 + 0x16;
        } while (lVar5 != 0x15);
      }
      uVar12 = local_16f8._12_4_;
      local_16f8._8_4_ = local_16f8._8_4_;
      local_16f8._0_8_ = local_16f8._0_8_ + (double)local_1538._0_8_;
      local_16f8._12_4_ = uVar12;
      local_618[2] = local_618[2] - dVar18;
      local_5c8._8_8_ = (double)local_5c8._8_8_ - dVar18;
      local_14a8._0_8_ = dVar17 * -0.0;
      local_5b8 = dVar18 + local_5b8;
      local_17b8._0_8_ =
           ((local_1948[0x12] * 0.5 +
            local_1948[0xc] * 0.5 +
            local_1948[0xb] * -0.25 + ((dVar25 - local_1948[3]) - local_1948[5])) - local_1948[0x13]
           ) - local_1948[0x14];
      local_17c8._0_8_ = local_1948[3] * local_1948[1];
      local_1790 = exp((double)local_1748._0_8_ * -0.86 + (double)local_1788._0_8_);
      dVar17 = local_1948[6];
      dVar16 = (local_1628._0_8_ + local_1758) - (double)local_1718._0_8_;
      local_1538._8_4_ = local_1628._8_4_;
      local_1538._0_8_ = dVar16;
      local_1538._12_4_ = local_1628._12_4_;
      dVar16 = exp(dVar16);
      uVar3 = uStack_4b0;
      dVar18 = local_4b8;
      dVar27 = local_1790 * 2800000.0;
      dVar20 = dVar28 * -0.86 + (double)local_17a8._0_8_;
      dVar23 = dVar27 / (dVar16 * dVar15);
      dVar16 = dVar27 * (double)local_17c8._0_8_ - dVar17 * dVar23;
      dVar24 = (double)local_17b8._0_8_ * dVar16;
      dVar17 = (dVar20 * dVar27 * (double)local_17c8._0_8_ -
               (dVar20 - ((local_16b8 - (dStack_16e0 + dStack_16d0)) + 1.0) * dVar28) * dVar23 *
               dVar17) * (double)local_17b8._0_8_;
      local_1888[1] = local_1888[1] - dVar24;
      local_1888[3] = local_1888[3] - dVar24;
      local_1888[6] = dVar24 + local_1888[6];
      dVar27 = dVar27 * (double)local_17b8._0_8_;
      dVar23 = dVar23 * (double)local_17b8._0_8_;
      if (iVar1 == 2) {
        dVar20 = local_1948[3] * dVar27;
        local_13e0[2] = local_13e0[2] - dVar20;
        local_13e0[4] = local_13e0[4] - dVar20;
        local_13e0[7] = dVar20 + local_13e0[7];
        dVar20 = dVar27 * local_1948[1] - dVar16;
        local_13e0[0x2e] = local_13e0[0x2e] - dVar20;
        local_13e0[0x30] = local_13e0[0x30] - dVar20;
        local_13e0[0x33] = dVar20 + local_13e0[0x33];
        local_13e0[0x5a] = local_13e0[0x5a] + dVar16;
        local_13e0[0x5c] = local_13e0[0x5c] + dVar16;
        local_13e0[0x5f] = local_13e0[0x5f] - dVar16;
        local_13e0[0x70] = local_13e0[0x70] + dVar23;
        local_1050._0_8_ = (double)local_1050._0_8_ + dVar23;
        dStack_1038 = dStack_1038 - dVar23;
        dVar20 = dVar16 * -0.25;
        local_cf0 = local_cf0 - dVar20;
        local_ce0 = local_ce0 - dVar20;
        local_cc8 = dVar20 + local_cc8;
        dVar20 = dVar16 * 0.5;
        local_c40 = local_c40 - dVar20;
        local_c30 = local_c30 - dVar20;
        local_c18 = local_c18 + dVar20;
        local_820 = local_820 - dVar20;
        local_810 = local_810 - dVar20;
        local_7f8 = dVar20 + local_7f8;
        local_770 = local_770 + dVar16;
        local_760 = local_760 + dVar16;
        local_748 = local_748 - dVar16;
        local_6c0 = local_6c0 + dVar16;
        local_6b0 = local_6b0 + dVar16;
        local_698 = local_698 - dVar16;
      }
      else {
        local_15e8[0] = dVar16;
        local_15e8[1] = local_1948[3] * dVar27 + dVar16;
        auStack_15d8._8_8_ = dVar27 * local_1948[1];
        auStack_15d8._0_8_ = dVar16;
        dStack_15c8 = dVar16;
        local_1598 = dVar16;
        local_15b8._8_8_ = dVar16;
        local_15b8._0_8_ = dVar16 - dVar23;
        local_15a8._8_8_ = dVar16;
        local_15a8._0_8_ = dVar16;
        dStack_1590 = dVar16 * 0.75;
        dStack_1588 = dVar16 * 1.5;
        auStack_1570._8_8_ = dVar16;
        auStack_1570._0_8_ = dVar16;
        local_1580._8_8_ = dVar16;
        local_1580._0_8_ = dVar16;
        dStack_1560 = dVar16;
        local_1558 = dVar16 * 1.5;
        pdVar6 = local_1488 + 1;
        lVar5 = 0;
        do {
          dVar16 = local_15e8[lVar5];
          *pdVar6 = *pdVar6 - dVar16;
          pdVar6[2] = pdVar6[2] - dVar16;
          pdVar6[5] = dVar16 + pdVar6[5];
          lVar5 = lVar5 + 1;
          pdVar6 = pdVar6 + 0x16;
        } while (lVar5 != 0x15);
      }
      uVar12 = local_14a8._12_4_;
      local_14a8._8_4_ = local_14a8._8_4_;
      local_14a8._0_8_ = local_14a8._0_8_ + (double)local_16f8._0_8_;
      local_14a8._12_4_ = uVar12;
      local_16f8._8_8_ = uVar3;
      local_16f8._0_8_ = dVar18 * -0.0;
      local_618[1] = local_618[1] - dVar17;
      local_618[3] = local_618[3] - dVar17;
      local_618[6] = dVar17 + local_618[6];
      dVar16 = local_1948[3] * local_1948[3] * local_1948[1];
      local_17c8._0_8_ = (double)local_1748._0_8_ * -1.72 + (double)local_1788._0_8_;
      local_17c8._8_8_ = local_1748._8_8_;
      dVar17 = exp((double)local_17c8._0_8_);
      local_1508._0_8_ = dVar17 * 300000000.0;
      local_17b8._8_8_ = 0;
      local_17b8._0_8_ = dVar28 * -1.72 + (double)local_17a8._0_8_;
      local_1790 = local_1948[3] * local_1948[6];
      dVar17 = exp((double)local_1538._0_8_);
      dVar17 = (double)local_1508._0_8_ / (dVar17 * dVar15);
      dVar18 = (double)local_1508._0_8_ * dVar16 - local_1790 * dVar17;
      dVar16 = (double)local_17b8._0_8_ * (double)local_1508._0_8_ * dVar16 -
               ((double)local_17b8._0_8_ -
               (((dStack_16d0 + local_16b8) - (dStack_16d0 + dStack_16d0 + dStack_16e0)) + 1.0) *
               dVar28) * dVar17 * local_1790;
      local_1888[1] = local_1888[1] - dVar18;
      local_1888[3] = local_1888[3] - dVar18;
      local_1888[6] = dVar18 + local_1888[6];
      dVar18 = local_1948[3] * local_1948[3] * (double)local_1508._0_8_;
      local_13e0[2] = local_13e0[2] - dVar18;
      local_13e0[4] = local_13e0[4] - dVar18;
      local_13e0[7] = dVar18 + local_13e0[7];
      dVar18 = ((double)local_1508._0_8_ * local_1948[1] + (double)local_1508._0_8_ * local_1948[1])
               * local_1948[3] - dVar17 * local_1948[6];
      local_13e0[0x2e] = local_13e0[0x2e] - dVar18;
      local_13e0[0x30] = local_13e0[0x30] - dVar18;
      local_13e0[0x33] = dVar18 + local_13e0[0x33];
      dVar17 = -dVar17 * local_1948[3];
      local_13e0[0x70] = local_13e0[0x70] - dVar17;
      dStack_1038 = dVar17 + dStack_1038;
      local_618[1] = local_618[1] - dVar16;
      local_618[3] = local_618[3] - dVar16;
      local_618[6] = dVar16 + local_618[6];
      dVar18 = local_1948[3] * local_1948[1] * local_1948[5];
      local_1050._0_8_ = (double)local_1050._0_8_ - dVar17;
      local_1600 = exp((double)local_1748._0_8_ * -0.76 + (double)local_1788._0_8_);
      local_1600 = local_1600 * 9380000.0;
      local_1508._8_8_ = 0;
      local_1508._0_8_ = dVar28 * -0.76 + (double)local_17a8._0_8_;
      local_1790 = local_1948[5] * local_1948[6];
      dVar16 = exp((double)local_1538._0_8_);
      dVar17 = local_1600 / (dVar16 * dVar15);
      dVar16 = local_1600 * dVar18 - local_1790 * dVar17;
      dVar20 = (double)local_1508._0_8_ * local_1600 * dVar18 -
               ((double)local_1508._0_8_ -
               (((dStack_16c0 + local_16b8) - (dStack_16e0 + dStack_16d0 + dStack_16c0)) + 1.0) *
               dVar28) * dVar17 * local_1790;
      local_1888[1] = local_1888[1] - dVar16;
      local_1888[3] = local_1888[3] - dVar16;
      dVar18 = local_1600 * local_1948[3] * local_1948[5];
      local_13e0[2] = local_13e0[2] - dVar18;
      local_1888[6] = dVar16 + local_1888[6];
      local_13e0[4] = local_13e0[4] - dVar18;
      local_13e0[7] = dVar18 + local_13e0[7];
      dVar16 = -dVar17 * local_1948[5];
      dVar18 = local_1948[5] * local_1600 * local_1948[1];
      local_13e0[0x2e] = local_13e0[0x2e] - dVar18;
      local_13e0[0x30] = local_13e0[0x30] - dVar18;
      local_13e0[0x33] = dVar18 + local_13e0[0x33];
      dVar17 = local_1600 * local_1948[1] * local_1948[3] - dVar17 * local_1948[6];
      local_13e0[0x5a] = local_13e0[0x5a] - dVar17;
      local_13e0[0x5c] = local_13e0[0x5c] - dVar17;
      local_13e0[0x5f] = dVar17 + local_13e0[0x5f];
      local_13e0[0x70] = local_13e0[0x70] - dVar16;
      local_1050._0_8_ = (double)local_1050._0_8_ - dVar16;
      dStack_1038 = dVar16 + dStack_1038;
      local_618[1] = local_618[1] - dVar20;
      local_618[3] = local_618[3] - dVar20;
      local_618[6] = dVar20 + local_618[6];
      dVar18 = local_1948[3] * local_1948[1] * local_1948[0x13];
      local_1790 = exp((double)local_17c8._0_8_);
      local_1790 = local_1790 * 375000000.0;
      local_17c8._0_8_ = local_1948[6] * local_1948[0x13];
      dVar16 = exp((double)local_1538._0_8_);
      dVar17 = local_1790 / (dVar16 * dVar15);
      dVar16 = local_1790 * dVar18 - (double)local_17c8._0_8_ * dVar17;
      dVar20 = (double)local_17b8._0_8_ * local_1790 * dVar18 -
               ((double)local_17b8._0_8_ -
               (((dStack_1650 + local_16b8) - (dStack_16e0 + dStack_16d0 + dStack_1650)) + 1.0) *
               dVar28) * dVar17 * (double)local_17c8._0_8_;
      local_1888[1] = local_1888[1] - dVar16;
      local_1888[3] = local_1888[3] - dVar16;
      dVar18 = local_1790 * local_1948[3] * local_1948[0x13];
      local_13e0[2] = local_13e0[2] - dVar18;
      local_1888[6] = dVar16 + local_1888[6];
      local_13e0[4] = local_13e0[4] - dVar18;
      local_13e0[7] = dVar18 + local_13e0[7];
      dVar16 = -dVar17 * local_1948[0x13];
      dVar18 = local_1948[0x13] * local_1790 * local_1948[1];
      local_13e0[0x2e] = local_13e0[0x2e] - dVar18;
      local_13e0[0x30] = local_13e0[0x30] - dVar18;
      local_13e0[0x33] = dVar18 + local_13e0[0x33];
      local_13e0[0x70] = local_13e0[0x70] - dVar16;
      local_1050._0_8_ = (double)local_1050._0_8_ - dVar16;
      dStack_1038 = dVar16 + dStack_1038;
      dVar16 = local_1790 * local_1948[1] * local_1948[3] - dVar17 * local_1948[6];
      local_770 = local_770 - dVar16;
      local_760 = local_760 - dVar16;
      local_748 = dVar16 + local_748;
      local_618[1] = local_618[1] - dVar20;
      local_618[3] = local_618[3] - dVar20;
      local_618[6] = dVar20 + local_618[6];
      local_17b8._0_8_ = local_1948[3] * local_1948[1] * local_1948[0x14];
      local_17c8._0_8_ = exp((double)local_14d8._0_8_);
      local_17c8._0_8_ = (double)local_17c8._0_8_ * 700000.0;
      local_14d8._0_8_ = local_1948[6] * local_1948[0x14];
      dVar16 = exp((double)local_1538._0_8_);
      dVar17 = local_1948[0x12];
      dVar18 = (double)local_17c8._0_8_ / (dVar16 * dVar15);
      dVar16 = (double)local_17c8._0_8_ * (double)local_17b8._0_8_ -
               (double)local_14d8._0_8_ * dVar18;
      dVar23 = (double)local_14c8._0_8_ * (double)local_17c8._0_8_ * (double)local_17b8._0_8_ -
               ((double)local_14c8._0_8_ -
               (((local_1648 + local_16b8) - (dStack_16e0 + dStack_16d0 + local_1648)) + 1.0) *
               dVar28) * dVar18 * (double)local_14d8._0_8_;
      local_1888[1] = local_1888[1] - dVar16;
      local_1888[3] = local_1888[3] - dVar16;
      dVar20 = (double)local_17c8._0_8_ * local_1948[3] * local_1948[0x14];
      local_13e0[2] = local_13e0[2] - dVar20;
      local_13e0[4] = local_13e0[4] - dVar20;
      local_13e0[7] = dVar20 + local_13e0[7];
      local_17b8._0_8_ = local_1948[1];
      local_14d8._8_8_ = 0;
      local_14d8._0_8_ = local_1948[0x14];
      dVar20 = local_1948[0x14] * (double)local_17c8._0_8_ * local_1948[1];
      local_13e0[0x2e] = local_13e0[0x2e] - dVar20;
      local_13e0[0x30] = local_13e0[0x30] - dVar20;
      local_1888[6] = dVar16 + local_1888[6];
      local_13e0[0x33] = dVar20 + local_13e0[0x33];
      dVar16 = -dVar18 * local_1948[0x14];
      local_13e0[0x70] = local_13e0[0x70] - dVar16;
      local_1050._0_8_ = (double)local_1050._0_8_ - dVar16;
      dStack_1038 = dVar16 + dStack_1038;
      dVar16 = (double)local_17c8._0_8_ * local_1948[1] * local_1948[3] - dVar18 * local_1948[6];
      local_6c0 = local_6c0 - dVar16;
      local_6b0 = local_6b0 - dVar16;
      local_698 = dVar16 + local_698;
      local_618[1] = local_618[1] - dVar23;
      local_618[3] = local_618[3] - dVar23;
      local_618[6] = dVar23 + local_618[6];
      local_17c8._0_8_ =
           (((dVar25 - local_1948[0]) - local_1948[5]) + local_1948[10]) - local_1948[0xc];
      dVar14 = exp(dVar14);
      local_14c8._0_8_ = local_1948[0];
      dVar16 = (local_1758 + local_1758) - (double)local_1728._0_8_;
      local_1538._8_4_ = (int)uStack_1750;
      local_1538._0_8_ = dVar16;
      local_1538._12_4_ = (int)(uStack_1750 >> 0x20);
      dVar16 = exp(dVar16);
      uVar3 = uStack_550;
      dVar18 = local_558;
      dVar23 = (double)local_14d8._0_8_ * -0.37 + dVar17 + dVar17 + (double)local_17c8._0_8_;
      dVar14 = dVar14 * 1000000.0;
      dVar17 = dVar14 / (dVar16 * dVar15);
      dVar16 = dVar14 * (double)local_17b8._0_8_ * (double)local_17b8._0_8_ -
               (double)local_14c8._0_8_ * dVar17;
      dVar20 = dVar23 * dVar16;
      dVar21 = (dVar21 * dVar14 * (double)local_17b8._0_8_ * (double)local_17b8._0_8_ -
               (dVar21 - ((local_16e8 - (dStack_16e0 + dStack_16e0)) + 1.0) * dVar28) * dVar17 *
               (double)local_14c8._0_8_) * dVar23;
      local_1888[0] = local_1888[0] + dVar20;
      local_1888[1] = local_1888[1] - (dVar20 + dVar20);
      dVar14 = dVar14 * dVar23;
      if (iVar1 == 2) {
        dVar17 = -dVar23 * dVar17 - dVar16;
        local_1488[0] = local_1488[0] + dVar17;
        local_1488[1] = local_1488[1] - (dVar17 + dVar17);
        dVar14 = (dVar14 + dVar14) * local_1948[1];
        local_13e0[1] = local_13e0[1] + dVar14;
        local_13e0[2] = local_13e0[2] - (dVar14 + dVar14);
        local_13e0[0x59] = local_13e0[0x59] - dVar16;
        dVar14 = dVar16 + dVar16;
        local_13e0[0x5a] = local_13e0[0x5a] + dVar14;
        local_da8 = local_da8 + dVar16;
        local_da0 = local_da0 - dVar14;
        local_c48 = local_c48 - dVar16;
        local_c40 = local_c40 + dVar14;
        local_828 = local_828 + dVar14;
        local_820 = local_820 - (dVar14 + dVar14);
        dVar16 = dVar16 * -0.37;
        local_6c8 = local_6c8 + dVar16;
        local_6c0 = local_6c0 - (dVar16 + dVar16);
      }
      else {
        local_15e8[0] = -dVar23 * dVar17;
        local_15e8[1] = (dVar14 + dVar14) * local_1948[1] + dVar16;
        auStack_15d8._8_8_ = dVar16;
        auStack_15d8._0_8_ = dVar16;
        dStack_15c8 = dVar16;
        local_15a8._8_8_ = dVar16;
        local_15a8._0_8_ = dVar16;
        local_15b8._8_8_ = dVar16;
        local_15b8._0_8_ = dVar16;
        local_1598 = dVar16 + dVar16;
        dStack_1590 = dVar16;
        auStack_1570._8_8_ = dVar16;
        auStack_1570._0_8_ = dVar16;
        local_1580._8_8_ = dVar16;
        local_1580._0_8_ = dVar16;
        dStack_1560 = dVar16;
        local_1558 = dVar16 * 3.0;
        local_1550 = dVar16;
        local_1548 = dVar16 * 0.63;
        pdVar6 = local_1488 + 1;
        lVar5 = 0;
        do {
          dVar14 = local_15e8[lVar5];
          pdVar6[-1] = pdVar6[-1] + dVar14;
          *pdVar6 = *pdVar6 - (dVar14 + dVar14);
          lVar5 = lVar5 + 1;
          pdVar6 = pdVar6 + 0x16;
        } while (lVar5 != 0x15);
      }
      uVar12 = local_16f8._12_4_;
      local_16f8._8_4_ = local_16f8._8_4_;
      local_16f8._0_8_ = local_16f8._0_8_ + (double)local_14a8._0_8_;
      local_16f8._12_4_ = uVar12;
      local_14a8._8_8_ = uVar3;
      local_14a8._0_8_ = dVar18 * -0.0;
      local_618[0] = local_618[0] + dVar21;
      local_618[1] = local_618[1] - (dVar21 + dVar21);
      local_17b8._0_8_ = local_1948[1] * local_1948[1] * local_1948[0];
      dVar14 = exp((double)local_1748._0_8_ * -0.6 + (double)local_1788._0_8_);
      dVar14 = dVar14 * 90000.0;
      local_14d8._8_8_ = 0;
      local_14d8._0_8_ = dVar28 * -0.6 + (double)local_17a8._0_8_;
      local_14c8._0_8_ = local_1948[0] * local_1948[0];
      dVar16 = exp((double)local_1538._0_8_);
      dVar16 = dVar14 / (dVar16 * dVar15);
      dVar17 = dVar14 * (double)local_17b8._0_8_ - (double)local_14c8._0_8_ * dVar16;
      dVar18 = (double)local_14d8._0_8_ * dVar14 * (double)local_17b8._0_8_ -
               ((double)local_14d8._0_8_ -
               (((local_16e8 + local_16e8) - (dStack_16e0 + dStack_16e0 + local_16e8)) + 1.0) *
               dVar28) * dVar16 * (double)local_14c8._0_8_;
      local_1888[0] = local_1888[0] + dVar17;
      local_1888[1] = local_1888[1] - (dVar17 + dVar17);
      dVar17 = (dVar14 * local_1948[0] + dVar14 * local_1948[0]) * local_1948[1];
      dVar14 = dVar14 * local_1948[1] * local_1948[1] + dVar16 * -2.0 * local_1948[0];
      local_1488[0] = local_1488[0] + dVar14;
      local_1488[1] = local_1488[1] - (dVar14 + dVar14);
      local_13e0[1] = local_13e0[1] + dVar17;
      local_13e0[2] = local_13e0[2] - (dVar17 + dVar17);
      local_618[0] = local_618[0] + dVar18;
      local_618[1] = local_618[1] - (dVar18 + dVar18);
      local_17b8._0_8_ = local_1948[1] * local_1948[1] * local_1948[5];
      dVar14 = exp((double)local_1748._0_8_ * -1.25 + (double)local_1788._0_8_);
      dVar14 = dVar14 * 60000000.0;
      local_14c8._8_8_ = 0;
      local_14c8._0_8_ = dVar28 * -1.25 + (double)local_17a8._0_8_;
      local_14d8._0_8_ = local_1948[0] * local_1948[5];
      dVar16 = exp((double)local_1538._0_8_);
      dVar17 = dVar14 / (dVar16 * dVar15);
      dVar16 = dVar14 * (double)local_17b8._0_8_ - (double)local_14d8._0_8_ * dVar17;
      dVar18 = (double)local_14c8._0_8_ * dVar14 * (double)local_17b8._0_8_ -
               ((double)local_14c8._0_8_ -
               (((dStack_16c0 + local_16e8) - (dStack_16e0 + dStack_16e0 + dStack_16c0)) + 1.0) *
               dVar28) * dVar17 * (double)local_14d8._0_8_;
      local_1888[0] = local_1888[0] + dVar16;
      local_1888[1] = local_1888[1] - (dVar16 + dVar16);
      dVar16 = -dVar17 * local_1948[5];
      local_1488[0] = local_1488[0] + dVar16;
      local_1488[1] = local_1488[1] - (dVar16 + dVar16);
      dVar16 = (dVar14 + dVar14) * local_1948[1] * local_1948[5];
      local_13e0[1] = local_13e0[1] + dVar16;
      local_13e0[2] = local_13e0[2] - (dVar16 + dVar16);
      dVar14 = dVar14 * local_1948[1] * local_1948[1] - dVar17 * local_1948[0];
      local_13e0[0x59] = local_13e0[0x59] + dVar14;
      local_13e0[0x5a] = local_13e0[0x5a] - (dVar14 + dVar14);
      local_618[0] = local_618[0] + dVar18;
      local_618[1] = local_618[1] - (dVar18 + dVar18);
      dVar20 = local_1948[1] * local_1948[1] * local_1948[0xc];
      local_17b8._0_8_ = (double)local_1748._0_8_ + (double)local_1748._0_8_;
      local_17b8._8_8_ = local_1748._8_8_;
      dVar14 = local_1788._0_8_ - (double)local_17b8._0_8_;
      dVar16 = exp(dVar14);
      dVar16 = dVar16 * 550000000.0;
      local_14d8._8_8_ = 0;
      local_14d8._0_8_ = dVar28 + dVar28;
      local_14c8._0_8_ = (double)local_17a8._0_8_ - (dVar28 + dVar28);
      local_14c8._8_8_ = local_17a8._8_8_;
      local_17c8._0_8_ = local_1948[0] * local_1948[0xc];
      dVar17 = exp((double)local_1538._0_8_);
      dVar18 = dVar16 / (dVar17 * dVar15);
      dVar21 = dVar16 * dVar20 - (double)local_17c8._0_8_ * dVar18;
      dVar17 = (double)local_14c8._0_8_ * dVar16 * dVar20 -
               ((double)local_14c8._0_8_ -
               (((local_1688 + local_16e8) - (dStack_16e0 + dStack_16e0 + local_1688)) + 1.0) *
               dVar28) * dVar18 * (double)local_17c8._0_8_;
      local_1888[0] = local_1888[0] + dVar21;
      local_1888[1] = local_1888[1] - (dVar21 + dVar21);
      dVar20 = -dVar18 * local_1948[0xc];
      local_1488[0] = local_1488[0] + dVar20;
      local_1488[1] = local_1488[1] - (dVar20 + dVar20);
      dVar20 = (dVar16 + dVar16) * local_1948[1] * local_1948[0xc];
      local_13e0[1] = local_13e0[1] + dVar20;
      local_13e0[2] = local_13e0[2] - (dVar20 + dVar20);
      dVar16 = local_1948[1] * local_1948[1] * dVar16 - dVar18 * local_1948[0];
      local_c48 = local_c48 + dVar16;
      local_c40 = local_c40 - (dVar16 + dVar16);
      local_618[0] = local_618[0] + dVar17;
      local_618[1] = local_618[1] - (dVar17 + dVar17);
      dVar17 = local_1948[5] * 2.65 + local_1948[0] * -0.27 + dVar25 + local_1948[10];
      local_1790 = local_1948[0x12];
      local_17c8._0_8_ = local_1948[0x14];
      dVar18 = local_1948[1] * local_1948[4];
      dVar14 = exp(dVar14);
      dVar16 = local_1948[5];
      local_1508._8_4_ = extraout_XMM0_Dc_05;
      local_1508._0_8_ = dVar14;
      local_1508._12_4_ = extraout_XMM0_Dd_05;
      local_1538._8_8_ = local_1718._8_8_;
      local_1538._0_8_ = local_1718._8_8_;
      dVar14 = exp(((double)local_1898._0_8_ + local_1758) - (double)local_1718._8_8_);
      dVar21 = (double)local_17c8._0_8_ * -0.62 + local_1790 + local_1790 + dVar17;
      dVar20 = (double)local_1508._0_8_ * 22000000000.0;
      dVar15 = dVar20 / (dVar14 * dVar15);
      dVar14 = dVar20 * dVar18 - dVar16 * dVar15;
      dVar17 = dVar21 * dVar14;
      dVar16 = ((double)local_14c8._0_8_ * dVar20 * dVar18 -
               ((double)local_14c8._0_8_ -
               ((dStack_16c0 - (dStack_16e0 + local_16c8)) + 1.0) * dVar28) * dVar15 * dVar16) *
               dVar21;
      local_1888[1] = local_1888[1] - dVar17;
      local_1888[4] = local_1888[4] - dVar17;
      local_1888[5] = dVar17 + local_1888[5];
      dVar20 = dVar20 * dVar21;
      if (iVar1 == 2) {
        dVar17 = dVar14 * -0.27;
        local_1488[1] = local_1488[1] - dVar17;
        local_1468 = local_1468 - dVar17;
        local_1460 = dVar17 + local_1460;
        dVar17 = local_1948[4] * dVar20;
        local_13e0[2] = local_13e0[2] - dVar17;
        local_13e0[5] = local_13e0[5] - dVar17;
        local_13e0[6] = dVar17 + local_13e0[6];
        dVar20 = dVar20 * local_1948[1];
        local_13e0[0x44] = local_13e0[0x44] - dVar20;
        local_13e0[0x47] = local_13e0[0x47] - dVar20;
        local_13e0[0x48] = dVar20 + local_13e0[0x48];
        dVar15 = dVar14 * 2.65 - dVar15 * dVar21;
        local_13e0[0x5a] = local_13e0[0x5a] - dVar15;
        local_13e0[0x5d] = local_13e0[0x5d] - dVar15;
        local_13e0[0x5e] = dVar15 + local_13e0[0x5e];
        local_da0 = local_da0 - dVar14;
        local_d88 = local_d88 - dVar14;
        local_d80 = local_d80 + dVar14;
        dVar15 = dVar14 + dVar14;
        local_820 = local_820 - dVar15;
        local_808 = local_808 - dVar15;
        local_800 = dVar15 + local_800;
        dVar14 = dVar14 * -0.62;
        local_6c0 = local_6c0 - dVar14;
        local_6a8 = local_6a8 - dVar14;
        local_6a0 = dVar14 + local_6a0;
      }
      else {
        local_15e8[0] = dVar14 * 0.73;
        local_15e8[1] = dVar20 * local_1948[4] + dVar14;
        auStack_15d8._8_8_ = dVar14;
        auStack_15d8._0_8_ = dVar14;
        dStack_15c8 = dVar14 + local_1948[1] * dVar20;
        dStack_15c0 = -(dVar15 * dVar21) + dVar14 * 3.65;
        local_15a8._8_8_ = dVar14;
        local_15a8._0_8_ = dVar14;
        local_15b8._8_8_ = dVar14;
        local_15b8._0_8_ = dVar14;
        local_1598 = dVar14 + dVar14;
        local_1580._8_8_ = dVar14;
        local_1580._0_8_ = dVar14;
        dStack_1590 = dVar14;
        dStack_1588 = dVar14;
        auStack_1570._8_8_ = dVar14;
        auStack_1570._0_8_ = dVar14;
        dStack_1560 = dVar14;
        local_1558 = dVar14 * 3.0;
        local_1550 = dVar14;
        local_1548 = dVar14 * 0.38;
        pdVar6 = &local_1460;
        lVar5 = 0;
        do {
          dVar14 = local_15e8[lVar5];
          pdVar6[-4] = pdVar6[-4] - dVar14;
          pdVar6[-1] = pdVar6[-1] - dVar14;
          *pdVar6 = dVar14 + *pdVar6;
          lVar5 = lVar5 + 1;
          pdVar6 = pdVar6 + 0x16;
        } while (lVar5 != 0x15);
      }
      local_618[1] = local_618[1] - dVar16;
      local_618[4] = local_618[4] - dVar16;
      local_618[5] = dVar16 + local_618[5];
      uVar12 = local_14a8._12_4_;
      local_14a8._8_4_ = local_14a8._8_4_;
      local_14a8._0_8_ = local_14a8._0_8_ + (double)local_16f8._0_8_;
      local_14a8._12_4_ = uVar12;
      dVar14 = local_1948[5] * local_1948[0xd];
      dVar15 = dVar28 * -8554.68331868024 - (double)local_1748._0_8_;
      local_16f8._8_8_ = 0;
      local_16f8._0_8_ = dVar15;
      dVar15 = exp(dVar15);
      dVar15 = dVar15 * 2244000000000.0;
      dVar16 = local_1778 * 8554.68331868024 - dVar28;
      local_17c8._0_8_ = local_1948[1] * local_1948[5] * local_1948[0xb];
      local_14c8._8_8_ = uStack_1750 ^ 0x8000000000000000;
      local_14c8._0_8_ = -local_1758;
      dVar17 = (-local_1758 - local_14e8) + local_1518;
      dVar18 = exp(dVar17);
      dVar21 = local_1948[0x12];
      dVar20 = local_1948[0xd];
      dVar23 = dVar15 / (dVar18 * local_1490);
      dVar18 = dVar15 * dVar14 - (double)local_17c8._0_8_ * dVar23;
      dVar14 = dVar16 * dVar15 * dVar14 -
               (dVar16 - (((dStack_16c0 + dStack_16e0 + dStack_1690) - (dStack_1680 + dStack_16c0))
                         + -1.0) * dVar28) * dVar23 * (double)local_17c8._0_8_;
      local_1888[1] = local_1888[1] + dVar18;
      local_1888[0xb] = local_1888[0xb] + dVar18;
      local_1888[0xd] = local_1888[0xd] - dVar18;
      dVar24 = local_1948[1] * -dVar23;
      dVar18 = -dVar23 * local_1948[5] * local_1948[0xb];
      local_13e0[2] = local_13e0[2] + dVar18;
      local_13e0[0xc] = local_13e0[0xc] + dVar18;
      local_13e0[0xe] = local_13e0[0xe] - dVar18;
      dVar18 = dVar15 * local_1948[0xd] + local_1948[0xb] * dVar24;
      local_13e0[0x5a] = local_13e0[0x5a] + dVar18;
      local_13e0[100] = local_13e0[100] + dVar18;
      local_13e0[0x66] = local_13e0[0x66] - dVar18;
      dVar24 = dVar24 * local_1948[5];
      local_cf0 = local_cf0 + dVar24;
      dStack_ca0 = dStack_ca0 + dVar24;
      local_c90 = local_c90 - dVar24;
      dVar15 = dVar15 * local_1948[5];
      local_b90 = local_b90 + dVar15;
      dStack_b40 = dStack_b40 + dVar15;
      local_b30 = local_b30 - dVar15;
      local_618[1] = local_618[1] + dVar14;
      local_5c8._8_8_ = (double)local_5c8._8_8_ + dVar14;
      local_5b0 = local_5b0 - dVar14;
      local_17c8._0_8_ =
           local_1948[0xb] * 0.5 + ((dVar25 + local_1948[0]) - local_1948[5]) + local_1948[10] +
           local_1948[0xc];
      dVar14 = exp((double)local_16f8._0_8_);
      dVar25 = local_1948[1] * local_1948[0xb];
      local_16f8._0_8_ = dVar14;
      dVar14 = exp(dVar17);
      dVar21 = dVar21 + dVar21 + (double)local_17c8._0_8_;
      dVar18 = (double)local_16f8._0_8_ * 187000000000.0;
      dVar15 = dVar18 / (dVar14 * local_1490);
      dVar14 = dVar18 * dVar20 - dVar25 * dVar15;
      dVar17 = dVar21 * dVar14;
      dVar25 = (dVar16 * dVar18 * dVar20 -
               (dVar16 - (((dStack_16e0 + dStack_1690) - dStack_1680) + -1.0) * dVar28) * dVar15 *
               dVar25) * dVar21;
      local_1888[1] = local_1888[1] + dVar17;
      local_1888[0xb] = local_1888[0xb] + dVar17;
      local_1888[0xd] = local_1888[0xd] - dVar17;
      dVar18 = dVar18 * dVar21;
      dVar15 = dVar15 * dVar21;
      if (iVar1 == 2) {
        local_1488[1] = local_1488[1] + dVar14;
        local_1430 = local_1430 + dVar14;
        local_1420 = local_1420 - dVar14;
        dVar16 = -dVar15 * local_1948[0xb];
        local_13e0[2] = local_13e0[2] + dVar16;
        local_13e0[0xe] = local_13e0[0xe] - dVar16;
        local_13e0[0xc] = dVar16 + local_13e0[0xc];
        local_13e0[0x5a] = local_13e0[0x5a] - dVar14;
        local_13e0[100] = local_13e0[100] - dVar14;
        local_13e0[0x66] = local_13e0[0x66] + dVar14;
        local_da0 = local_da0 + dVar14;
        dStack_d50 = dStack_d50 + dVar14;
        local_d40 = local_d40 - dVar14;
        dVar15 = dVar14 * 0.5 - dVar15 * local_1948[1];
        local_cf0 = local_cf0 + dVar15;
        dStack_ca0 = dStack_ca0 + dVar15;
        local_c90 = local_c90 - dVar15;
        local_c40 = local_c40 + dVar14;
        local_bf0 = local_bf0 + dVar14;
        local_be0 = local_be0 - dVar14;
        local_b90 = local_b90 + dVar18;
        dStack_b40 = dStack_b40 + dVar18;
        local_b30 = local_b30 - dVar18;
        dVar14 = dVar14 + dVar14;
        local_820 = local_820 + dVar14;
        local_7d0 = local_7d0 + dVar14;
        local_7c0 = local_7c0 - dVar14;
      }
      else {
        local_15e8[0] = dVar14 + dVar14;
        local_15e8[1] = dVar14 - local_1948[0xb] * dVar15;
        auStack_15d8._8_8_ = dVar14;
        auStack_15d8._0_8_ = dVar14;
        dStack_15c8 = dVar14;
        local_15a8._8_8_ = dVar14;
        local_15a8._0_8_ = dVar14;
        local_15b8._8_8_ = dVar14;
        local_15b8._0_8_ = dVar14;
        local_1598 = local_15e8[0];
        dStack_1590 = dVar14 * 1.5 - dVar15 * local_1948[1];
        dStack_1588 = local_15e8[0];
        dStack_1560 = dVar14;
        local_1580._8_8_ = dVar14;
        local_1580._0_8_ = dVar18 + dVar14;
        auStack_1570._8_8_ = dVar14;
        auStack_1570._0_8_ = dVar14;
        local_1558 = dVar14 * 3.0;
        local_1550 = dVar14;
        local_1548 = dVar14;
        pdVar6 = &local_1420;
        lVar5 = 0;
        do {
          dVar14 = local_15e8[lVar5];
          pdVar6[-0xc] = pdVar6[-0xc] + dVar14;
          pdVar6[-2] = pdVar6[-2] + dVar14;
          *pdVar6 = *pdVar6 - dVar14;
          lVar5 = lVar5 + 1;
          pdVar6 = pdVar6 + 0x16;
        } while (lVar5 != 0x15);
      }
      local_618[1] = local_618[1] + dVar25;
      local_5b0 = local_5b0 - dVar25;
      dVar14 = local_1948[0] * local_1948[2];
      local_5c8._8_8_ = (double)local_5c8._8_8_ + dVar25;
      dVar25 = exp((double)local_1748._0_8_ * 2.67 + dVar28 * -3165.232827911689);
      dVar25 = dVar25 * 0.05;
      dVar17 = dVar28 * 2.67 + local_1778 * 3165.232827911689;
      dVar15 = local_1948[1] * local_1948[4];
      local_16f8._0_8_ = (double)local_1728._0_8_ - local_1758;
      dVar16 = exp(((double)local_17d8._0_8_ + ((double)local_1728._0_8_ - local_1758)) -
                   (double)local_1898._0_8_);
      dVar16 = dVar25 / dVar16;
      dVar18 = dVar25 * dVar14 - dVar15 * dVar16;
      dVar15 = dVar17 * dVar25 * dVar14 -
               (dVar17 - ((dStack_16e0 + local_16c8) - (local_16e8 + local_16d8)) * dVar28) * dVar16
               * dVar15;
      local_1888[0] = local_1888[0] - dVar18;
      local_1888[1] = local_1888[1] + dVar18;
      local_1888[2] = local_1888[2] - dVar18;
      local_1888[4] = dVar18 + local_1888[4];
      dVar14 = dVar25 * local_1948[2];
      local_1488[0] = local_1488[0] - dVar14;
      local_1488[1] = local_1488[1] + dVar14;
      local_1488[2] = local_1488[2] - dVar14;
      local_1468 = dVar14 + local_1468;
      dVar14 = local_1948[4] * -dVar16;
      local_13e0[1] = local_13e0[1] - dVar14;
      local_13e0[2] = local_13e0[2] + dVar14;
      local_13e0[3] = local_13e0[3] - dVar14;
      local_13e0[5] = dVar14 + local_13e0[5];
      dVar25 = dVar25 * local_1948[0];
      local_13e0[0x17] = local_13e0[0x17] - dVar25;
      local_13e0[0x18] = local_13e0[0x18] + dVar25;
      local_13e0[0x19] = local_13e0[0x19] - dVar25;
      local_13e0[0x1b] = dVar25 + local_13e0[0x1b];
      dVar14 = -dVar16 * local_1948[1];
      local_13e0[0x43] = local_13e0[0x43] - dVar14;
      local_13e0[0x44] = local_13e0[0x44] + dVar14;
      local_13e0[0x45] = local_13e0[0x45] - dVar14;
      local_13e0[0x47] = dVar14 + local_13e0[0x47];
      local_618[0] = local_618[0] - dVar15;
      local_618[1] = local_618[1] + dVar15;
      local_618[2] = local_618[2] - dVar15;
      local_618[4] = dVar15 + local_618[4];
      dVar17 = local_1948[2] * local_1948[6];
      uVar12 = local_1788._12_4_;
      dVar14 = local_1788._0_8_ + local_1738;
      local_1788._8_4_ = local_1788._8_4_;
      local_1788._0_8_ = dVar14;
      local_1788._12_4_ = uVar12;
      dVar14 = exp(dVar14);
      dVar14 = dVar14 * 20000000.0;
      uVar12 = local_17a8._12_4_;
      local_17a8._8_4_ = local_17a8._8_4_;
      local_17a8._0_8_ = local_17a8._0_8_ + (double)local_1768._0_8_;
      local_17a8._12_4_ = uVar12;
      dVar25 = local_1948[3] * local_1948[4];
      dVar15 = exp((((double)local_17d8._0_8_ - (double)local_1628._0_8_) - (double)local_1898._0_8_
                   ) + (double)local_1718._0_8_);
      dVar15 = dVar14 / dVar15;
      dVar16 = dVar14 * dVar17 - dVar25 * dVar15;
      dVar25 = (double)local_17a8._0_8_ * dVar14 * dVar17 -
               ((double)local_17a8._0_8_ -
               ((local_16c8 + dStack_16d0) - (local_16b8 + local_16d8)) * dVar28) * dVar15 * dVar25;
      local_1888[2] = local_1888[2] - dVar16;
      local_1888[3] = dVar16 + local_1888[3];
      local_1888[4] = dVar16 + local_1888[4];
      local_1888[6] = local_1888[6] - dVar16;
      dVar16 = local_1948[6] * dVar14;
      local_13e0[0x19] = local_13e0[0x19] - dVar16;
      local_13e0[0x1a] = dVar16 + local_13e0[0x1a];
      local_13e0[0x1b] = dVar16 + local_13e0[0x1b];
      local_13e0[0x1d] = local_13e0[0x1d] - dVar16;
      dVar16 = local_1948[4] * -dVar15;
      local_13e0[0x2f] = local_13e0[0x2f] - dVar16;
      local_13e0[0x30] = dVar16 + local_13e0[0x30];
      local_13e0[0x31] = dVar16 + local_13e0[0x31];
      local_13e0[0x33] = local_13e0[0x33] - dVar16;
      dVar15 = -dVar15 * local_1948[3];
      local_13e0[0x45] = local_13e0[0x45] - dVar15;
      local_13e0[0x46] = dVar15 + local_13e0[0x46];
      local_13e0[0x47] = dVar15 + local_13e0[0x47];
      local_13e0[0x49] = local_13e0[0x49] - dVar15;
      dVar14 = dVar14 * local_1948[2];
      local_13e0[0x71] = local_13e0[0x71] - dVar14;
      local_1050._0_8_ = dVar14 + (double)local_1050._0_8_;
      local_1050._8_8_ = dVar14 + (double)local_1050._8_8_;
      dStack_1038 = dStack_1038 - dVar14;
      local_618[2] = local_618[2] - dVar25;
      local_618[3] = dVar25 + local_618[3];
      local_618[4] = dVar25 + local_618[4];
      local_618[6] = local_618[6] - dVar25;
      dVar18 = local_1948[2] * local_1948[7];
      dVar14 = exp((double)local_1788._0_8_);
      dVar14 = dVar14 * 80000000.0;
      dVar25 = local_1948[1] * local_1948[0xd];
      dVar17 = (double)local_17d8._0_8_ - local_1758;
      dVar15 = exp(((double)local_14b8._0_8_ + dVar17) - local_1518);
      dVar15 = dVar14 / dVar15;
      dVar16 = dVar14 * dVar18 - dVar25 * dVar15;
      local_1888[1] = local_1888[1] + dVar16;
      local_1888[2] = local_1888[2] - dVar16;
      local_1888[7] = local_1888[7] - dVar16;
      local_1888[0xd] = dVar16 + local_1888[0xd];
      dVar25 = (double)local_17a8._0_8_ * dVar14 * dVar18 -
               ((double)local_17a8._0_8_ -
               ((dStack_16e0 + dStack_1680) - (local_16d8 + dStack_16b0)) * dVar28) * dVar15 *
               dVar25;
      dVar16 = local_1948[0xd] * -dVar15;
      local_13e0[2] = local_13e0[2] + dVar16;
      local_13e0[3] = local_13e0[3] - dVar16;
      local_13e0[8] = local_13e0[8] - dVar16;
      local_13e0[0xe] = dVar16 + local_13e0[0xe];
      dVar16 = local_1948[7] * dVar14;
      local_13e0[0x18] = local_13e0[0x18] + dVar16;
      local_13e0[0x19] = local_13e0[0x19] - dVar16;
      local_13e0[0x1e] = local_13e0[0x1e] - dVar16;
      local_13e0[0x24] = dVar16 + local_13e0[0x24];
      dVar14 = dVar14 * local_1948[2];
      local_fb0 = local_fb0 + dVar14;
      local_fa8 = local_fa8 - dVar14;
      dStack_f80 = dStack_f80 - dVar14;
      local_f50 = dVar14 + local_f50;
      dVar14 = -dVar15 * local_1948[1];
      local_b90 = local_b90 + dVar14;
      local_b88 = local_b88 - dVar14;
      local_b60 = local_b60 - dVar14;
      local_b30 = dVar14 + local_b30;
      local_618[1] = local_618[1] + dVar25;
      local_618[2] = local_618[2] - dVar25;
      local_618[7] = local_618[7] - dVar25;
      local_5b0 = dVar25 + local_5b0;
      dVar18 = local_1948[2] * local_1948[8];
      dVar14 = exp((double)local_1788._0_8_);
      dVar25 = local_1948[1] * local_1948[0xd];
      dVar14 = dVar14 * 15000000.0;
      dVar15 = exp((local_1528 + dVar17) - local_1518);
      dVar15 = dVar14 / dVar15;
      dVar16 = dVar14 * dVar18 - dVar25 * dVar15;
      dVar25 = (double)local_17a8._0_8_ * dVar14 * dVar18 -
               ((double)local_17a8._0_8_ -
               ((dStack_16e0 + dStack_1680) - (local_16d8 + local_16a8)) * dVar28) * dVar15 * dVar25
      ;
      local_1888[1] = local_1888[1] + dVar16;
      local_1888[2] = local_1888[2] - dVar16;
      local_1888[8] = local_1888[8] - dVar16;
      local_1888[0xd] = dVar16 + local_1888[0xd];
      dVar16 = local_1948[0xd] * -dVar15;
      local_13e0[2] = local_13e0[2] + dVar16;
      local_13e0[3] = local_13e0[3] - dVar16;
      local_13e0[9] = local_13e0[9] - dVar16;
      local_13e0[0xe] = dVar16 + local_13e0[0xe];
      dVar16 = local_1948[8] * dVar14;
      local_13e0[0x18] = local_13e0[0x18] + dVar16;
      local_13e0[0x19] = local_13e0[0x19] - dVar16;
      local_13e0[0x1f] = local_13e0[0x1f] - dVar16;
      local_13e0[0x24] = dVar16 + local_13e0[0x24];
      dVar14 = dVar14 * local_1948[2];
      local_f00 = local_f00 + dVar14;
      local_ef8 = local_ef8 - dVar14;
      local_ec8 = local_ec8 - dVar14;
      local_ea0 = dVar14 + local_ea0;
      dVar14 = -dVar15 * local_1948[1];
      local_b90 = local_b90 + dVar14;
      local_b88 = local_b88 - dVar14;
      local_b58 = local_b58 - dVar14;
      local_b30 = dVar14 + local_b30;
      local_618[1] = local_618[1] + dVar25;
      local_618[2] = local_618[2] - dVar25;
      local_618[8] = local_618[8] - dVar25;
      local_5b0 = dVar25 + local_5b0;
      dVar14 = local_1948[2] * local_1948[9];
      dVar25 = exp((double)local_1788._0_8_);
      dVar16 = local_1948[1] * local_1948[0xe];
      dVar25 = dVar25 * 84300000.0;
      dVar15 = exp(((double)local_1638._0_8_ + dVar17) - local_1618);
      dVar15 = dVar25 / dVar15;
      dVar18 = dVar25 * dVar14 - dVar16 * dVar15;
      local_1888[1] = local_1888[1] + dVar18;
      local_1888[2] = local_1888[2] - dVar18;
      local_1888[9] = local_1888[9] - dVar18;
      local_1888[0xe] = dVar18 + local_1888[0xe];
      dVar14 = (double)local_17a8._0_8_ * dVar25 * dVar14 -
               ((double)local_17a8._0_8_ -
               ((dStack_16e0 + local_1678) - (local_16d8 + dStack_16a0)) * dVar28) * dVar15 * dVar16
      ;
      dVar16 = local_1948[0xe] * -dVar15;
      local_13e0[2] = local_13e0[2] + dVar16;
      local_13e0[3] = local_13e0[3] - dVar16;
      local_13e0[10] = local_13e0[10] - dVar16;
      local_13e0[0xf] = dVar16 + local_13e0[0xf];
      dVar16 = local_1948[9] * dVar25;
      local_13e0[0x18] = local_13e0[0x18] + dVar16;
      local_13e0[0x19] = local_13e0[0x19] - dVar16;
      local_13e0[0x20] = local_13e0[0x20] - dVar16;
      local_13e0[0x25] = dVar16 + local_13e0[0x25];
      dVar25 = dVar25 * local_1948[2];
      local_e50 = local_e50 + dVar25;
      local_e48 = local_e48 - dVar25;
      dStack_e10 = dStack_e10 - dVar25;
      local_de8 = dVar25 + local_de8;
      dVar25 = -dVar15 * local_1948[1];
      local_ae0 = local_ae0 + dVar25;
      local_ad8 = local_ad8 - dVar25;
      local_aa0 = local_aa0 - dVar25;
      local_a78 = dVar25 + local_a78;
      local_618[1] = local_618[1] + dVar14;
      local_618[2] = local_618[2] - dVar14;
      local_618[9] = local_618[9] - dVar14;
      local_5a8 = dVar14 + local_5a8;
      dVar18 = local_1948[2] * local_1948[10];
      dVar14 = exp(dVar19 + dVar28 * -4327.663325920592);
      dVar14 = dVar14 * 1020.0;
      local_1708 = local_1708 + local_1778 * 4327.663325920592;
      dVar25 = local_1948[4] * local_1948[9];
      dVar15 = (double)local_17d8._0_8_ - (double)local_1898._0_8_;
      dVar16 = exp((dVar15 - (double)local_1638._0_8_) + local_548);
      dVar16 = dVar14 / dVar16;
      dVar19 = dVar14 * dVar18 - dVar25 * dVar16;
      dVar18 = local_1708 * dVar14 * dVar18 -
               (local_1708 - ((local_16c8 + dStack_16a0) - (local_16d8 + local_1698)) * dVar28) *
               dVar16 * dVar25;
      local_1888[2] = local_1888[2] - dVar19;
      local_1888[4] = local_1888[4] + dVar19;
      local_1888[10] = local_1888[10] - dVar19;
      local_1888[9] = dVar19 + local_1888[9];
      dVar25 = local_1948[10] * dVar14;
      local_13e0[0x19] = local_13e0[0x19] - dVar25;
      local_13e0[0x1b] = local_13e0[0x1b] + dVar25;
      local_13e0[0x20] = local_13e0[0x20] + dVar25;
      local_13e0[0x21] = local_13e0[0x21] - dVar25;
      dVar25 = local_1948[9] * -dVar16;
      local_13e0[0x45] = local_13e0[0x45] - dVar25;
      local_13e0[0x47] = local_13e0[0x47] + dVar25;
      local_13e0[0x4c] = local_13e0[0x4c] + dVar25;
      local_13e0[0x4d] = local_13e0[0x4d] - dVar25;
      dVar25 = -dVar16 * local_1948[4];
      local_e48 = local_e48 - dVar25;
      local_e38 = local_e38 + dVar25;
      dStack_e10 = dStack_e10 + dVar25;
      local_e08 = local_e08 - dVar25;
      dVar14 = dVar14 * local_1948[2];
      dStack_d98 = dStack_d98 - dVar14;
      local_d88 = local_d88 + dVar14;
      local_d60 = local_d60 + dVar14;
      local_d58 = local_d58 - dVar14;
      local_618[2] = local_618[2] - dVar18;
      local_618[4] = local_618[4] + dVar18;
      local_618[9] = local_618[9] + dVar18;
      local_5c8._0_8_ = (double)local_5c8._0_8_ - dVar18;
      local_1708 = local_1948[2] * local_1948[0xd];
      dVar14 = exp((double)local_1788._0_8_);
      dVar25 = local_1948[4] * local_1948[0xb];
      dVar14 = dVar14 * 30000000.0;
      dVar16 = exp((dVar15 - local_14e8) + local_1518);
      dVar16 = dVar14 / dVar16;
      dVar19 = dVar14 * local_1708 - dVar25 * dVar16;
      dVar25 = (double)local_17a8._0_8_ * dVar14 * local_1708 -
               ((double)local_17a8._0_8_ -
               ((local_16c8 + dStack_1690) - (local_16d8 + dStack_1680)) * dVar28) * dVar16 * dVar25
      ;
      local_1888[2] = local_1888[2] - dVar19;
      local_1888[4] = local_1888[4] + dVar19;
      local_1888[0xd] = local_1888[0xd] - dVar19;
      local_1888[0xb] = dVar19 + local_1888[0xb];
      dVar19 = local_1948[0xd] * dVar14;
      local_13e0[0x19] = local_13e0[0x19] - dVar19;
      local_13e0[0x1b] = local_13e0[0x1b] + dVar19;
      local_13e0[0x22] = local_13e0[0x22] + dVar19;
      local_13e0[0x24] = local_13e0[0x24] - dVar19;
      dVar19 = local_1948[0xb] * -dVar16;
      local_13e0[0x45] = local_13e0[0x45] - dVar19;
      local_13e0[0x47] = local_13e0[0x47] + dVar19;
      local_13e0[0x4e] = local_13e0[0x4e] + dVar19;
      local_13e0[0x50] = local_13e0[0x50] - dVar19;
      dVar16 = -dVar16 * local_1948[4];
      dStack_ce8 = dStack_ce8 - dVar16;
      local_cd8 = local_cd8 + dVar16;
      dStack_ca0 = dStack_ca0 + dVar16;
      local_c90 = local_c90 - dVar16;
      dVar14 = dVar14 * local_1948[2];
      local_b88 = local_b88 - dVar14;
      local_b78 = local_b78 + dVar14;
      dStack_b40 = dStack_b40 + dVar14;
      local_b30 = local_b30 - dVar14;
      local_618[2] = local_618[2] - dVar25;
      local_618[4] = local_618[4] + dVar25;
      local_5c8._8_8_ = (double)local_5c8._8_8_ + dVar25;
      local_5b0 = local_5b0 - dVar25;
      local_1708 = local_1948[2] * local_1948[0xd];
      dVar14 = exp((double)local_1788._0_8_);
      dVar14 = dVar14 * 30000000.0;
      dVar25 = local_1948[1] * local_1948[0xc];
      dVar16 = exp((dVar17 - local_528) + local_1518);
      dVar16 = dVar14 / dVar16;
      dVar17 = dVar14 * local_1708 - dVar25 * dVar16;
      dVar25 = (double)local_17a8._0_8_ * dVar14 * local_1708 -
               ((double)local_17a8._0_8_ -
               ((dStack_16e0 + local_1688) - (local_16d8 + dStack_1680)) * dVar28) * dVar16 * dVar25
      ;
      local_1888[1] = local_1888[1] + dVar17;
      local_1888[2] = local_1888[2] - dVar17;
      local_1888[0xd] = local_1888[0xd] - dVar17;
      local_1888[0xc] = dVar17 + local_1888[0xc];
      dVar17 = local_1948[0xc] * -dVar16;
      local_13e0[2] = local_13e0[2] + dVar17;
      local_13e0[3] = local_13e0[3] - dVar17;
      local_13e0[0xd] = local_13e0[0xd] + dVar17;
      local_13e0[0xe] = local_13e0[0xe] - dVar17;
      dVar17 = local_1948[0xd] * dVar14;
      local_13e0[0x18] = local_13e0[0x18] + dVar17;
      local_13e0[0x19] = local_13e0[0x19] - dVar17;
      local_13e0[0x23] = local_13e0[0x23] + dVar17;
      local_13e0[0x24] = local_13e0[0x24] - dVar17;
      dVar16 = -dVar16 * local_1948[1];
      local_c40 = local_c40 + dVar16;
      dStack_c38 = dStack_c38 - dVar16;
      local_be8 = local_be8 + dVar16;
      local_be0 = local_be0 - dVar16;
      dVar14 = dVar14 * local_1948[2];
      local_b90 = local_b90 + dVar14;
      local_b88 = local_b88 - dVar14;
      local_b38 = local_b38 + dVar14;
      local_b30 = local_b30 - dVar14;
      local_618[1] = local_618[1] + dVar25;
      local_618[2] = local_618[2] - dVar25;
      local_5b8 = local_5b8 + dVar25;
      local_5b0 = local_5b0 - dVar25;
      dVar14 = local_1948[2] * local_1948[0xe];
      dVar25 = exp(dVar28 * -1781.3869969487089 + local_1738);
      dVar25 = dVar25 * 39000000.0;
      local_1708 = local_1948[4] * local_1948[0xd];
      dVar16 = local_1778 * 1781.3869969487089 + (double)local_1768._0_8_;
      dVar17 = exp((dVar15 - local_1518) + local_1618);
      dVar17 = dVar25 / dVar17;
      dVar19 = dVar25 * dVar14 - local_1708 * dVar17;
      dVar16 = dVar16 * dVar25 * dVar14 -
               (dVar16 - ((local_16c8 + dStack_1680) - (local_16d8 + local_1678)) * dVar28) * dVar17
               * local_1708;
      local_1888[2] = local_1888[2] - dVar19;
      local_1888[4] = local_1888[4] + dVar19;
      local_1888[0xe] = local_1888[0xe] - dVar19;
      local_1888[0xd] = dVar19 + local_1888[0xd];
      dVar14 = local_1948[0xe] * dVar25;
      local_13e0[0x19] = local_13e0[0x19] - dVar14;
      local_13e0[0x1b] = local_13e0[0x1b] + dVar14;
      local_13e0[0x24] = local_13e0[0x24] + dVar14;
      local_13e0[0x25] = local_13e0[0x25] - dVar14;
      dVar14 = local_1948[0xd] * -dVar17;
      local_13e0[0x45] = local_13e0[0x45] - dVar14;
      local_13e0[0x47] = local_13e0[0x47] + dVar14;
      local_13e0[0x50] = local_13e0[0x50] + dVar14;
      local_13e0[0x51] = local_13e0[0x51] - dVar14;
      dVar14 = -dVar17 * local_1948[4];
      local_b88 = local_b88 - dVar14;
      local_b78 = local_b78 + dVar14;
      local_b30 = local_b30 + dVar14;
      local_b28 = local_b28 - dVar14;
      dVar25 = dVar25 * local_1948[2];
      local_ad8 = local_ad8 - dVar25;
      local_ac8 = local_ac8 + dVar25;
      local_a80 = local_a80 + dVar25;
      local_a78 = local_a78 - dVar25;
      local_618[2] = local_618[2] - dVar16;
      local_618[4] = local_618[4] + dVar16;
      local_5b0 = local_5b0 + dVar16;
      local_5a8 = local_5a8 - dVar16;
      local_1708 = local_1948[2] * local_1948[0x10];
      dVar14 = exp((double)local_1748._0_8_ * 1.83 + dVar28 * -110.7076664770384);
      dVar14 = dVar14 * 19.2;
      dVar19 = dVar28 * 1.83 + local_1778 * 110.7076664770384;
      dVar25 = local_1948[9] * local_1948[0xd];
      dVar16 = (double)local_17d8._0_8_ - (double)local_1638._0_8_;
      dVar17 = exp((dVar16 - local_1518) + local_508);
      dVar17 = dVar14 / dVar17;
      dVar18 = dVar14 * local_1708 - dVar25 * dVar17;
      dVar19 = dVar19 * dVar14 * local_1708 -
               (dVar19 - ((dStack_16a0 + dStack_1680) - (local_16d8 + local_1668)) * dVar28) *
               dVar17 * dVar25;
      local_1888[2] = local_1888[2] - dVar18;
      local_1888[9] = local_1888[9] + dVar18;
      local_1888[0x10] = local_1888[0x10] - dVar18;
      local_1888[0xd] = dVar18 + local_1888[0xd];
      dVar25 = local_1948[0x10] * dVar14;
      local_13e0[0x19] = local_13e0[0x19] - dVar25;
      local_13e0[0x20] = local_13e0[0x20] + dVar25;
      local_13e0[0x24] = local_13e0[0x24] + dVar25;
      local_13e0[0x27] = local_13e0[0x27] - dVar25;
      dVar25 = local_1948[0xd] * -dVar17;
      local_e48 = local_e48 - dVar25;
      dStack_e10 = dStack_e10 + dVar25;
      local_df0 = local_df0 + dVar25;
      local_dd8 = local_dd8 - dVar25;
      dVar25 = -dVar17 * local_1948[9];
      local_b88 = local_b88 - dVar25;
      local_b50 = local_b50 + dVar25;
      local_b30 = local_b30 + dVar25;
      local_b18 = local_b18 - dVar25;
      dVar14 = dVar14 * local_1948[2];
      local_978 = local_978 - dVar14;
      dStack_940 = dStack_940 + dVar14;
      local_920 = local_920 + dVar14;
      local_908 = local_908 - dVar14;
      local_618[2] = local_618[2] - dVar19;
      local_618[9] = local_618[9] + dVar19;
      local_5b0 = local_5b0 + dVar19;
      local_598 = local_598 - dVar19;
      local_1708 = local_1948[2] * local_1948[0x11];
      dVar14 = exp((double)local_1788._0_8_);
      dVar14 = dVar14 * 132000000.0;
      dVar25 = local_1948[9] * local_1948[0xe];
      dVar16 = exp((dVar16 - local_1618) + local_538);
      dVar16 = dVar14 / dVar16;
      dVar17 = dVar14 * local_1708 - dVar25 * dVar16;
      dVar25 = (double)local_17a8._0_8_ * dVar14 * local_1708 -
               ((double)local_17a8._0_8_ -
               ((dStack_16a0 + local_1678) - (local_16d8 + dStack_1660)) * dVar28) * dVar16 * dVar25
      ;
      local_1888[2] = local_1888[2] - dVar17;
      local_1888[9] = local_1888[9] + dVar17;
      local_1888[0x11] = local_1888[0x11] - dVar17;
      local_1888[0xe] = dVar17 + local_1888[0xe];
      dVar17 = local_1948[0x11] * dVar14;
      local_13e0[0x19] = local_13e0[0x19] - dVar17;
      local_13e0[0x20] = local_13e0[0x20] + dVar17;
      local_13e0[0x25] = local_13e0[0x25] + dVar17;
      local_13e0[0x28] = local_13e0[0x28] - dVar17;
      dVar17 = local_1948[0xe] * -dVar16;
      local_e48 = local_e48 - dVar17;
      dStack_e10 = dStack_e10 + dVar17;
      local_de8 = local_de8 + dVar17;
      local_dd0 = local_dd0 - dVar17;
      dVar16 = -dVar16 * local_1948[9];
      local_ad8 = local_ad8 - dVar16;
      local_aa0 = local_aa0 + dVar16;
      local_a78 = local_a78 + dVar16;
      local_a60 = local_a60 - dVar16;
      dVar14 = dVar14 * local_1948[2];
      local_8c8 = local_8c8 - dVar14;
      local_890 = local_890 + dVar14;
      local_868 = local_868 + dVar14;
      local_850 = local_850 - dVar14;
      local_618[2] = local_618[2] - dVar25;
      local_618[9] = local_618[9] + dVar25;
      local_5a8 = local_5a8 + dVar25;
      local_590 = local_590 - dVar25;
      dVar14 = local_1948[2] * local_1948[0x12];
      dVar25 = exp((double)local_1748._0_8_ * 1.92 + dVar28 * -2863.302828428857);
      dVar25 = dVar25 * 89.8;
      dVar16 = dVar28 * 1.92 + local_1778 * 2863.302828428857;
      local_1708 = local_1948[4] * local_1948[0x11];
      dVar15 = exp((dVar15 - local_538) + local_518);
      dVar15 = dVar25 / dVar15;
      dVar17 = dVar25 * dVar14 - local_1708 * dVar15;
      dVar16 = dVar16 * dVar25 * dVar14 -
               (dVar16 - ((local_16c8 + dStack_1660) - (local_16d8 + local_1658)) * dVar28) * dVar15
               * local_1708;
      local_1888[2] = local_1888[2] - dVar17;
      local_1888[4] = local_1888[4] + dVar17;
      local_1888[0x12] = local_1888[0x12] - dVar17;
      local_1888[0x11] = dVar17 + local_1888[0x11];
      dVar14 = local_1948[0x12] * dVar25;
      local_13e0[0x19] = local_13e0[0x19] - dVar14;
      local_13e0[0x1b] = local_13e0[0x1b] + dVar14;
      local_13e0[0x28] = local_13e0[0x28] + dVar14;
      local_13e0[0x29] = local_13e0[0x29] - dVar14;
      dVar14 = local_1948[0x11] * -dVar15;
      local_13e0[0x45] = local_13e0[0x45] - dVar14;
      local_13e0[0x47] = local_13e0[0x47] + dVar14;
      local_13e0[0x54] = local_13e0[0x54] + dVar14;
      local_13e0[0x55] = local_13e0[0x55] - dVar14;
      dVar14 = -dVar15 * local_1948[4];
      local_8c8 = local_8c8 - dVar14;
      local_8b8 = local_8b8 + dVar14;
      local_850 = local_850 + dVar14;
      local_848 = local_848 - dVar14;
      dVar25 = dVar25 * local_1948[2];
      dStack_818 = dStack_818 - dVar25;
      local_808 = local_808 + dVar25;
      local_7a0 = local_7a0 + dVar25;
      local_798 = local_798 - dVar25;
      local_618[2] = local_618[2] - dVar16;
      local_618[4] = local_618[4] + dVar16;
      local_590 = local_590 + dVar16;
      local_588 = local_588 - dVar16;
      dVar19 = local_1948[3] * local_1948[0xb];
      dVar14 = exp(dVar28 * -24053.756625465616 + local_1738);
      dVar14 = dVar14 * 2500000.0;
      dVar25 = local_1778 * 24053.756625465616 + (double)local_1768._0_8_;
      dVar15 = local_1948[2] * local_1948[0xc];
      local_1708 = (double)local_1628._0_8_ - (double)local_17d8._0_8_;
      dVar16 = exp((local_14e8 + local_1708) - local_528);
      dVar16 = dVar14 / dVar16;
      dVar17 = dVar14 * dVar19 - dVar15 * dVar16;
      local_1888[2] = local_1888[2] + dVar17;
      local_1888[3] = local_1888[3] - dVar17;
      local_1888[0xb] = local_1888[0xb] - dVar17;
      local_1888[0xc] = dVar17 + local_1888[0xc];
      dVar15 = dVar25 * dVar14 * dVar19 -
               (dVar25 - ((local_16d8 + local_1688) - (dStack_16d0 + dStack_1690)) * dVar28) *
               dVar16 * dVar15;
      dVar25 = local_1948[0xc] * -dVar16;
      local_13e0[0x19] = local_13e0[0x19] + dVar25;
      local_13e0[0x1a] = local_13e0[0x1a] - dVar25;
      local_13e0[0x22] = local_13e0[0x22] - dVar25;
      local_13e0[0x23] = dVar25 + local_13e0[0x23];
      dVar25 = local_1948[0xb] * dVar14;
      local_13e0[0x2f] = local_13e0[0x2f] + dVar25;
      local_13e0[0x30] = local_13e0[0x30] - dVar25;
      local_13e0[0x38] = local_13e0[0x38] - dVar25;
      local_13e0[0x39] = dVar25 + local_13e0[0x39];
      dVar14 = dVar14 * local_1948[3];
      dStack_ce8 = dStack_ce8 + dVar14;
      local_ce0 = local_ce0 - dVar14;
      dStack_ca0 = dStack_ca0 - dVar14;
      local_c98 = dVar14 + local_c98;
      dVar14 = -dVar16 * local_1948[2];
      dStack_c38 = dStack_c38 + dVar14;
      local_c30 = local_c30 - dVar14;
      local_bf0 = local_bf0 - dVar14;
      local_be8 = dVar14 + local_be8;
      local_618[2] = local_618[2] + dVar15;
      local_618[3] = local_618[3] - dVar15;
      local_5c8._8_8_ = (double)local_5c8._8_8_ - dVar15;
      local_5b8 = dVar15 + local_5b8;
      dVar14 = local_1948[3] * local_1948[0xe];
      dVar25 = exp(dVar28 * -20128.6666321888 + local_1738);
      dVar25 = dVar25 * 100000000.0;
      dVar15 = local_1778 * 20128.6666321888 + (double)local_1768._0_8_;
      dVar16 = local_1948[6] * local_1948[0xd];
      dVar17 = (double)local_1628._0_8_ - (double)local_1718._0_8_;
      dVar19 = exp((dVar17 - local_1518) + local_1618);
      dVar19 = dVar25 / dVar19;
      dVar18 = dVar25 * dVar14 - dVar16 * dVar19;
      dVar15 = dVar15 * dVar25 * dVar14 -
               (dVar15 - ((local_16b8 + dStack_1680) - (dStack_16d0 + local_1678)) * dVar28) *
               dVar19 * dVar16;
      local_1888[3] = local_1888[3] - dVar18;
      local_1888[6] = local_1888[6] + dVar18;
      local_1888[0xe] = local_1888[0xe] - dVar18;
      local_1888[0xd] = dVar18 + local_1888[0xd];
      dVar14 = local_1948[0xe] * dVar25;
      local_13e0[0x30] = local_13e0[0x30] - dVar14;
      local_13e0[0x33] = local_13e0[0x33] + dVar14;
      local_13e0[0x3a] = local_13e0[0x3a] + dVar14;
      local_13e0[0x3b] = local_13e0[0x3b] - dVar14;
      dVar14 = local_1948[0xd] * -dVar19;
      local_1050._0_8_ = (double)local_1050._0_8_ - dVar14;
      dStack_1038 = dStack_1038 + dVar14;
      local_1000 = local_1000 + dVar14;
      local_ff8 = local_ff8 - dVar14;
      dVar14 = -dVar19 * local_1948[6];
      local_b80 = local_b80 - dVar14;
      local_b68 = local_b68 + dVar14;
      local_b30 = local_b30 + dVar14;
      local_b28 = local_b28 - dVar14;
      dVar25 = dVar25 * local_1948[3];
      local_ad0 = local_ad0 - dVar25;
      local_ab8 = local_ab8 + dVar25;
      local_a80 = local_a80 + dVar25;
      local_a78 = local_a78 - dVar25;
      local_618[3] = local_618[3] - dVar15;
      local_618[6] = local_618[6] + dVar15;
      local_5b0 = local_5b0 + dVar15;
      local_5a8 = local_5a8 - dVar15;
      dVar18 = local_1948[1] * local_1948[3];
      dVar14 = exp(dVar28 * -7252.86180424343 + local_1738);
      dVar14 = dVar14 * 83000000.0;
      dVar25 = local_1778 * 7252.86180424343 + (double)local_1768._0_8_;
      dVar15 = local_1948[2] * local_1948[4];
      dVar16 = exp(((local_1758 - (double)local_17d8._0_8_) + (double)local_1628._0_8_) -
                   (double)local_1898._0_8_);
      dVar16 = dVar14 / dVar16;
      dVar19 = dVar14 * dVar18 - dVar15 * dVar16;
      local_1888[1] = local_1888[1] - dVar19;
      local_1888[2] = local_1888[2] + dVar19;
      local_1888[3] = local_1888[3] - dVar19;
      local_1888[4] = dVar19 + local_1888[4];
      dVar15 = dVar25 * dVar14 * dVar18 -
               (dVar25 - ((local_16d8 + local_16c8) - (dStack_16e0 + dStack_16d0)) * dVar28) *
               dVar16 * dVar15;
      dVar25 = local_1948[3] * dVar14;
      local_13e0[2] = local_13e0[2] - dVar25;
      local_13e0[4] = local_13e0[4] - dVar25;
      local_13e0[3] = local_13e0[3] + dVar25;
      local_13e0[5] = dVar25 + local_13e0[5];
      dVar25 = local_1948[4] * -dVar16;
      local_13e0[0x18] = local_13e0[0x18] - dVar25;
      local_13e0[0x1a] = local_13e0[0x1a] - dVar25;
      local_13e0[0x19] = local_13e0[0x19] + dVar25;
      local_13e0[0x1b] = dVar25 + local_13e0[0x1b];
      dVar14 = dVar14 * local_1948[1];
      local_13e0[0x30] = local_13e0[0x30] - dVar14;
      local_13e0[0x31] = local_13e0[0x31] + dVar14;
      local_13e0[0x2f] = dVar14 + local_13e0[0x2f];
      local_13e0[0x2e] = local_13e0[0x2e] - dVar14;
      dVar14 = -dVar16 * local_1948[2];
      local_13e0[0x46] = local_13e0[0x46] - dVar14;
      local_13e0[0x44] = local_13e0[0x44] - dVar14;
      local_13e0[0x47] = local_13e0[0x47] + dVar14;
      local_13e0[0x45] = dVar14 + local_13e0[0x45];
      local_618[1] = local_618[1] - dVar15;
      local_618[2] = local_618[2] + dVar15;
      local_618[3] = local_618[3] - dVar15;
      local_618[4] = dVar15 + local_618[4];
      dVar14 = local_1948[1] * local_1948[6];
      local_17c8._0_8_ = exp(dVar28 * -537.435399079441 + local_1738);
      local_17c8._0_8_ = (double)local_17c8._0_8_ * 28000000.0;
      dVar25 = local_1778 * 537.435399079441 + (double)local_1768._0_8_;
      dVar15 = local_1948[0] * local_1948[3];
      dVar16 = local_1758 - (double)local_1728._0_8_;
      dVar19 = exp((dVar16 - (double)local_1628._0_8_) + (double)local_1718._0_8_);
      dVar19 = (double)local_17c8._0_8_ / dVar19;
      dVar18 = (double)local_17c8._0_8_ * dVar14 - dVar15 * dVar19;
      dVar25 = dVar25 * (double)local_17c8._0_8_ * dVar14 -
               (dVar25 - ((local_16e8 + dStack_16d0) - (dStack_16e0 + local_16b8)) * dVar28) *
               dVar19 * dVar15;
      local_1888[0] = local_1888[0] + dVar18;
      local_1888[1] = local_1888[1] - dVar18;
      local_1888[6] = local_1888[6] - dVar18;
      local_1888[3] = dVar18 + local_1888[3];
      dVar14 = local_1948[3] * -dVar19;
      local_1488[0] = local_1488[0] + dVar14;
      local_1488[1] = local_1488[1] - dVar14;
      local_1488[3] = local_1488[3] + dVar14;
      local_1458 = local_1458 - dVar14;
      dVar14 = local_1948[6] * (double)local_17c8._0_8_;
      local_13e0[1] = local_13e0[1] + dVar14;
      local_13e0[2] = local_13e0[2] - dVar14;
      local_13e0[4] = local_13e0[4] + dVar14;
      local_13e0[7] = local_13e0[7] - dVar14;
      dVar14 = -dVar19 * local_1948[0];
      local_13e0[0x2d] = local_13e0[0x2d] + dVar14;
      local_13e0[0x2e] = local_13e0[0x2e] - dVar14;
      local_13e0[0x30] = local_13e0[0x30] + dVar14;
      local_13e0[0x33] = local_13e0[0x33] - dVar14;
      dVar14 = (double)local_17c8._0_8_ * local_1948[1];
      local_13e0[0x6f] = local_13e0[0x6f] + dVar14;
      local_13e0[0x70] = local_13e0[0x70] - dVar14;
      local_1050._0_8_ = (double)local_1050._0_8_ + dVar14;
      dStack_1038 = dStack_1038 - dVar14;
      local_618[0] = local_618[0] + dVar25;
      local_618[1] = local_618[1] - dVar25;
      local_618[3] = local_618[3] + dVar25;
      local_618[6] = local_618[6] - dVar25;
      dVar19 = local_1948[1] * local_1948[6];
      local_17c8._0_8_ = exp(dVar28 * -319.54258278599724 + local_1738);
      local_17c8._0_8_ = (double)local_17c8._0_8_ * 134000000.0;
      dVar14 = local_1778 * 319.54258278599724 + (double)local_1768._0_8_;
      dVar25 = local_1948[4] * local_1948[4];
      local_1728._0_8_ = (double)local_1898._0_8_ + (double)local_1898._0_8_;
      dVar15 = exp((local_1758 - ((double)local_1898._0_8_ + (double)local_1898._0_8_)) +
                   (double)local_1718._0_8_);
      dVar15 = (double)local_17c8._0_8_ / dVar15;
      dVar18 = (double)local_17c8._0_8_ * dVar19 - dVar25 * dVar15;
      dVar25 = dVar14 * (double)local_17c8._0_8_ * dVar19 -
               (dVar14 - ((local_16c8 + local_16c8) - (dStack_16e0 + local_16b8)) * dVar28) * dVar15
               * dVar25;
      local_1888[1] = local_1888[1] - dVar18;
      local_1888[6] = local_1888[6] - dVar18;
      local_1888[4] = dVar18 + dVar18 + local_1888[4];
      dVar14 = local_1948[6] * (double)local_17c8._0_8_;
      local_13e0[2] = local_13e0[2] - dVar14;
      local_13e0[7] = local_13e0[7] - dVar14;
      local_13e0[5] = dVar14 + dVar14 + local_13e0[5];
      dVar14 = dVar15 * -2.0 * local_1948[4];
      local_13e0[0x44] = local_13e0[0x44] - dVar14;
      local_13e0[0x47] = dVar14 + dVar14 + local_13e0[0x47];
      local_13e0[0x49] = local_13e0[0x49] - dVar14;
      dVar14 = (double)local_17c8._0_8_ * local_1948[1];
      local_13e0[0x70] = local_13e0[0x70] - dVar14;
      local_1050._8_8_ = dVar14 + dVar14 + (double)local_1050._8_8_;
      dStack_1038 = dStack_1038 - dVar14;
      local_618[1] = local_618[1] - dVar25;
      local_618[4] = dVar25 + dVar25 + local_618[4];
      local_618[6] = local_618[6] - dVar25;
      dVar14 = local_1948[1] * local_1948[10];
      local_17c8._0_8_ = exp((double)local_1748._0_8_ * 1.62 + dVar28 * -5454.868657323165);
      local_17c8._0_8_ = (double)local_17c8._0_8_ * 660.0;
      dVar18 = local_1948[0] * local_1948[9];
      dVar15 = dVar28 * 1.62 + local_1778 * 5454.868657323165;
      dVar25 = exp((dVar16 - (double)local_1638._0_8_) + local_548);
      dVar25 = (double)local_17c8._0_8_ / dVar25;
      dVar19 = (double)local_17c8._0_8_ * dVar14 - dVar18 * dVar25;
      dVar15 = dVar15 * (double)local_17c8._0_8_ * dVar14 -
               (dVar15 - ((local_16e8 + dStack_16a0) - (dStack_16e0 + local_1698)) * dVar28) *
               dVar25 * dVar18;
      local_1888[0] = local_1888[0] + dVar19;
      local_1888[1] = local_1888[1] - dVar19;
      local_1888[10] = local_1888[10] - dVar19;
      local_1888[9] = dVar19 + local_1888[9];
      dVar14 = local_1948[9] * -dVar25;
      local_1488[0] = local_1488[0] + dVar14;
      local_1488[1] = local_1488[1] - dVar14;
      local_1440 = local_1440 + dVar14;
      local_1438 = local_1438 - dVar14;
      dVar14 = local_1948[10] * (double)local_17c8._0_8_;
      local_13e0[1] = local_13e0[1] + dVar14;
      local_13e0[2] = local_13e0[2] - dVar14;
      local_13e0[10] = local_13e0[10] + dVar14;
      local_13e0[0xb] = local_13e0[0xb] - dVar14;
      dVar14 = -dVar25 * local_1948[0];
      local_e58 = local_e58 + dVar14;
      local_e50 = local_e50 - dVar14;
      dStack_e10 = dStack_e10 + dVar14;
      local_e08 = local_e08 - dVar14;
      dVar14 = (double)local_17c8._0_8_ * local_1948[1];
      local_da8 = local_da8 + dVar14;
      local_da0 = local_da0 - dVar14;
      local_d60 = local_d60 + dVar14;
      local_d58 = local_d58 - dVar14;
      local_618[0] = local_618[0] + dVar15;
      local_618[1] = local_618[1] - dVar15;
      local_618[9] = local_618[9] + dVar15;
      local_5c8._0_8_ = (double)local_5c8._0_8_ - dVar15;
      dVar14 = local_1948[1] * local_1948[0xd];
      dVar25 = exp((double)local_1788._0_8_);
      dVar19 = local_1948[0] * local_1948[0xb];
      dVar25 = dVar25 * 73400000.0;
      dVar15 = exp((dVar16 - local_14e8) + local_1518);
      dVar15 = dVar25 / dVar15;
      dVar18 = dVar25 * dVar14 - dVar19 * dVar15;
      dVar14 = (double)local_17a8._0_8_ * dVar25 * dVar14 -
               ((double)local_17a8._0_8_ -
               ((local_16e8 + dStack_1690) - (dStack_16e0 + dStack_1680)) * dVar28) * dVar15 *
               dVar19;
      local_1888[0] = local_1888[0] + dVar18;
      local_1888[1] = local_1888[1] - dVar18;
      local_1888[0xd] = local_1888[0xd] - dVar18;
      local_1888[0xb] = dVar18 + local_1888[0xb];
      dVar19 = local_1948[0xb] * -dVar15;
      local_1488[0] = local_1488[0] + dVar19;
      local_1488[1] = local_1488[1] - dVar19;
      local_1430 = local_1430 + dVar19;
      local_1420 = local_1420 - dVar19;
      dVar19 = local_1948[0xd] * dVar25;
      local_13e0[1] = local_13e0[1] + dVar19;
      local_13e0[2] = local_13e0[2] - dVar19;
      local_13e0[0xc] = local_13e0[0xc] + dVar19;
      local_13e0[0xe] = local_13e0[0xe] - dVar19;
      dVar15 = -dVar15 * local_1948[0];
      local_cf8 = local_cf8 + dVar15;
      local_cf0 = local_cf0 - dVar15;
      dStack_ca0 = dStack_ca0 + dVar15;
      local_c90 = local_c90 - dVar15;
      dVar25 = dVar25 * local_1948[1];
      local_b98 = local_b98 + dVar25;
      local_b90 = local_b90 - dVar25;
      dStack_b40 = dStack_b40 + dVar25;
      local_b30 = local_b30 - dVar25;
      local_618[0] = local_618[0] + dVar14;
      local_618[1] = local_618[1] - dVar14;
      local_5c8._8_8_ = (double)local_5c8._8_8_ + dVar14;
      local_5b0 = local_5b0 - dVar14;
      dVar14 = local_1948[1] * local_1948[0xe];
      local_17c8._0_8_ = exp((double)local_1748._0_8_ * 1.05 + dVar28 * -1648.034580510458);
      local_17c8._0_8_ = (double)local_17c8._0_8_ * 23000.0;
      dVar18 = local_1948[0] * local_1948[0xd];
      dVar15 = dVar28 * 1.05 + local_1778 * 1648.034580510458;
      dVar25 = exp((dVar16 - local_1518) + local_1618);
      dVar25 = (double)local_17c8._0_8_ / dVar25;
      dVar19 = (double)local_17c8._0_8_ * dVar14 - dVar18 * dVar25;
      dVar15 = dVar15 * (double)local_17c8._0_8_ * dVar14 -
               (dVar15 - ((local_16e8 + dStack_1680) - (dStack_16e0 + local_1678)) * dVar28) *
               dVar25 * dVar18;
      local_1888[0] = local_1888[0] + dVar19;
      local_1888[1] = local_1888[1] - dVar19;
      local_1888[0xe] = local_1888[0xe] - dVar19;
      local_1888[0xd] = dVar19 + local_1888[0xd];
      dVar14 = local_1948[0xd] * -dVar25;
      local_1488[0] = local_1488[0] + dVar14;
      local_1488[1] = local_1488[1] - dVar14;
      local_1420 = local_1420 + dVar14;
      local_1418 = local_1418 - dVar14;
      dVar14 = local_1948[0xe] * (double)local_17c8._0_8_;
      local_13e0[1] = local_13e0[1] + dVar14;
      local_13e0[2] = local_13e0[2] - dVar14;
      local_13e0[0xe] = local_13e0[0xe] + dVar14;
      local_13e0[0xf] = local_13e0[0xf] - dVar14;
      dVar14 = -dVar25 * local_1948[0];
      local_b98 = local_b98 + dVar14;
      local_b90 = local_b90 - dVar14;
      local_b30 = local_b30 + dVar14;
      local_b28 = local_b28 - dVar14;
      dVar14 = (double)local_17c8._0_8_ * local_1948[1];
      local_ae8 = local_ae8 + dVar14;
      local_ae0 = local_ae0 - dVar14;
      local_a80 = local_a80 + dVar14;
      local_a78 = local_a78 - dVar14;
      local_618[0] = local_618[0] + dVar15;
      local_618[1] = local_618[1] - dVar15;
      local_5b0 = local_5b0 + dVar15;
      local_5a8 = local_5a8 - dVar15;
      dVar14 = local_1948[1] * local_1948[0xf];
      dVar25 = exp((double)local_1788._0_8_);
      dVar25 = dVar25 * 32000000.0;
      dVar15 = local_1948[4] * local_1948[9];
      dVar19 = exp(((local_1758 - (double)local_1898._0_8_) - (double)local_1638._0_8_) + local_568)
      ;
      dVar19 = dVar25 / dVar19;
      dVar18 = dVar25 * dVar14 - dVar15 * dVar19;
      dVar14 = (double)local_17a8._0_8_ * dVar25 * dVar14 -
               ((double)local_17a8._0_8_ -
               ((local_16c8 + dStack_16a0) - (dStack_16e0 + dStack_1670)) * dVar28) * dVar19 *
               dVar15;
      local_1888[1] = local_1888[1] - dVar18;
      local_1888[4] = local_1888[4] + dVar18;
      local_1888[0xf] = local_1888[0xf] - dVar18;
      local_1888[9] = dVar18 + local_1888[9];
      dVar15 = local_1948[0xf] * dVar25;
      local_13e0[2] = local_13e0[2] - dVar15;
      local_13e0[5] = local_13e0[5] + dVar15;
      local_13e0[10] = local_13e0[10] + dVar15;
      local_13e0[0x10] = local_13e0[0x10] - dVar15;
      dVar15 = local_1948[9] * -dVar19;
      local_13e0[0x44] = local_13e0[0x44] - dVar15;
      local_13e0[0x47] = local_13e0[0x47] + dVar15;
      local_13e0[0x4c] = local_13e0[0x4c] + dVar15;
      local_13e0[0x52] = local_13e0[0x52] - dVar15;
      dVar15 = -dVar19 * local_1948[4];
      local_e50 = local_e50 - dVar15;
      local_e38 = local_e38 + dVar15;
      dStack_e10 = dStack_e10 + dVar15;
      local_de0 = local_de0 - dVar15;
      dVar25 = dVar25 * local_1948[1];
      local_a30 = local_a30 - dVar25;
      local_a18 = local_a18 + dVar25;
      local_9f0 = local_9f0 + dVar25;
      local_9c0 = local_9c0 - dVar25;
      local_618[1] = local_618[1] - dVar14;
      local_618[4] = local_618[4] + dVar14;
      local_618[9] = local_618[9] + dVar14;
      local_5a0 = local_5a0 - dVar14;
      dVar14 = local_1948[1] * local_1948[0x12];
      local_17c8._0_8_ = exp((double)local_1748._0_8_ * 1.9 + dVar28 * -3789.2214935095417);
      local_17c8._0_8_ = (double)local_17c8._0_8_ * 115.0;
      dVar19 = dVar28 * 1.9 + local_1778 * 3789.2214935095417;
      dVar25 = local_1948[0] * local_1948[0x11];
      dVar15 = exp((dVar16 - local_538) + local_518);
      dVar15 = (double)local_17c8._0_8_ / dVar15;
      dVar16 = (double)local_17c8._0_8_ * dVar14 - dVar25 * dVar15;
      dVar25 = dVar19 * (double)local_17c8._0_8_ * dVar14 -
               (dVar19 - ((local_16e8 + dStack_1660) - (dStack_16e0 + local_1658)) * dVar28) *
               dVar15 * dVar25;
      local_1888[0] = local_1888[0] + dVar16;
      local_1888[1] = local_1888[1] - dVar16;
      local_1888[0x12] = local_1888[0x12] - dVar16;
      local_1888[0x11] = dVar16 + local_1888[0x11];
      dVar14 = local_1948[0x11] * -dVar15;
      local_1488[0] = local_1488[0] + dVar14;
      local_1488[1] = local_1488[1] - dVar14;
      local_1400 = local_1400 + dVar14;
      local_13f8[0] = local_13f8[0] - dVar14;
      dVar14 = local_1948[0x12] * (double)local_17c8._0_8_;
      local_13e0[1] = local_13e0[1] + dVar14;
      local_13e0[2] = local_13e0[2] - dVar14;
      local_13e0[0x12] = local_13e0[0x12] + dVar14;
      local_13e0[0x13] = local_13e0[0x13] - dVar14;
      dVar14 = -dVar15 * local_1948[0];
      local_8d8 = local_8d8 + dVar14;
      local_8d0 = local_8d0 - dVar14;
      local_850 = local_850 + dVar14;
      local_848 = local_848 - dVar14;
      dVar14 = (double)local_17c8._0_8_ * local_1948[1];
      local_828 = local_828 + dVar14;
      local_820 = local_820 - dVar14;
      local_7a0 = local_7a0 + dVar14;
      local_798 = local_798 - dVar14;
      local_618[0] = local_618[0] + dVar25;
      local_618[1] = local_618[1] - dVar25;
      local_590 = local_590 + dVar25;
      local_588 = local_588 - dVar25;
      dVar14 = local_1948[0] * local_1948[4];
      dVar25 = exp((double)local_1748._0_8_ * 1.51 + dVar28 * -1726.0331637101897);
      dVar25 = dVar25 * 216.0;
      dVar18 = local_1948[1] * local_1948[5];
      dVar16 = dVar28 * 1.51 + local_1778 * 1726.0331637101897;
      dVar15 = exp(((double)local_1898._0_8_ + (double)local_16f8._0_8_) - (double)local_1538._0_8_)
      ;
      dVar15 = dVar25 / dVar15;
      dVar19 = dVar25 * dVar14 - dVar18 * dVar15;
      dVar16 = dVar16 * dVar25 * dVar14 -
               (dVar16 - ((dStack_16e0 + dStack_16c0) - (local_16e8 + local_16c8)) * dVar28) *
               dVar15 * dVar18;
      local_1888[0] = local_1888[0] - dVar19;
      local_1888[1] = local_1888[1] + dVar19;
      local_1888[4] = local_1888[4] - dVar19;
      local_1888[5] = dVar19 + local_1888[5];
      dVar14 = local_1948[4] * dVar25;
      local_1488[0] = local_1488[0] - dVar14;
      local_1488[1] = local_1488[1] + dVar14;
      local_1468 = local_1468 - dVar14;
      local_1460 = dVar14 + local_1460;
      dVar14 = local_1948[5] * -dVar15;
      local_13e0[1] = local_13e0[1] - dVar14;
      local_13e0[2] = local_13e0[2] + dVar14;
      local_13e0[5] = local_13e0[5] - dVar14;
      local_13e0[6] = dVar14 + local_13e0[6];
      dVar25 = dVar25 * local_1948[0];
      local_13e0[0x43] = local_13e0[0x43] - dVar25;
      local_13e0[0x44] = local_13e0[0x44] + dVar25;
      local_13e0[0x47] = local_13e0[0x47] - dVar25;
      local_13e0[0x48] = dVar25 + local_13e0[0x48];
      dVar14 = -dVar15 * local_1948[1];
      local_13e0[0x59] = local_13e0[0x59] - dVar14;
      local_13e0[0x5a] = local_13e0[0x5a] + dVar14;
      local_13e0[0x5d] = local_13e0[0x5d] - dVar14;
      local_13e0[0x5e] = dVar14 + local_13e0[0x5e];
      local_618[0] = local_618[0] - dVar16;
      local_618[1] = local_618[1] + dVar16;
      local_618[4] = local_618[4] - dVar16;
      local_618[5] = dVar16 + local_618[5];
      dVar14 = local_1948[4] * local_1948[4];
      dVar25 = exp((double)local_1748._0_8_ * 2.4 + dVar28 * 1061.7871648479593);
      dVar25 = dVar25 * 0.0357;
      dVar19 = dVar28 * 2.4 + local_1778 * -1061.7871648479593;
      dVar15 = local_1948[2] * local_1948[5];
      dVar16 = exp(((double)local_1728._0_8_ - (double)local_17d8._0_8_) - (double)local_1538._0_8_)
      ;
      dVar16 = dVar25 / dVar16;
      dVar18 = dVar25 * dVar14 - dVar15 * dVar16;
      local_1888[2] = local_1888[2] + dVar18;
      local_1888[4] = local_1888[4] - (dVar18 + dVar18);
      local_1888[5] = dVar18 + local_1888[5];
      dVar18 = local_1948[5] * -dVar16;
      local_13e0[0x19] = local_13e0[0x19] + dVar18;
      local_13e0[0x1b] = local_13e0[0x1b] - (dVar18 + dVar18);
      local_13e0[0x1c] = dVar18 + local_13e0[0x1c];
      dVar18 = (dVar25 + dVar25) * local_1948[4];
      local_13e0[0x45] = local_13e0[0x45] + dVar18;
      local_13e0[0x47] = local_13e0[0x47] - (dVar18 + dVar18);
      local_13e0[0x48] = dVar18 + local_13e0[0x48];
      dVar18 = -dVar16 * local_1948[2];
      local_13e0[0x5b] = local_13e0[0x5b] + dVar18;
      local_13e0[0x5d] = local_13e0[0x5d] - (dVar18 + dVar18);
      local_13e0[0x5e] = dVar18 + local_13e0[0x5e];
      dVar14 = dVar19 * dVar25 * dVar14 -
               (dVar19 - ((local_16d8 + dStack_16c0) - (local_16c8 + local_16c8)) * dVar28) * dVar16
               * dVar15;
      local_618[2] = local_618[2] + dVar14;
      local_618[4] = local_618[4] - (dVar14 + dVar14);
      local_618[5] = dVar14 + local_618[5];
      dVar14 = local_1948[4] * local_1948[6];
      dVar25 = exp(dVar28 * 251.60833290236002 + local_1738);
      dVar25 = dVar25 * 29000000.0;
      local_1728._8_4_ = (int)uStack_1770;
      local_1728._0_8_ = local_1778 * -251.60833290236002 + (double)local_1768._0_8_;
      local_1728._12_4_ = (int)((ulong)uStack_1770 >> 0x20);
      local_17d8._0_8_ = local_1948[3] * local_1948[5];
      dVar15 = exp((((double)local_1898._0_8_ - (double)local_1628._0_8_) - (double)local_1538._0_8_
                   ) + (double)local_1718._0_8_);
      dVar15 = dVar25 / dVar15;
      dVar16 = dVar25 * dVar14 - (double)local_17d8._0_8_ * dVar15;
      dVar19 = (double)local_1728._0_8_ * dVar25 * dVar14 -
               ((double)local_1728._0_8_ -
               ((dStack_16d0 + dStack_16c0) - (local_16c8 + local_16b8)) * dVar28) * dVar15 *
               (double)local_17d8._0_8_;
      local_1888[3] = local_1888[3] + dVar16;
      local_1888[4] = local_1888[4] - dVar16;
      local_1888[6] = local_1888[6] - dVar16;
      local_1888[5] = dVar16 + local_1888[5];
      dVar14 = local_1948[5] * -dVar15;
      local_13e0[0x30] = local_13e0[0x30] + dVar14;
      local_13e0[0x32] = dVar14 + local_13e0[0x32];
      local_13e0[0x31] = local_13e0[0x31] - dVar14;
      local_13e0[0x33] = local_13e0[0x33] - dVar14;
      dVar14 = local_1948[6] * dVar25;
      local_13e0[0x46] = local_13e0[0x46] + dVar14;
      local_13e0[0x48] = dVar14 + local_13e0[0x48];
      local_13e0[0x47] = local_13e0[0x47] - dVar14;
      local_13e0[0x49] = local_13e0[0x49] - dVar14;
      dVar14 = -dVar15 * local_1948[3];
      local_13e0[0x5e] = local_13e0[0x5e] + dVar14;
      local_13e0[0x5c] = dVar14 + local_13e0[0x5c];
      local_13e0[0x5f] = local_13e0[0x5f] - dVar14;
      local_13e0[0x5d] = local_13e0[0x5d] - dVar14;
      dVar25 = dVar25 * local_1948[4];
      local_1040 = local_1040 + dVar25;
      dStack_1038 = dStack_1038 - dVar25;
      dVar14 = (double)local_1050._8_8_ - dVar25;
      local_1050._8_4_ = SUB84(dVar14,0);
      local_1050._0_8_ = dVar25 + (double)local_1050._0_8_;
      local_1050._12_4_ = (int)((ulong)dVar14 >> 0x20);
      local_618[3] = local_618[3] + dVar19;
      local_618[4] = local_618[4] - dVar19;
      local_618[5] = local_618[5] + dVar19;
      local_618[6] = local_618[6] - dVar19;
      dVar14 = local_1948[4] * local_1948[7];
      dVar25 = exp((double)local_1788._0_8_);
      dVar25 = dVar25 * 20000000.0;
      local_17d8._0_8_ = (double)local_1898._0_8_ - local_1758;
      local_1728._0_8_ = local_1948[1] * local_1948[0xe];
      dVar15 = exp(((double)local_14b8._0_8_ + (double)local_17d8._0_8_) - local_1618);
      dVar15 = dVar25 / dVar15;
      dVar16 = dVar25 * dVar14 - (double)local_1728._0_8_ * dVar15;
      dVar14 = (double)local_17a8._0_8_ * dVar25 * dVar14 -
               ((double)local_17a8._0_8_ -
               ((dStack_16e0 + local_1678) - (local_16c8 + dStack_16b0)) * dVar28) * dVar15 *
               (double)local_1728._0_8_;
      local_1888[1] = local_1888[1] + dVar16;
      local_1888[4] = local_1888[4] - dVar16;
      local_1888[7] = local_1888[7] - dVar16;
      local_1888[0xe] = dVar16 + local_1888[0xe];
      dVar16 = local_1948[0xe] * -dVar15;
      local_13e0[2] = local_13e0[2] + dVar16;
      local_13e0[5] = local_13e0[5] - dVar16;
      local_13e0[8] = local_13e0[8] - dVar16;
      local_13e0[0xf] = dVar16 + local_13e0[0xf];
      dVar16 = local_1948[7] * dVar25;
      local_13e0[0x44] = local_13e0[0x44] + dVar16;
      local_13e0[0x47] = local_13e0[0x47] - dVar16;
      local_13e0[0x4a] = local_13e0[0x4a] - dVar16;
      local_13e0[0x51] = dVar16 + local_13e0[0x51];
      dVar25 = dVar25 * local_1948[4];
      local_fb0 = local_fb0 + dVar25;
      local_f98 = local_f98 - dVar25;
      dStack_f80 = dStack_f80 - dVar25;
      local_f48 = dVar25 + local_f48;
      dVar25 = -dVar15 * local_1948[1];
      local_ae0 = local_ae0 + dVar25;
      local_ac8 = local_ac8 - dVar25;
      dStack_ab0 = dStack_ab0 - dVar25;
      local_a78 = dVar25 + local_a78;
      local_618[1] = local_618[1] + dVar14;
      local_618[4] = local_618[4] - dVar14;
      local_618[7] = local_618[7] - dVar14;
      local_5a8 = dVar14 + local_5a8;
      dVar14 = local_1948[4] * local_1948[8];
      dVar25 = exp((double)local_1788._0_8_);
      local_1728._0_8_ = local_1948[1] * local_1948[0xe];
      dVar25 = dVar25 * 30000000.0;
      dVar15 = exp((local_1528 + (double)local_17d8._0_8_) - local_1618);
      dVar15 = dVar25 / dVar15;
      dVar16 = dVar25 * dVar14 - (double)local_1728._0_8_ * dVar15;
      dVar14 = (double)local_17a8._0_8_ * dVar25 * dVar14 -
               ((double)local_17a8._0_8_ -
               ((dStack_16e0 + local_1678) - (local_16c8 + local_16a8)) * dVar28) * dVar15 *
               (double)local_1728._0_8_;
      local_1888[1] = local_1888[1] + dVar16;
      local_1888[4] = local_1888[4] - dVar16;
      local_1888[8] = local_1888[8] - dVar16;
      local_1888[0xe] = dVar16 + local_1888[0xe];
      dVar16 = local_1948[0xe] * -dVar15;
      local_13e0[2] = local_13e0[2] + dVar16;
      local_13e0[5] = local_13e0[5] - dVar16;
      local_13e0[9] = local_13e0[9] - dVar16;
      local_13e0[0xf] = dVar16 + local_13e0[0xf];
      dVar16 = local_1948[8] * dVar25;
      local_13e0[0x44] = local_13e0[0x44] + dVar16;
      local_13e0[0x47] = local_13e0[0x47] - dVar16;
      local_13e0[0x4b] = local_13e0[0x4b] - dVar16;
      local_13e0[0x51] = dVar16 + local_13e0[0x51];
      dVar25 = dVar25 * local_1948[4];
      local_f00 = local_f00 + dVar25;
      local_ee8 = local_ee8 - dVar25;
      local_ec8 = local_ec8 - dVar25;
      local_e98 = dVar25 + local_e98;
      dVar25 = -dVar15 * local_1948[1];
      local_ae0 = local_ae0 + dVar25;
      local_ac8 = local_ac8 - dVar25;
      local_aa8 = local_aa8 - dVar25;
      local_a78 = dVar25 + local_a78;
      local_618[1] = local_618[1] + dVar14;
      local_618[4] = local_618[4] - dVar14;
      local_618[8] = local_618[8] - dVar14;
      local_5a8 = dVar14 + local_5a8;
      dVar14 = local_1948[4] * local_1948[9];
      dVar20 = (double)local_1748._0_8_ * 1.6;
      dVar25 = exp(dVar28 * -2727.4343286615826 + dVar20);
      dVar25 = dVar25 * 56.0;
      local_1728._8_8_ = 0;
      local_1728._0_8_ = dVar28 * 1.6;
      local_17c8._0_8_ = local_1778 * 2727.4343286615826 + dVar28 * 1.6;
      local_17c8._8_8_ = uStack_1770;
      dVar15 = local_1948[5] * local_1948[7];
      dVar16 = (double)local_1898._0_8_ - (double)local_1538._0_8_;
      dVar19 = exp((dVar16 - (double)local_14b8._0_8_) + (double)local_1638._0_8_);
      dVar19 = dVar25 / dVar19;
      dVar18 = dVar25 * dVar14 - dVar15 * dVar19;
      dVar15 = (double)local_17c8._0_8_ * dVar25 * dVar14 -
               ((double)local_17c8._0_8_ -
               ((dStack_16c0 + dStack_16b0) - (local_16c8 + dStack_16a0)) * dVar28) * dVar19 *
               dVar15;
      local_1888[4] = local_1888[4] - dVar18;
      local_1888[5] = local_1888[5] + dVar18;
      local_1888[9] = local_1888[9] - dVar18;
      local_1888[7] = dVar18 + local_1888[7];
      dVar14 = local_1948[9] * dVar25;
      local_13e0[0x47] = local_13e0[0x47] - dVar14;
      local_13e0[0x48] = local_13e0[0x48] + dVar14;
      local_13e0[0x4a] = local_13e0[0x4a] + dVar14;
      local_13e0[0x4c] = local_13e0[0x4c] - dVar14;
      dVar14 = local_1948[7] * -dVar19;
      local_13e0[0x5d] = local_13e0[0x5d] - dVar14;
      local_13e0[0x5e] = local_13e0[0x5e] + dVar14;
      local_13e0[0x60] = local_13e0[0x60] + dVar14;
      local_13e0[0x62] = local_13e0[0x62] - dVar14;
      dVar14 = -dVar19 * local_1948[5];
      local_f98 = local_f98 - dVar14;
      local_f90 = local_f90 + dVar14;
      dStack_f80 = dStack_f80 + dVar14;
      local_f70 = local_f70 - dVar14;
      dVar25 = dVar25 * local_1948[4];
      local_e38 = local_e38 - dVar25;
      local_e30 = local_e30 + dVar25;
      local_e20 = local_e20 + dVar25;
      dStack_e10 = dStack_e10 - dVar25;
      local_618[4] = local_618[4] - dVar15;
      local_618[5] = local_618[5] + dVar15;
      local_618[7] = local_618[7] + dVar15;
      local_618[9] = local_618[9] - dVar15;
      dVar14 = local_1948[4] * local_1948[9];
      dVar25 = exp((double)local_1788._0_8_);
      dVar15 = local_1948[5] * local_1948[8];
      local_17c8._0_8_ = dVar25 * 25010000.0;
      dVar25 = exp((dVar16 - local_1528) + (double)local_1638._0_8_);
      dVar25 = (double)local_17c8._0_8_ / dVar25;
      dVar19 = (double)local_17c8._0_8_ * dVar14 - dVar15 * dVar25;
      dVar14 = (double)local_17a8._0_8_ * (double)local_17c8._0_8_ * dVar14 -
               ((double)local_17a8._0_8_ -
               ((dStack_16c0 + local_16a8) - (local_16c8 + dStack_16a0)) * dVar28) * dVar25 * dVar15
      ;
      local_1888[4] = local_1888[4] - dVar19;
      local_1888[5] = local_1888[5] + dVar19;
      local_1888[9] = local_1888[9] - dVar19;
      local_1888[8] = dVar19 + local_1888[8];
      dVar15 = local_1948[9] * (double)local_17c8._0_8_;
      local_13e0[0x47] = local_13e0[0x47] - dVar15;
      local_13e0[0x48] = local_13e0[0x48] + dVar15;
      local_13e0[0x4b] = local_13e0[0x4b] + dVar15;
      local_13e0[0x4c] = local_13e0[0x4c] - dVar15;
      dVar15 = local_1948[8] * -dVar25;
      local_13e0[0x5d] = local_13e0[0x5d] - dVar15;
      local_13e0[0x5e] = local_13e0[0x5e] + dVar15;
      local_13e0[0x61] = local_13e0[0x61] + dVar15;
      local_13e0[0x62] = local_13e0[0x62] - dVar15;
      dVar25 = -dVar25 * local_1948[5];
      local_ee8 = local_ee8 - dVar25;
      local_ee0 = local_ee0 + dVar25;
      local_ec8 = local_ec8 + dVar25;
      dStack_ec0 = dStack_ec0 - dVar25;
      dVar25 = (double)local_17c8._0_8_ * local_1948[4];
      local_e38 = local_e38 - dVar25;
      local_e30 = local_e30 + dVar25;
      local_e18 = local_e18 + dVar25;
      dStack_e10 = dStack_e10 - dVar25;
      local_618[4] = local_618[4] - dVar14;
      local_618[5] = local_618[5] + dVar14;
      local_618[8] = local_618[8] + dVar14;
      local_618[9] = local_618[9] - dVar14;
      dVar14 = local_1948[4] * local_1948[10];
      dVar25 = exp(dVar28 * -1570.0359973107265 + dVar20);
      dVar25 = dVar25 * 100.0;
      dVar19 = local_1948[5] * local_1948[9];
      local_1728._8_4_ = (int)uStack_1770;
      local_1728._0_8_ = local_1778 * 1570.0359973107265 + (double)local_1728._0_8_;
      local_1728._12_4_ = (int)((ulong)uStack_1770 >> 0x20);
      dVar15 = exp((dVar16 - (double)local_1638._0_8_) + local_548);
      dVar15 = dVar25 / dVar15;
      dVar18 = dVar25 * dVar14 - dVar19 * dVar15;
      dVar19 = (double)local_1728._0_8_ * dVar25 * dVar14 -
               ((double)local_1728._0_8_ -
               ((dStack_16c0 + dStack_16a0) - (local_16c8 + local_1698)) * dVar28) * dVar15 * dVar19
      ;
      local_1888[4] = local_1888[4] - dVar18;
      local_1888[5] = local_1888[5] + dVar18;
      local_1888[10] = local_1888[10] - dVar18;
      local_1888[9] = dVar18 + local_1888[9];
      dVar14 = local_1948[10] * dVar25;
      local_13e0[0x47] = local_13e0[0x47] - dVar14;
      local_13e0[0x48] = local_13e0[0x48] + dVar14;
      local_13e0[0x4c] = local_13e0[0x4c] + dVar14;
      local_13e0[0x4d] = local_13e0[0x4d] - dVar14;
      dVar14 = local_1948[9] * -dVar15;
      local_13e0[0x5d] = local_13e0[0x5d] - dVar14;
      local_13e0[0x5e] = local_13e0[0x5e] + dVar14;
      local_13e0[0x62] = local_13e0[0x62] + dVar14;
      local_13e0[99] = local_13e0[99] - dVar14;
      dVar14 = -dVar15 * local_1948[5];
      local_e38 = local_e38 - dVar14;
      local_e30 = local_e30 + dVar14;
      dStack_e10 = dStack_e10 + dVar14;
      local_e08 = local_e08 - dVar14;
      dVar25 = dVar25 * local_1948[4];
      local_d88 = local_d88 - dVar25;
      local_d80 = local_d80 + dVar25;
      local_d60 = local_d60 + dVar25;
      local_d58 = local_d58 - dVar25;
      local_618[4] = local_618[4] - dVar19;
      local_618[5] = local_618[5] + dVar19;
      local_618[9] = local_618[9] + dVar19;
      local_5c8._0_8_ = (double)local_5c8._0_8_ - dVar19;
      local_1728._0_8_ = local_1948[4] * local_1948[0xb];
      dVar14 = exp((double)local_1748._0_8_ * 1.228 + dVar28 * -35.225166606330404);
      dVar14 = dVar14 * 47.6;
      dVar19 = dVar28 * 1.228 + local_1778 * 35.225166606330404;
      dVar25 = local_1948[1] * local_1948[0xc];
      dVar15 = exp(((double)local_17d8._0_8_ + local_14e8) - local_528);
      dVar15 = dVar14 / dVar15;
      dVar18 = dVar14 * (double)local_1728._0_8_ - dVar25 * dVar15;
      dVar19 = dVar19 * dVar14 * (double)local_1728._0_8_ -
               (dVar19 - ((dStack_16e0 + local_1688) - (local_16c8 + dStack_1690)) * dVar28) *
               dVar15 * dVar25;
      local_1888[1] = local_1888[1] + dVar18;
      local_1888[4] = local_1888[4] - dVar18;
      local_1888[0xb] = local_1888[0xb] - dVar18;
      local_1888[0xc] = dVar18 + local_1888[0xc];
      dVar25 = local_1948[0xc] * -dVar15;
      local_13e0[2] = local_13e0[2] + dVar25;
      local_13e0[5] = local_13e0[5] - dVar25;
      local_13e0[0xc] = local_13e0[0xc] - dVar25;
      local_13e0[0xd] = dVar25 + local_13e0[0xd];
      dVar25 = local_1948[0xb] * dVar14;
      local_13e0[0x44] = local_13e0[0x44] + dVar25;
      local_13e0[0x47] = local_13e0[0x47] - dVar25;
      local_13e0[0x4e] = local_13e0[0x4e] - dVar25;
      local_13e0[0x4f] = dVar25 + local_13e0[0x4f];
      dVar14 = dVar14 * local_1948[4];
      local_cf0 = local_cf0 + dVar14;
      local_cd8 = local_cd8 - dVar14;
      dStack_ca0 = dStack_ca0 - dVar14;
      local_c98 = dVar14 + local_c98;
      dVar14 = -dVar15 * local_1948[1];
      local_c40 = local_c40 + dVar14;
      local_c28 = local_c28 - dVar14;
      local_bf0 = local_bf0 - dVar14;
      local_be8 = dVar14 + local_be8;
      local_618[1] = local_618[1] + dVar19;
      local_618[4] = local_618[4] - dVar19;
      local_5c8._8_8_ = (double)local_5c8._8_8_ - dVar19;
      local_5b8 = dVar19 + local_5b8;
      local_17d8._0_8_ = local_1948[4] * local_1948[0xd];
      dVar14 = exp((double)local_1788._0_8_);
      local_1728._0_8_ = local_1948[5] * local_1948[0xb];
      dVar14 = dVar14 * 50000000.0;
      dVar25 = exp((dVar16 - local_14e8) + local_1518);
      dVar25 = dVar14 / dVar25;
      dVar19 = dVar14 * (double)local_17d8._0_8_ - (double)local_1728._0_8_ * dVar25;
      dVar15 = (double)local_17a8._0_8_ * dVar14 * (double)local_17d8._0_8_ -
               ((double)local_17a8._0_8_ -
               ((dStack_16c0 + dStack_1690) - (local_16c8 + dStack_1680)) * dVar28) * dVar25 *
               (double)local_1728._0_8_;
      local_1888[4] = local_1888[4] - dVar19;
      local_1888[5] = local_1888[5] + dVar19;
      local_1888[0xd] = local_1888[0xd] - dVar19;
      local_1888[0xb] = dVar19 + local_1888[0xb];
      dVar19 = local_1948[0xd] * dVar14;
      local_13e0[0x47] = local_13e0[0x47] - dVar19;
      local_13e0[0x48] = local_13e0[0x48] + dVar19;
      local_13e0[0x4e] = local_13e0[0x4e] + dVar19;
      local_13e0[0x50] = local_13e0[0x50] - dVar19;
      dVar19 = local_1948[0xb] * -dVar25;
      local_13e0[0x5d] = local_13e0[0x5d] - dVar19;
      local_13e0[0x5e] = local_13e0[0x5e] + dVar19;
      local_13e0[100] = local_13e0[100] + dVar19;
      local_13e0[0x66] = local_13e0[0x66] - dVar19;
      dVar25 = -dVar25 * local_1948[5];
      local_cd8 = local_cd8 - dVar25;
      local_cd0 = local_cd0 + dVar25;
      dStack_ca0 = dStack_ca0 + dVar25;
      local_c90 = local_c90 - dVar25;
      dVar14 = dVar14 * local_1948[4];
      local_b78 = local_b78 - dVar14;
      local_b70 = local_b70 + dVar14;
      dStack_b40 = dStack_b40 + dVar14;
      local_b30 = local_b30 - dVar14;
      local_618[4] = local_618[4] - dVar15;
      local_618[5] = local_618[5] + dVar15;
      local_5c8._8_8_ = (double)local_5c8._8_8_ + dVar15;
      local_5b0 = local_5b0 - dVar15;
      local_17d8._0_8_ = local_1948[4] * local_1948[0xe];
      dVar14 = exp((double)local_1748._0_8_ * 1.18 + dVar28 * 224.93784961470985);
      dVar14 = dVar14 * 3430.0;
      local_1728._0_8_ = local_1948[5] * local_1948[0xd];
      dVar15 = dVar28 * 1.18 + local_1778 * -224.93784961470985;
      dVar25 = exp((dVar16 - local_1518) + local_1618);
      dVar25 = dVar14 / dVar25;
      dVar19 = dVar14 * (double)local_17d8._0_8_ - (double)local_1728._0_8_ * dVar25;
      dVar18 = dVar15 * dVar14 * (double)local_17d8._0_8_ -
               (dVar15 - ((dStack_16c0 + dStack_1680) - (local_16c8 + local_1678)) * dVar28) *
               dVar25 * (double)local_1728._0_8_;
      local_1888[4] = local_1888[4] - dVar19;
      local_1888[5] = local_1888[5] + dVar19;
      local_1888[0xe] = local_1888[0xe] - dVar19;
      local_1888[0xd] = dVar19 + local_1888[0xd];
      dVar15 = local_1948[0xe] * dVar14;
      local_13e0[0x47] = local_13e0[0x47] - dVar15;
      local_13e0[0x48] = local_13e0[0x48] + dVar15;
      local_13e0[0x50] = local_13e0[0x50] + dVar15;
      local_13e0[0x51] = local_13e0[0x51] - dVar15;
      dVar15 = local_1948[0xd] * -dVar25;
      local_13e0[0x5d] = local_13e0[0x5d] - dVar15;
      local_13e0[0x5e] = local_13e0[0x5e] + dVar15;
      local_13e0[0x66] = local_13e0[0x66] + dVar15;
      local_13e0[0x67] = local_13e0[0x67] - dVar15;
      dVar25 = -dVar25 * local_1948[5];
      local_b78 = local_b78 - dVar25;
      local_b70 = local_b70 + dVar25;
      local_b30 = local_b30 + dVar25;
      local_b28 = local_b28 - dVar25;
      dVar14 = dVar14 * local_1948[4];
      local_ac8 = local_ac8 - dVar14;
      local_ac0 = local_ac0 + dVar14;
      local_a80 = local_a80 + dVar14;
      local_a78 = local_a78 - dVar14;
      local_618[4] = local_618[4] - dVar18;
      local_618[5] = local_618[5] + dVar18;
      local_5b0 = local_5b0 + dVar18;
      local_5a8 = local_5a8 - dVar18;
      local_17d8._0_8_ = local_1948[4] * local_1948[0x12];
      dVar14 = exp((double)local_1748._0_8_ * 2.12 + dVar28 * -437.79849925010643);
      dVar14 = dVar14 * 3.54;
      dVar15 = dVar28 * 2.12 + local_1778 * 437.79849925010643;
      local_1728._0_8_ = local_1948[5] * local_1948[0x11];
      dVar25 = exp((dVar16 - local_538) + local_518);
      dVar25 = dVar14 / dVar25;
      dVar16 = dVar14 * (double)local_17d8._0_8_ - (double)local_1728._0_8_ * dVar25;
      dVar19 = dVar15 * dVar14 * (double)local_17d8._0_8_ -
               (dVar15 - ((dStack_16c0 + dStack_1660) - (local_16c8 + local_1658)) * dVar28) *
               dVar25 * (double)local_1728._0_8_;
      local_1888[4] = local_1888[4] - dVar16;
      local_1888[5] = local_1888[5] + dVar16;
      local_1888[0x12] = local_1888[0x12] - dVar16;
      local_1888[0x11] = dVar16 + local_1888[0x11];
      dVar15 = local_1948[0x12] * dVar14;
      local_13e0[0x47] = local_13e0[0x47] - dVar15;
      local_13e0[0x48] = local_13e0[0x48] + dVar15;
      local_13e0[0x54] = local_13e0[0x54] + dVar15;
      local_13e0[0x55] = local_13e0[0x55] - dVar15;
      dVar15 = local_1948[0x11] * -dVar25;
      local_13e0[0x5d] = local_13e0[0x5d] - dVar15;
      local_13e0[0x5e] = local_13e0[0x5e] + dVar15;
      local_13e0[0x6a] = local_13e0[0x6a] + dVar15;
      local_13e0[0x6b] = local_13e0[0x6b] - dVar15;
      dVar25 = -dVar25 * local_1948[5];
      local_8b8 = local_8b8 - dVar25;
      local_8b0 = local_8b0 + dVar25;
      local_850 = local_850 + dVar25;
      local_848 = local_848 - dVar25;
      dVar14 = dVar14 * local_1948[4];
      local_808 = local_808 - dVar14;
      local_800 = local_800 + dVar14;
      local_7a0 = local_7a0 + dVar14;
      local_798 = local_798 - dVar14;
      local_618[4] = local_618[4] - dVar19;
      local_618[5] = local_618[5] + dVar19;
      local_590 = local_590 + dVar19;
      local_588 = local_588 - dVar19;
      local_17d8._0_8_ = local_1948[6] * local_1948[7];
      dVar14 = exp((double)local_1788._0_8_);
      dVar14 = dVar14 * 20000000.0;
      local_1728._0_8_ = local_1948[4] * local_1948[0xe];
      dVar16 = (double)local_1718._0_8_ - (double)local_1898._0_8_;
      dVar25 = exp(((double)local_14b8._0_8_ + dVar16) - local_1618);
      dVar25 = dVar14 / dVar25;
      dVar19 = dVar14 * (double)local_17d8._0_8_ - (double)local_1728._0_8_ * dVar25;
      dVar15 = (double)local_17a8._0_8_ * dVar14 * (double)local_17d8._0_8_ -
               ((double)local_17a8._0_8_ -
               ((local_16c8 + local_1678) - (local_16b8 + dStack_16b0)) * dVar28) * dVar25 *
               (double)local_1728._0_8_;
      local_1888[4] = local_1888[4] + dVar19;
      local_1888[6] = local_1888[6] - dVar19;
      local_1888[7] = local_1888[7] - dVar19;
      local_1888[0xe] = dVar19 + local_1888[0xe];
      dVar19 = local_1948[0xe] * -dVar25;
      local_13e0[0x47] = local_13e0[0x47] + dVar19;
      local_13e0[0x49] = local_13e0[0x49] - dVar19;
      local_13e0[0x4a] = local_13e0[0x4a] - dVar19;
      local_13e0[0x51] = dVar19 + local_13e0[0x51];
      dVar19 = local_1948[7] * dVar14;
      dStack_1038 = dStack_1038 - dVar19;
      dStack_1030 = dStack_1030 - dVar19;
      local_ff8 = dVar19 + local_ff8;
      dVar14 = dVar14 * local_1948[6];
      local_f98 = local_f98 + dVar14;
      local_f88 = local_f88 - dVar14;
      dStack_f80 = dStack_f80 - dVar14;
      local_f48 = dVar14 + local_f48;
      dVar14 = -dVar25 * local_1948[4];
      local_ac8 = local_ac8 + dVar14;
      local_ab8 = local_ab8 - dVar14;
      dStack_ab0 = dStack_ab0 - dVar14;
      local_a78 = dVar14 + local_a78;
      local_618[4] = local_618[4] + dVar15;
      local_618[6] = local_618[6] - dVar15;
      local_618[7] = local_618[7] - dVar15;
      local_5a8 = dVar15 + local_5a8;
      local_17d8._0_8_ = local_1948[6] * local_1948[9];
      local_1050._8_8_ = (double)local_1050._8_8_ + dVar19;
      dVar14 = exp((double)local_1788._0_8_);
      local_1728._0_8_ = local_1948[3] * local_1948[10];
      dVar14 = dVar14 * 1000000.0;
      dVar25 = exp((((double)local_1718._0_8_ - (double)local_1628._0_8_) + (double)local_1638._0_8_
                   ) - local_548);
      dVar25 = dVar14 / dVar25;
      dVar19 = dVar14 * (double)local_17d8._0_8_ - (double)local_1728._0_8_ * dVar25;
      dVar15 = (double)local_17a8._0_8_ * dVar14 * (double)local_17d8._0_8_ -
               ((double)local_17a8._0_8_ -
               ((dStack_16d0 + local_1698) - (local_16b8 + dStack_16a0)) * dVar28) * dVar25 *
               (double)local_1728._0_8_;
      local_1888[3] = local_1888[3] + dVar19;
      local_1888[6] = local_1888[6] - dVar19;
      local_1888[9] = local_1888[9] - dVar19;
      local_1888[10] = dVar19 + local_1888[10];
      dVar19 = local_1948[10] * -dVar25;
      local_13e0[0x30] = local_13e0[0x30] + dVar19;
      local_13e0[0x33] = local_13e0[0x33] - dVar19;
      local_13e0[0x36] = local_13e0[0x36] - dVar19;
      local_13e0[0x37] = dVar19 + local_13e0[0x37];
      dVar19 = local_1948[9] * dVar14;
      local_1050._0_8_ = (double)local_1050._0_8_ + dVar19;
      dStack_1038 = dStack_1038 - dVar19;
      local_1020 = local_1020 - dVar19;
      local_1018 = dVar19 + local_1018;
      dVar14 = dVar14 * local_1948[6];
      local_e40 = local_e40 + dVar14;
      local_e28 = local_e28 - dVar14;
      dStack_e10 = dStack_e10 - dVar14;
      local_e08 = dVar14 + local_e08;
      dVar14 = -dVar25 * local_1948[3];
      local_d90 = local_d90 + dVar14;
      local_d78 = local_d78 - dVar14;
      local_d60 = local_d60 - dVar14;
      local_d58 = dVar14 + local_d58;
      local_618[3] = local_618[3] + dVar15;
      local_618[6] = local_618[6] - dVar15;
      local_618[9] = local_618[9] - dVar15;
      local_5c8._0_8_ = dVar15 + (double)local_5c8._0_8_;
      local_1718._0_8_ = local_1948[6] * local_1948[9];
      dVar14 = exp((double)local_1788._0_8_);
      local_17d8._0_8_ = local_1948[4] * local_1948[0xf];
      local_1728._0_8_ = dVar14 * 20000000.0;
      dVar14 = exp(((double)local_1638._0_8_ + dVar16) - local_568);
      dVar14 = (double)local_1728._0_8_ / dVar14;
      dVar25 = (double)local_1728._0_8_ * (double)local_1718._0_8_ -
               (double)local_17d8._0_8_ * dVar14;
      local_1888[4] = local_1888[4] + dVar25;
      local_1888[6] = local_1888[6] - dVar25;
      local_1888[9] = local_1888[9] - dVar25;
      local_1888[0xf] = dVar25 + local_1888[0xf];
      dVar25 = (double)local_17a8._0_8_ * (double)local_1728._0_8_ * (double)local_1718._0_8_ -
               ((double)local_17a8._0_8_ -
               ((local_16c8 + dStack_1670) - (local_16b8 + dStack_16a0)) * dVar28) * dVar14 *
               (double)local_17d8._0_8_;
      dVar15 = local_1948[0xf] * -dVar14;
      local_13e0[0x47] = local_13e0[0x47] + dVar15;
      local_13e0[0x49] = local_13e0[0x49] - dVar15;
      local_13e0[0x4c] = local_13e0[0x4c] - dVar15;
      local_13e0[0x52] = dVar15 + local_13e0[0x52];
      dVar15 = local_1948[9] * (double)local_1728._0_8_;
      local_1050._8_8_ = (double)local_1050._8_8_ + dVar15;
      dStack_1038 = dStack_1038 - dVar15;
      local_1020 = local_1020 - dVar15;
      local_ff0 = dVar15 + local_ff0;
      dVar15 = (double)local_1728._0_8_ * local_1948[6];
      local_e38 = local_e38 + dVar15;
      local_e28 = local_e28 - dVar15;
      dStack_e10 = dStack_e10 - dVar15;
      local_de0 = dVar15 + local_de0;
      dVar14 = -dVar14 * local_1948[4];
      local_a18 = local_a18 + dVar14;
      local_a08 = local_a08 - dVar14;
      local_9f0 = local_9f0 - dVar14;
      local_9c0 = dVar14 + local_9c0;
      local_618[4] = local_618[4] + dVar25;
      local_618[6] = local_618[6] - dVar25;
      local_618[9] = local_618[9] - dVar25;
      local_5a0 = dVar25 + local_5a0;
      local_1718._0_8_ = local_1948[6] * local_1948[0xb];
      dVar14 = exp(dVar28 * -11875.913312991392 + local_1738);
      dVar14 = dVar14 * 150000000.0;
      local_1728._8_4_ = (int)uStack_1770;
      local_1728._0_8_ = local_1778 * 11875.913312991392 + (double)local_1768._0_8_;
      local_1728._12_4_ = (int)((ulong)uStack_1770 >> 0x20);
      local_17d8._0_8_ = local_1948[4] * local_1948[0xc];
      dVar25 = exp((dVar16 + local_14e8) - local_528);
      dVar25 = dVar14 / dVar25;
      dVar15 = dVar14 * (double)local_1718._0_8_ - (double)local_17d8._0_8_ * dVar25;
      local_1888[4] = local_1888[4] + dVar15;
      local_1888[6] = local_1888[6] - dVar15;
      local_1888[0xb] = local_1888[0xb] - dVar15;
      local_1888[0xc] = dVar15 + local_1888[0xc];
      dVar16 = (double)local_1728._0_8_ * dVar14 * (double)local_1718._0_8_ -
               ((double)local_1728._0_8_ -
               ((local_16c8 + local_1688) - (local_16b8 + dStack_1690)) * dVar28) * dVar25 *
               (double)local_17d8._0_8_;
      dVar15 = local_1948[0xc] * -dVar25;
      local_13e0[0x47] = local_13e0[0x47] + dVar15;
      local_13e0[0x49] = local_13e0[0x49] - dVar15;
      local_13e0[0x4e] = local_13e0[0x4e] - dVar15;
      local_13e0[0x4f] = dVar15 + local_13e0[0x4f];
      dVar15 = local_1948[0xb] * dVar14;
      local_1050._8_8_ = (double)local_1050._8_8_ + dVar15;
      dStack_1038 = dStack_1038 - dVar15;
      local_1010 = local_1010 - dVar15;
      local_1008 = dVar15 + local_1008;
      dVar14 = dVar14 * local_1948[6];
      local_cd8 = local_cd8 + dVar14;
      local_cc8 = local_cc8 - dVar14;
      dStack_ca0 = dStack_ca0 - dVar14;
      local_c98 = dVar14 + local_c98;
      dVar14 = -dVar25 * local_1948[4];
      local_c28 = local_c28 + dVar14;
      local_c18 = local_c18 - dVar14;
      local_bf0 = local_bf0 - dVar14;
      local_be8 = dVar14 + local_be8;
      local_618[4] = local_618[4] + dVar16;
      local_618[6] = local_618[6] - dVar16;
      local_5c8._8_8_ = (double)local_5c8._8_8_ - dVar16;
      local_5b8 = dVar16 + local_5b8;
      dVar14 = local_1948[3] * local_1948[7];
      dVar25 = exp(dVar28 * -754.82499870708 + local_1738);
      dVar25 = dVar25 * 13200000.0;
      local_1728._8_4_ = (int)uStack_1770;
      local_1728._0_8_ = local_1778 * 754.82499870708 + (double)local_1768._0_8_;
      local_1728._12_4_ = (int)((ulong)uStack_1770 >> 0x20);
      local_1718._0_8_ = local_1948[4] * local_1948[0xd];
      local_17d8._0_8_ = (double)local_1628._0_8_ - (double)local_1898._0_8_;
      dVar15 = exp(((double)local_14b8._0_8_ + ((double)local_1628._0_8_ - (double)local_1898._0_8_)
                   ) - local_1518);
      dVar15 = dVar25 / dVar15;
      dVar16 = dVar25 * dVar14 - (double)local_1718._0_8_ * dVar15;
      local_1888[3] = local_1888[3] - dVar16;
      local_1888[4] = local_1888[4] + dVar16;
      local_1888[7] = local_1888[7] - dVar16;
      local_1888[0xd] = dVar16 + local_1888[0xd];
      dVar16 = (double)local_1728._0_8_ * dVar25 * dVar14 -
               ((double)local_1728._0_8_ -
               ((local_16c8 + dStack_1680) - (dStack_16d0 + dStack_16b0)) * dVar28) * dVar15 *
               (double)local_1718._0_8_;
      dVar14 = local_1948[7] * dVar25;
      local_13e0[0x30] = local_13e0[0x30] - dVar14;
      local_13e0[0x31] = local_13e0[0x31] + dVar14;
      local_13e0[0x34] = local_13e0[0x34] - dVar14;
      local_13e0[0x3a] = dVar14 + local_13e0[0x3a];
      dVar14 = local_1948[0xd] * -dVar15;
      local_13e0[0x46] = local_13e0[0x46] - dVar14;
      local_13e0[0x47] = local_13e0[0x47] + dVar14;
      local_13e0[0x4a] = local_13e0[0x4a] - dVar14;
      local_13e0[0x50] = dVar14 + local_13e0[0x50];
      dVar25 = dVar25 * local_1948[3];
      local_fa0 = local_fa0 - dVar25;
      local_f98 = local_f98 + dVar25;
      dStack_f80 = dStack_f80 - dVar25;
      local_f50 = dVar25 + local_f50;
      dVar14 = -dVar15 * local_1948[4];
      local_b80 = local_b80 - dVar14;
      local_b78 = local_b78 + dVar14;
      local_b60 = local_b60 - dVar14;
      local_b30 = dVar14 + local_b30;
      local_618[3] = local_618[3] - dVar16;
      local_618[4] = local_618[4] + dVar16;
      local_618[7] = local_618[7] - dVar16;
      local_5b0 = dVar16 + local_5b0;
      dVar14 = local_1948[0] * local_1948[7];
      dVar25 = exp(dVar28 * -3638.256493768126 + (double)local_17b8._0_8_);
      dVar25 = dVar25 * 0.5;
      local_1718._0_8_ = local_1948[1] * local_1948[9];
      local_1728._8_4_ = (int)uStack_1770;
      local_1728._0_8_ = local_1778 * 3638.256493768126 + (double)local_14d8._0_8_;
      local_1728._12_4_ = (int)((ulong)uStack_1770 >> 0x20);
      dVar15 = exp(((double)local_14b8._0_8_ + (double)local_16f8._0_8_) - (double)local_1638._0_8_)
      ;
      dVar15 = dVar25 / dVar15;
      dVar16 = dVar25 * dVar14 - (double)local_1718._0_8_ * dVar15;
      dVar19 = (double)local_1728._0_8_ * dVar25 * dVar14 -
               ((double)local_1728._0_8_ -
               ((dStack_16e0 + dStack_16a0) - (local_16e8 + dStack_16b0)) * dVar28) * dVar15 *
               (double)local_1718._0_8_;
      local_1888[0] = local_1888[0] - dVar16;
      local_1888[1] = local_1888[1] + dVar16;
      local_1888[7] = local_1888[7] - dVar16;
      local_1888[9] = dVar16 + local_1888[9];
      dVar14 = local_1948[7] * dVar25;
      local_1488[0] = local_1488[0] - dVar14;
      local_1488[1] = local_1488[1] + dVar14;
      local_1450 = local_1450 - dVar14;
      local_1440 = dVar14 + local_1440;
      dVar14 = local_1948[9] * -dVar15;
      local_13e0[1] = local_13e0[1] - dVar14;
      local_13e0[2] = local_13e0[2] + dVar14;
      local_13e0[8] = local_13e0[8] - dVar14;
      local_13e0[10] = dVar14 + local_13e0[10];
      dVar25 = dVar25 * local_1948[0];
      local_fb8 = local_fb8 - dVar25;
      local_fb0 = local_fb0 + dVar25;
      dStack_f80 = dStack_f80 - dVar25;
      local_f70 = dVar25 + local_f70;
      dVar14 = -dVar15 * local_1948[1];
      local_e58 = local_e58 - dVar14;
      local_e50 = local_e50 + dVar14;
      local_e20 = local_e20 - dVar14;
      dStack_e10 = dVar14 + dStack_e10;
      local_618[0] = local_618[0] - dVar19;
      local_618[1] = local_618[1] + dVar19;
      local_618[7] = local_618[7] - dVar19;
      local_618[9] = dVar19 + local_618[9];
      dVar14 = local_1948[7] * local_1948[9];
      dVar25 = exp((double)local_1788._0_8_);
      local_1718._0_8_ = local_1948[1] * local_1948[0x10];
      local_1728._0_8_ = dVar25 * 40000000.0;
      dVar25 = exp((((double)local_14b8._0_8_ - local_1758) + (double)local_1638._0_8_) - local_508)
      ;
      dVar25 = (double)local_1728._0_8_ / dVar25;
      dVar15 = (double)local_1728._0_8_ * dVar14 - (double)local_1718._0_8_ * dVar25;
      local_1888[1] = local_1888[1] + dVar15;
      local_1888[7] = local_1888[7] - dVar15;
      local_1888[9] = local_1888[9] - dVar15;
      local_1888[0x10] = dVar15 + local_1888[0x10];
      dVar14 = (double)local_17a8._0_8_ * (double)local_1728._0_8_ * dVar14 -
               ((double)local_17a8._0_8_ -
               ((dStack_16e0 + local_1668) - (dStack_16b0 + dStack_16a0)) * dVar28) * dVar25 *
               (double)local_1718._0_8_;
      dVar15 = local_1948[0x10] * -dVar25;
      local_13e0[2] = local_13e0[2] + dVar15;
      local_13e0[8] = local_13e0[8] - dVar15;
      local_13e0[10] = local_13e0[10] - dVar15;
      local_13e0[0x11] = dVar15 + local_13e0[0x11];
      dVar15 = local_1948[9] * (double)local_1728._0_8_;
      local_fb0 = local_fb0 + dVar15;
      dStack_f80 = dStack_f80 - dVar15;
      local_f70 = local_f70 - dVar15;
      local_f38 = dVar15 + local_f38;
      dVar15 = (double)local_1728._0_8_ * local_1948[7];
      local_e50 = local_e50 + dVar15;
      local_e20 = local_e20 - dVar15;
      dStack_e10 = dStack_e10 - dVar15;
      local_dd8 = dVar15 + local_dd8;
      dVar25 = -dVar25 * local_1948[1];
      local_980 = local_980 + dVar25;
      local_950 = local_950 - dVar25;
      dStack_940 = dStack_940 - dVar25;
      local_908 = dVar25 + local_908;
      local_618[1] = local_618[1] + dVar14;
      local_618[7] = local_618[7] - dVar14;
      local_618[9] = local_618[9] - dVar14;
      local_598 = dVar14 + local_598;
      dVar15 = local_1948[7] * local_1948[10];
      dVar14 = exp(dVar28 * -4161.601826205035 + (double)local_17b8._0_8_);
      dVar14 = dVar14 * 2.46;
      local_1718._8_4_ = (int)uStack_1770;
      local_1718._0_8_ = local_1778 * 4161.601826205035 + (double)local_14d8._0_8_;
      local_1718._12_4_ = (int)((ulong)uStack_1770 >> 0x20);
      local_17b8._0_8_ = local_1948[9] * local_1948[9];
      local_1728._0_8_ = (double)local_1638._0_8_ * -2.0;
      dVar25 = exp((double)local_1638._0_8_ * -2.0 + (double)local_14b8._0_8_ + local_548);
      dVar25 = dVar14 / dVar25;
      dVar16 = dVar14 * dVar15 - (double)local_17b8._0_8_ * dVar25;
      dVar19 = (double)local_1718._0_8_ * dVar14 * dVar15 -
               ((double)local_1718._0_8_ -
               ((dStack_16a0 + dStack_16a0) - (dStack_16b0 + local_1698)) * dVar28) * dVar25 *
               (double)local_17b8._0_8_;
      local_1888[7] = local_1888[7] - dVar16;
      local_1888[10] = local_1888[10] - dVar16;
      local_1888[9] = dVar16 + dVar16 + local_1888[9];
      dVar15 = local_1948[10] * dVar14;
      dStack_f80 = dStack_f80 - dVar15;
      local_f68 = local_f68 - dVar15;
      local_f70 = dVar15 + dVar15 + local_f70;
      dVar25 = dVar25 * -2.0 * local_1948[9];
      local_e20 = local_e20 - dVar25;
      dStack_e10 = dVar25 + dVar25 + dStack_e10;
      local_e08 = local_e08 - dVar25;
      dVar14 = dVar14 * local_1948[7];
      local_d70 = local_d70 - dVar14;
      local_d60 = dVar14 + dVar14 + local_d60;
      local_d58 = local_d58 - dVar14;
      local_618[7] = local_618[7] - dVar19;
      local_618[9] = dVar19 + dVar19 + local_618[9];
      local_5c8._0_8_ = (double)local_5c8._0_8_ - dVar19;
      dVar14 = dVar28 * -301.929999482832 + local_1738;
      local_17b8._8_8_ = 0;
      local_17b8._0_8_ = dVar14;
      local_14d8._0_8_ = local_1948[8] * local_1948[0x13];
      dVar14 = exp(dVar14);
      dVar14 = dVar14 * 15000000.0;
      local_1718._8_4_ = (int)uStack_1770;
      local_1718._0_8_ = local_1778 * 301.929999482832 + (double)local_1768._0_8_;
      local_1718._12_4_ = (int)((ulong)uStack_1770 >> 0x20);
      dVar25 = local_1948[7] * local_1948[0x13];
      dVar15 = local_1528 - (double)local_14b8._0_8_;
      dVar16 = exp((dVar15 + local_4d8) - local_4d8);
      dVar16 = dVar14 / dVar16;
      dVar19 = dVar14 * (double)local_14d8._0_8_ - dVar25 * dVar16;
      dVar25 = (double)local_1718._0_8_ * dVar14 * (double)local_14d8._0_8_ -
               ((double)local_1718._0_8_ -
               ((dStack_1650 + dStack_16b0) - (local_16a8 + dStack_1650)) * dVar28) * dVar16 *
               dVar25;
      local_1888[7] = local_1888[7] + dVar19;
      local_1888[8] = local_1888[8] - dVar19;
      dStack_f80 = dStack_f80 + -dVar16 * local_1948[0x13];
      local_f78 = local_f78 - -dVar16 * local_1948[0x13];
      local_ec8 = local_ec8 - local_1948[0x13] * dVar14;
      local_ed0 = local_1948[0x13] * dVar14 + local_ed0;
      dVar14 = dVar14 * local_1948[8] - dVar16 * local_1948[7];
      local_740 = local_740 + dVar14;
      local_738 = local_738 - dVar14;
      local_618[7] = local_618[7] + dVar25;
      local_618[8] = local_618[8] - dVar25;
      local_14d8._0_8_ = local_1948[8] * local_1948[0x14];
      local_4d8 = exp((double)local_17b8._0_8_);
      local_4d8 = local_4d8 * 9000000.0;
      local_17b8._0_8_ = local_1948[7] * local_1948[0x14];
      dVar14 = exp((dVar15 + (double)local_14a8._0_8_) - (double)local_14a8._0_8_);
      dVar14 = local_4d8 / dVar14;
      dVar25 = local_4d8 * (double)local_14d8._0_8_ - (double)local_17b8._0_8_ * dVar14;
      dVar16 = (double)local_1718._0_8_ * local_4d8 * (double)local_14d8._0_8_ -
               ((double)local_1718._0_8_ -
               ((local_1648 + dStack_16b0) - (local_16a8 + local_1648)) * dVar28) * dVar14 *
               (double)local_17b8._0_8_;
      local_1888[7] = local_1888[7] + dVar25;
      local_1888[8] = local_1888[8] - dVar25;
      dStack_f80 = dStack_f80 + -dVar14 * local_1948[0x14];
      local_f78 = local_f78 - -dVar14 * local_1948[0x14];
      local_ec8 = local_ec8 - local_1948[0x14] * local_4d8;
      local_ed0 = local_1948[0x14] * local_4d8 + local_ed0;
      dVar14 = local_4d8 * local_1948[8] - dVar14 * local_1948[7];
      local_690 = local_690 + dVar14;
      local_688 = local_688 - dVar14;
      local_618[7] = local_618[7] + dVar16;
      local_618[8] = local_618[8] - dVar16;
      local_1718._0_8_ = local_1948[3] * local_1948[8];
      dVar14 = exp((double)local_1788._0_8_);
      local_17b8._0_8_ = dVar14 * 28000000.0;
      local_14a8._0_8_ = local_1948[1] * local_1948[4] * local_1948[0xb];
      dVar14 = exp(((((double)local_1628._0_8_ - local_1758) - (double)local_1898._0_8_) +
                   local_1528) - local_14e8);
      dVar14 = (double)local_17b8._0_8_ / (local_1490 * dVar14);
      dVar25 = -dVar14;
      dVar16 = (double)local_17b8._0_8_ * (double)local_1718._0_8_ -
               (double)local_14a8._0_8_ * dVar14;
      local_1888[1] = local_1888[1] + dVar16;
      local_1888[3] = local_1888[3] - dVar16;
      local_1888[4] = local_1888[4] + dVar16;
      local_1888[8] = local_1888[8] - dVar16;
      local_1888[0xb] = dVar16 + local_1888[0xb];
      dVar16 = local_1948[4] * dVar25 * local_1948[0xb];
      local_13e0[2] = local_13e0[2] + dVar16;
      local_13e0[4] = local_13e0[4] - dVar16;
      local_13e0[5] = local_13e0[5] + dVar16;
      local_13e0[9] = local_13e0[9] - dVar16;
      local_13e0[0xc] = dVar16 + local_13e0[0xc];
      dVar16 = local_1948[8] * (double)local_17b8._0_8_;
      local_13e0[0x2e] = local_13e0[0x2e] + dVar16;
      local_13e0[0x30] = local_13e0[0x30] - dVar16;
      local_13e0[0x31] = local_13e0[0x31] + dVar16;
      local_13e0[0x35] = local_13e0[0x35] - dVar16;
      local_13e0[0x38] = dVar16 + local_13e0[0x38];
      dVar16 = local_1948[1] * dVar25 * local_1948[0xb];
      local_13e0[0x44] = local_13e0[0x44] + dVar16;
      local_13e0[0x46] = local_13e0[0x46] - dVar16;
      local_13e0[0x47] = local_13e0[0x47] + dVar16;
      local_13e0[0x4b] = local_13e0[0x4b] - dVar16;
      local_13e0[0x4e] = dVar16 + local_13e0[0x4e];
      dVar16 = (double)local_17b8._0_8_ * local_1948[3];
      local_f00 = local_f00 + dVar16;
      local_ef0 = local_ef0 - dVar16;
      local_ee8 = local_ee8 + dVar16;
      local_ec8 = local_ec8 - dVar16;
      local_eb0 = dVar16 + local_eb0;
      dVar14 = (double)local_17a8._0_8_ * (double)local_17b8._0_8_ * (double)local_1718._0_8_ -
               ((double)local_17a8._0_8_ -
               (((dStack_16e0 + local_16c8 + dStack_1690) - (dStack_16d0 + local_16a8)) + -1.0) *
               dVar28) * dVar14 * (double)local_14a8._0_8_;
      dVar25 = dVar25 * local_1948[1] * local_1948[4];
      local_cf0 = local_cf0 + dVar25;
      local_ce0 = local_ce0 - dVar25;
      local_cd8 = local_cd8 + dVar25;
      local_cb8 = local_cb8 - dVar25;
      dStack_ca0 = dVar25 + dStack_ca0;
      local_618[1] = local_618[1] + dVar14;
      local_618[3] = local_618[3] - dVar14;
      local_618[4] = local_618[4] + dVar14;
      local_618[8] = local_618[8] - dVar14;
      local_5c8._8_8_ = dVar14 + (double)local_5c8._8_8_;
      local_1898._0_8_ = local_1948[3] * local_1948[8];
      local_1490 = exp((double)local_1788._0_8_);
      local_1718._0_8_ = local_1948[5] * local_1948[0xb];
      local_1490 = local_1490 * 12000000.0;
      dVar14 = exp((((double)local_1628._0_8_ - (double)local_1538._0_8_) + local_1528) - local_14e8
                  );
      dVar14 = local_1490 / dVar14;
      dVar16 = local_1490 * (double)local_1898._0_8_ - (double)local_1718._0_8_ * dVar14;
      dVar25 = (double)local_17a8._0_8_ * local_1490 * (double)local_1898._0_8_ -
               ((double)local_17a8._0_8_ -
               ((dStack_16c0 + dStack_1690) - (dStack_16d0 + local_16a8)) * dVar28) * dVar14 *
               (double)local_1718._0_8_;
      local_1888[3] = local_1888[3] - dVar16;
      local_1888[5] = local_1888[5] + dVar16;
      local_1888[8] = local_1888[8] - dVar16;
      local_1888[0xb] = dVar16 + local_1888[0xb];
      dVar16 = local_1948[8] * local_1490;
      local_13e0[0x30] = local_13e0[0x30] - dVar16;
      local_13e0[0x32] = local_13e0[0x32] + dVar16;
      local_13e0[0x35] = local_13e0[0x35] - dVar16;
      local_13e0[0x38] = dVar16 + local_13e0[0x38];
      dVar16 = local_1948[0xb] * -dVar14;
      local_13e0[0x5c] = local_13e0[0x5c] - dVar16;
      local_13e0[0x5e] = local_13e0[0x5e] + dVar16;
      local_13e0[0x61] = local_13e0[0x61] - dVar16;
      local_13e0[100] = dVar16 + local_13e0[100];
      dVar16 = local_1490 * local_1948[3];
      local_ef0 = local_ef0 - dVar16;
      local_ee0 = local_ee0 + dVar16;
      local_ec8 = local_ec8 - dVar16;
      local_eb0 = dVar16 + local_eb0;
      dVar14 = -dVar14 * local_1948[5];
      local_ce0 = local_ce0 - dVar14;
      local_cd0 = local_cd0 + dVar14;
      local_cb8 = local_cb8 - dVar14;
      dStack_ca0 = dVar14 + dStack_ca0;
      local_618[3] = local_618[3] - dVar25;
      local_618[5] = local_618[5] + dVar25;
      local_618[8] = local_618[8] - dVar25;
      local_5c8._8_8_ = dVar25 + (double)local_5c8._8_8_;
      local_1898._0_8_ = local_1948[0] * local_1948[8];
      local_1718._0_8_ = exp((double)local_1788._0_8_);
      local_1718._0_8_ = (double)local_1718._0_8_ * 70000000.0;
      local_1628._0_8_ = local_1948[1] * local_1948[9];
      dVar14 = exp(((double)local_16f8._0_8_ + local_1528) - (double)local_1638._0_8_);
      dVar14 = (double)local_1718._0_8_ / dVar14;
      dVar16 = (double)local_1718._0_8_ * (double)local_1898._0_8_ -
               (double)local_1628._0_8_ * dVar14;
      dVar25 = (double)local_17a8._0_8_ * (double)local_1718._0_8_ * (double)local_1898._0_8_ -
               ((double)local_17a8._0_8_ -
               ((dStack_16e0 + dStack_16a0) - (local_16e8 + local_16a8)) * dVar28) * dVar14 *
               (double)local_1628._0_8_;
      local_1888[0] = local_1888[0] - dVar16;
      local_1888[1] = local_1888[1] + dVar16;
      local_1888[8] = local_1888[8] - dVar16;
      local_1888[9] = dVar16 + local_1888[9];
      dVar16 = local_1948[8] * (double)local_1718._0_8_;
      local_1488[0] = local_1488[0] - dVar16;
      local_1488[1] = local_1488[1] + dVar16;
      local_1448 = local_1448 - dVar16;
      local_1440 = dVar16 + local_1440;
      dVar16 = local_1948[9] * -dVar14;
      local_13e0[1] = local_13e0[1] - dVar16;
      local_13e0[2] = local_13e0[2] + dVar16;
      local_13e0[9] = local_13e0[9] - dVar16;
      local_13e0[10] = dVar16 + local_13e0[10];
      dVar16 = (double)local_1718._0_8_ * local_1948[0];
      local_f08 = local_f08 - dVar16;
      local_f00 = local_f00 + dVar16;
      local_ec8 = local_ec8 - dVar16;
      dStack_ec0 = dVar16 + dStack_ec0;
      dVar14 = -dVar14 * local_1948[1];
      local_e58 = local_e58 - dVar14;
      local_e50 = local_e50 + dVar14;
      local_e18 = local_e18 - dVar14;
      dStack_e10 = dVar14 + dStack_e10;
      local_618[0] = local_618[0] - dVar25;
      local_618[1] = local_618[1] + dVar25;
      local_618[8] = local_618[8] - dVar25;
      local_618[9] = dVar25 + local_618[9];
      local_1898._0_8_ = local_1948[5] * local_1948[8];
      local_1718._0_8_ = exp((double)local_1788._0_8_);
      local_1628._0_8_ = local_1948[5] * local_1948[7];
      local_1718._0_8_ = (double)local_1718._0_8_ * 30000000.0;
      dVar14 = exp((((double)local_1538._0_8_ - (double)local_1538._0_8_) - (double)local_14b8._0_8_
                   ) + local_1528);
      dVar14 = (double)local_1718._0_8_ / dVar14;
      dVar16 = (double)local_1718._0_8_ * (double)local_1898._0_8_ -
               (double)local_1628._0_8_ * dVar14;
      dVar25 = (double)local_17a8._0_8_ * (double)local_1718._0_8_ * (double)local_1898._0_8_ -
               ((double)local_17a8._0_8_ -
               ((dStack_16c0 + dStack_16b0) - (local_16a8 + dStack_16c0)) * dVar28) * dVar14 *
               (double)local_1628._0_8_;
      local_1888[7] = local_1888[7] + dVar16;
      local_1888[8] = local_1888[8] - dVar16;
      dVar16 = local_1948[8] * (double)local_1718._0_8_ - dVar14 * local_1948[7];
      local_13e0[0x60] = local_13e0[0x60] + dVar16;
      local_13e0[0x61] = local_13e0[0x61] - dVar16;
      dStack_f80 = dStack_f80 + -dVar14 * local_1948[5];
      local_f78 = local_f78 - -dVar14 * local_1948[5];
      local_ed0 = local_ed0 + (double)local_1718._0_8_ * local_1948[5];
      local_ec8 = local_ec8 - (double)local_1718._0_8_ * local_1948[5];
      local_618[7] = local_618[7] + dVar25;
      local_618[8] = local_618[8] - dVar25;
      dVar14 = dVar28 * 286.8334995086904 + local_1738;
      local_1628._8_8_ = 0;
      local_1628._0_8_ = dVar14;
      local_14b8._0_8_ = local_1948[8] * local_1948[9];
      dVar14 = exp(dVar14);
      local_1538._8_4_ = extraout_XMM0_Dc_06;
      local_1538._0_8_ = dVar14 * 12000000.0;
      local_1538._12_4_ = extraout_XMM0_Dd_06;
      local_1898._8_4_ = (int)uStack_1770;
      local_1898._0_8_ = local_1778 * -286.8334995086904 + (double)local_1768._0_8_;
      local_1898._12_4_ = (int)((ulong)uStack_1770 >> 0x20);
      local_1718._0_8_ = local_1948[1] * local_1948[0x10];
      dVar14 = exp(((local_1528 - local_1758) + (double)local_1638._0_8_) - local_508);
      dVar14 = (double)local_1538._0_8_ / dVar14;
      dVar16 = (double)local_1538._0_8_ * (double)local_14b8._0_8_ -
               (double)local_1718._0_8_ * dVar14;
      dVar25 = (double)local_1898._0_8_ * (double)local_1538._0_8_ * (double)local_14b8._0_8_ -
               ((double)local_1898._0_8_ -
               ((dStack_16e0 + local_1668) - (local_16a8 + dStack_16a0)) * dVar28) * dVar14 *
               (double)local_1718._0_8_;
      local_1888[1] = local_1888[1] + dVar16;
      local_1888[8] = local_1888[8] - dVar16;
      local_1888[9] = local_1888[9] - dVar16;
      local_1888[0x10] = dVar16 + local_1888[0x10];
      dVar16 = local_1948[0x10] * -dVar14;
      local_13e0[2] = local_13e0[2] + dVar16;
      local_13e0[9] = local_13e0[9] - dVar16;
      local_13e0[10] = local_13e0[10] - dVar16;
      local_13e0[0x11] = dVar16 + local_13e0[0x11];
      dVar16 = local_1948[9] * (double)local_1538._0_8_;
      local_f00 = local_f00 + dVar16;
      local_ec8 = local_ec8 - dVar16;
      dStack_ec0 = dStack_ec0 - dVar16;
      local_e88 = dVar16 + local_e88;
      dVar16 = (double)local_1538._0_8_ * local_1948[8];
      local_e50 = local_e50 + dVar16;
      local_e18 = local_e18 - dVar16;
      dStack_e10 = dStack_e10 - dVar16;
      local_dd8 = dVar16 + local_dd8;
      dVar14 = -dVar14 * local_1948[1];
      local_980 = local_980 + dVar14;
      local_948 = local_948 - dVar14;
      dStack_940 = dStack_940 - dVar14;
      local_908 = dVar14 + local_908;
      local_618[1] = local_618[1] + dVar25;
      local_618[8] = local_618[8] - dVar25;
      local_618[9] = local_618[9] - dVar25;
      local_598 = dVar25 + local_598;
      local_1758 = local_1948[8] * local_1948[10];
      dVar14 = exp((double)local_1628._0_8_);
      local_14b8._0_8_ = dVar14 * 16000000.0;
      local_1628._0_8_ = local_1948[9] * local_1948[9];
      dVar14 = exp((double)local_1728._0_8_ + local_1528 + local_548);
      dVar14 = (double)local_14b8._0_8_ / dVar14;
      dVar25 = (double)local_14b8._0_8_ * local_1758 - (double)local_1628._0_8_ * dVar14;
      local_1888[8] = local_1888[8] - dVar25;
      local_1888[10] = local_1888[10] - dVar25;
      local_1888[9] = dVar25 + dVar25 + local_1888[9];
      dVar16 = (double)local_1898._0_8_ * (double)local_14b8._0_8_ * local_1758 -
               ((double)local_1898._0_8_ -
               ((dStack_16a0 + dStack_16a0) - (local_16a8 + local_1698)) * dVar28) * dVar14 *
               (double)local_1628._0_8_;
      dVar25 = local_1948[10] * (double)local_14b8._0_8_;
      local_ec8 = local_ec8 - dVar25;
      local_eb8 = local_eb8 - dVar25;
      dStack_ec0 = dVar25 + dVar25 + dStack_ec0;
      dVar14 = dVar14 * -2.0 * local_1948[9];
      local_e18 = local_e18 - dVar14;
      dStack_e10 = dVar14 + dVar14 + dStack_e10;
      local_e08 = local_e08 - dVar14;
      dVar14 = (double)local_14b8._0_8_ * local_1948[8];
      local_d68 = local_d68 - dVar14;
      local_d60 = dVar14 + dVar14 + local_d60;
      local_d58 = local_d58 - dVar14;
      local_618[8] = local_618[8] - dVar16;
      local_618[9] = dVar16 + dVar16 + local_618[9];
      local_5c8._0_8_ = (double)local_5c8._0_8_ - dVar16;
      local_1758 = local_1948[8] * local_1948[0xb];
      local_1628._0_8_ = exp((double)local_1788._0_8_);
      local_1628._0_8_ = (double)local_1628._0_8_ * 9000000.0;
      local_1898._0_8_ = local_1948[7] * local_1948[0xb];
      dVar14 = exp((local_14e8 + dVar15) - local_14e8);
      dVar14 = (double)local_1628._0_8_ / dVar14;
      dVar16 = (double)local_1628._0_8_ * local_1758 - (double)local_1898._0_8_ * dVar14;
      dVar25 = (double)local_17a8._0_8_ * (double)local_1628._0_8_ * local_1758 -
               ((double)local_17a8._0_8_ -
               ((dStack_1690 + dStack_16b0) - (local_16a8 + dStack_1690)) * dVar28) * dVar14 *
               (double)local_1898._0_8_;
      local_1888[7] = local_1888[7] + dVar16;
      local_1888[8] = local_1888[8] - dVar16;
      dStack_f80 = dStack_f80 + -dVar14 * local_1948[0xb];
      local_f78 = local_f78 - -dVar14 * local_1948[0xb];
      local_ec8 = local_ec8 - local_1948[0xb] * (double)local_1628._0_8_;
      local_ed0 = local_1948[0xb] * (double)local_1628._0_8_ + local_ed0;
      dVar14 = (double)local_1628._0_8_ * local_1948[8] - dVar14 * local_1948[7];
      local_cc0 = local_cc0 + dVar14;
      local_cb8 = local_cb8 - dVar14;
      local_618[7] = local_618[7] + dVar25;
      local_618[8] = local_618[8] - dVar25;
      local_1758 = local_1948[8] * local_1948[0xc];
      dVar14 = exp((double)local_1788._0_8_);
      local_1628._0_8_ = dVar14 * 7000000.0;
      local_1898._0_8_ = local_1948[7] * local_1948[0xc];
      dVar14 = exp((dVar15 + local_528) - local_528);
      dVar14 = (double)local_1628._0_8_ / dVar14;
      dVar15 = (double)local_1628._0_8_ * local_1758 - (double)local_1898._0_8_ * dVar14;
      dVar25 = (double)local_17a8._0_8_ * (double)local_1628._0_8_ * local_1758 -
               ((double)local_17a8._0_8_ -
               ((local_1688 + dStack_16b0) - (local_16a8 + local_1688)) * dVar28) * dVar14 *
               (double)local_1898._0_8_;
      local_1888[7] = local_1888[7] + dVar15;
      local_1888[8] = local_1888[8] - dVar15;
      dStack_f80 = dStack_f80 + -dVar14 * local_1948[0xc];
      local_f78 = local_f78 - -dVar14 * local_1948[0xc];
      local_ec8 = local_ec8 - local_1948[0xc] * (double)local_1628._0_8_;
      local_ed0 = local_1948[0xc] * (double)local_1628._0_8_ + local_ed0;
      dVar14 = (double)local_1628._0_8_ * local_1948[8] - dVar14 * local_1948[7];
      local_c10 = local_c10 + dVar14;
      local_c08 = local_c08 - dVar14;
      local_618[7] = local_618[7] + dVar25;
      local_618[8] = local_618[8] - dVar25;
      local_1758 = local_1948[8] * local_1948[0xc];
      dVar14 = exp((double)local_1788._0_8_);
      dVar25 = local_1948[0xb] * local_1948[0xe];
      local_1898._0_8_ = dVar14 * 14000000.0;
      dVar14 = exp(((local_1528 - local_14e8) + local_528) - local_1618);
      dVar14 = (double)local_1898._0_8_ / dVar14;
      dVar15 = (double)local_1898._0_8_ * local_1758 - dVar25 * dVar14;
      local_1888[8] = local_1888[8] - dVar15;
      local_1888[0xb] = local_1888[0xb] + dVar15;
      local_1888[0xc] = local_1888[0xc] - dVar15;
      local_1888[0xe] = dVar15 + local_1888[0xe];
      dVar25 = (double)local_17a8._0_8_ * (double)local_1898._0_8_ * local_1758 -
               ((double)local_17a8._0_8_ -
               ((dStack_1690 + local_1678) - (local_16a8 + local_1688)) * dVar28) * dVar14 * dVar25;
      dVar15 = local_1948[0xc] * (double)local_1898._0_8_;
      local_ec8 = local_ec8 - dVar15;
      local_eb0 = local_eb0 + dVar15;
      local_ea8 = local_ea8 - dVar15;
      local_e98 = dVar15 + local_e98;
      dVar15 = local_1948[0xe] * -dVar14;
      local_cb8 = local_cb8 - dVar15;
      dStack_ca0 = dStack_ca0 + dVar15;
      local_c98 = local_c98 - dVar15;
      local_c88 = dVar15 + local_c88;
      dVar15 = (double)local_1898._0_8_ * local_1948[8];
      local_c08 = local_c08 - dVar15;
      local_bf0 = local_bf0 + dVar15;
      local_be8 = local_be8 - dVar15;
      local_bd8 = dVar15 + local_bd8;
      dVar14 = -dVar14 * local_1948[0xb];
      local_aa8 = local_aa8 - dVar14;
      local_a90 = local_a90 + dVar14;
      local_a88 = local_a88 - dVar14;
      local_a78 = dVar14 + local_a78;
      local_618[8] = local_618[8] - dVar25;
      local_5c8._8_8_ = (double)local_5c8._8_8_ + dVar25;
      local_5b8 = local_5b8 - dVar25;
      local_5a8 = dVar25 + local_5a8;
      local_1758 = local_1948[3] * local_1948[9];
      local_1528 = exp(dVar28 * -14492.639975175936 + local_1738);
      local_1528 = local_1528 * 26750000.0;
      local_1898._8_4_ = (int)uStack_1770;
      local_1898._0_8_ = local_1778 * 14492.639975175936 + (double)local_1768._0_8_;
      local_1898._12_4_ = (int)((ulong)uStack_1770 >> 0x20);
      dVar14 = local_1948[2] * local_1948[0xf];
      dVar25 = exp((local_1708 + (double)local_1638._0_8_) - local_568);
      dVar25 = local_1528 / dVar25;
      dVar15 = local_1528 * local_1758 - dVar14 * dVar25;
      local_1888[2] = local_1888[2] + dVar15;
      local_1888[3] = local_1888[3] - dVar15;
      local_1888[9] = local_1888[9] - dVar15;
      local_1888[0xf] = dVar15 + local_1888[0xf];
      dVar15 = (double)local_1898._0_8_ * local_1528 * local_1758 -
               ((double)local_1898._0_8_ -
               ((local_16d8 + dStack_1670) - (dStack_16d0 + dStack_16a0)) * dVar28) * dVar25 *
               dVar14;
      dVar14 = local_1948[0xf] * -dVar25;
      local_13e0[0x19] = local_13e0[0x19] + dVar14;
      local_13e0[0x1a] = local_13e0[0x1a] - dVar14;
      local_13e0[0x20] = local_13e0[0x20] - dVar14;
      local_13e0[0x26] = dVar14 + local_13e0[0x26];
      dVar14 = local_1948[9] * local_1528;
      local_13e0[0x2f] = local_13e0[0x2f] + dVar14;
      local_13e0[0x30] = local_13e0[0x30] - dVar14;
      local_13e0[0x36] = local_13e0[0x36] - dVar14;
      local_13e0[0x3c] = dVar14 + local_13e0[0x3c];
      dVar14 = local_1528 * local_1948[3];
      local_e48 = local_e48 + dVar14;
      local_e40 = local_e40 - dVar14;
      dStack_e10 = dStack_e10 - dVar14;
      local_de0 = dVar14 + local_de0;
      dVar14 = -dVar25 * local_1948[2];
      local_a28 = local_a28 + dVar14;
      local_a20 = local_a20 - dVar14;
      local_9f0 = local_9f0 - dVar14;
      local_9c0 = dVar14 + local_9c0;
      local_618[2] = local_618[2] + dVar15;
      local_618[3] = local_618[3] - dVar15;
      local_618[9] = local_618[9] - dVar15;
      local_5a0 = dVar15 + local_5a0;
      local_1758 = local_1948[3] * local_1948[9];
      local_1528 = exp(dVar28 * -4498.756992294197 + local_1738);
      local_1528 = local_1528 * 36000.0;
      local_1898._8_4_ = (int)uStack_1770;
      local_1898._0_8_ = local_1778 * 4498.756992294197 + (double)local_1768._0_8_;
      local_1898._12_4_ = (int)((ulong)uStack_1770 >> 0x20);
      dVar14 = local_1948[4] * local_1948[0xe];
      dVar25 = exp(((double)local_17d8._0_8_ + (double)local_1638._0_8_) - local_1618);
      dVar25 = local_1528 / dVar25;
      dVar15 = local_1528 * local_1758 - dVar14 * dVar25;
      dVar16 = (double)local_1898._0_8_ * local_1528 * local_1758 -
               ((double)local_1898._0_8_ -
               ((local_16c8 + local_1678) - (dStack_16d0 + dStack_16a0)) * dVar28) * dVar25 * dVar14
      ;
      local_1888[3] = local_1888[3] - dVar15;
      local_1888[4] = local_1888[4] + dVar15;
      local_1888[9] = local_1888[9] - dVar15;
      local_1888[0xe] = dVar15 + local_1888[0xe];
      dVar14 = local_1948[9] * local_1528;
      local_13e0[0x30] = local_13e0[0x30] - dVar14;
      local_13e0[0x31] = local_13e0[0x31] + dVar14;
      local_13e0[0x36] = local_13e0[0x36] - dVar14;
      local_13e0[0x3b] = dVar14 + local_13e0[0x3b];
      dVar14 = local_1948[0xe] * -dVar25;
      local_13e0[0x46] = local_13e0[0x46] - dVar14;
      local_13e0[0x47] = local_13e0[0x47] + dVar14;
      local_13e0[0x4c] = local_13e0[0x4c] - dVar14;
      local_13e0[0x51] = dVar14 + local_13e0[0x51];
      dVar14 = local_1528 * local_1948[3];
      local_e40 = local_e40 - dVar14;
      local_e38 = local_e38 + dVar14;
      dStack_e10 = dStack_e10 - dVar14;
      local_de8 = dVar14 + local_de8;
      dVar14 = -dVar25 * local_1948[4];
      local_ad0 = local_ad0 - dVar14;
      local_ac8 = local_ac8 + dVar14;
      local_aa0 = local_aa0 - dVar14;
      local_a78 = dVar14 + local_a78;
      local_618[3] = local_618[3] - dVar16;
      local_618[4] = local_618[4] + dVar16;
      local_618[9] = local_618[9] - dVar16;
      local_5a8 = dVar16 + local_5a8;
      local_1758 = local_1948[9] * local_1948[9];
      local_1528 = exp((double)local_1748._0_8_ * 0.1 + dVar28 * -5334.096657530033);
      local_1528 = local_1528 * 4990000.0;
      local_1898._8_8_ = 0;
      local_1898._0_8_ = dVar28 * 0.1 + local_1778 * 5334.096657530033;
      dVar14 = local_1948[1] * local_1948[0x11];
      dVar25 = exp((local_14f8 + (double)local_14c8._0_8_) - local_538);
      dVar25 = local_1528 / dVar25;
      dVar15 = local_1528 * local_1758 - dVar14 * dVar25;
      local_1888[1] = local_1888[1] + dVar15;
      local_1888[9] = local_1888[9] - (dVar15 + dVar15);
      local_1888[0x11] = dVar15 + local_1888[0x11];
      dVar15 = local_1948[0x11] * -dVar25;
      local_13e0[2] = local_13e0[2] + dVar15;
      local_13e0[10] = local_13e0[10] - (dVar15 + dVar15);
      local_13e0[0x12] = dVar15 + local_13e0[0x12];
      dVar15 = (double)local_1898._0_8_ * local_1528 * local_1758 -
               ((double)local_1898._0_8_ -
               ((dStack_16e0 + dStack_1660) - (dStack_16a0 + dStack_16a0)) * dVar28) * dVar25 *
               dVar14;
      dVar14 = (local_1528 + local_1528) * local_1948[9];
      local_e50 = local_e50 + dVar14;
      dStack_e10 = dStack_e10 - (dVar14 + dVar14);
      local_dd0 = dVar14 + local_dd0;
      dVar14 = -dVar25 * local_1948[1];
      local_8d0 = local_8d0 + dVar14;
      local_890 = local_890 - (dVar14 + dVar14);
      local_850 = dVar14 + local_850;
      local_618[1] = local_618[1] + dVar15;
      local_618[9] = local_618[9] - (dVar15 + dVar15);
      local_590 = dVar15 + local_590;
      local_1758 = local_1948[9] * local_1948[0xd];
      dVar14 = exp((double)local_1788._0_8_);
      dVar14 = dVar14 * 26480000.0;
      uVar12 = local_1638._12_4_;
      dVar25 = local_1638._0_8_ - local_548;
      local_1638._8_4_ = local_1638._8_4_;
      local_1638._0_8_ = dVar25;
      local_1638._12_4_ = uVar12;
      local_1788._0_8_ = local_1948[10] * local_1948[0xb];
      dVar25 = exp((dVar25 - local_14e8) + local_1518);
      dVar25 = dVar14 / dVar25;
      dVar15 = dVar14 * local_1758 - (double)local_1788._0_8_ * dVar25;
      dVar16 = (double)local_17a8._0_8_ * dVar14 * local_1758 -
               ((double)local_17a8._0_8_ -
               ((dStack_1690 + local_1698) - (dStack_1680 + dStack_16a0)) * dVar28) * dVar25 *
               (double)local_1788._0_8_;
      local_1888[9] = local_1888[9] - dVar15;
      local_1888[0xd] = local_1888[0xd] - dVar15;
      local_1888[10] = dVar15 + local_1888[10];
      local_1888[0xb] = dVar15 + local_1888[0xb];
      dVar15 = local_1948[0xd] * dVar14;
      dStack_e10 = dStack_e10 - dVar15;
      local_df0 = local_df0 - dVar15;
      local_e08 = dVar15 + local_e08;
      dStack_e00 = dVar15 + dStack_e00;
      dVar15 = local_1948[0xb] * -dVar25;
      local_d60 = local_d60 - dVar15;
      local_d58 = dVar15 + local_d58;
      dStack_d50 = dVar15 + dStack_d50;
      local_d40 = local_d40 - dVar15;
      dVar25 = -dVar25 * local_1948[10];
      local_cb0 = local_cb0 - dVar25;
      local_ca8 = dVar25 + local_ca8;
      dStack_ca0 = dVar25 + dStack_ca0;
      local_c90 = local_c90 - dVar25;
      dVar14 = dVar14 * local_1948[9];
      local_b50 = local_b50 - dVar14;
      local_b48 = dVar14 + local_b48;
      dStack_b40 = dVar14 + dStack_b40;
      local_b30 = local_b30 - dVar14;
      local_618[9] = local_618[9] - dVar16;
      dVar14 = dVar16 + (double)local_5c8._8_8_;
      local_5c8._8_4_ = SUB84(dVar14,0);
      local_5c8._0_8_ = dVar16 + (double)local_5c8._0_8_;
      local_5c8._12_4_ = (int)((ulong)dVar14 >> 0x20);
      local_5b0 = local_5b0 - dVar16;
      local_17a8._0_8_ = local_1948[9] * local_1948[0xe];
      dVar14 = exp((double)local_1748._0_8_ * 2.81 + dVar28 * -2948.8496616156594);
      dVar14 = dVar14 * 0.00332;
      local_1788._0_8_ = local_1948[10] * local_1948[0xd];
      local_1758 = dVar28 * 2.81 + local_1778 * 2948.8496616156594;
      uStack_1750 = 0;
      dVar25 = exp(((double)local_1638._0_8_ - local_1518) + local_1618);
      dVar25 = dVar14 / dVar25;
      dVar15 = dVar14 * (double)local_17a8._0_8_ - (double)local_1788._0_8_ * dVar25;
      dVar16 = local_1758 * dVar14 * (double)local_17a8._0_8_ -
               (local_1758 - ((local_1698 + dStack_1680) - (dStack_16a0 + local_1678)) * dVar28) *
               dVar25 * (double)local_1788._0_8_;
      local_1888[9] = local_1888[9] - dVar15;
      local_1888[10] = local_1888[10] + dVar15;
      local_1888[0xe] = local_1888[0xe] - dVar15;
      local_1888[0xd] = dVar15 + local_1888[0xd];
      dVar15 = local_1948[0xe] * dVar14;
      dStack_e10 = dStack_e10 - dVar15;
      local_e08 = local_e08 + dVar15;
      local_df0 = local_df0 + dVar15;
      local_de8 = local_de8 - dVar15;
      dVar15 = local_1948[0xd] * -dVar25;
      local_d60 = local_d60 - dVar15;
      local_d58 = local_d58 + dVar15;
      local_d40 = local_d40 + dVar15;
      local_d38 = local_d38 - dVar15;
      dVar25 = -dVar25 * local_1948[10];
      local_b50 = local_b50 - dVar25;
      local_b48 = local_b48 + dVar25;
      local_b30 = local_b30 + dVar25;
      local_b28 = local_b28 - dVar25;
      dVar14 = dVar14 * local_1948[9];
      local_aa0 = local_aa0 - dVar14;
      local_a98 = local_a98 + dVar14;
      local_a80 = local_a80 + dVar14;
      local_a78 = local_a78 - dVar14;
      local_618[9] = local_618[9] - dVar16;
      local_5b0 = local_5b0 + dVar16;
      local_5a8 = local_5a8 - dVar16;
      local_17a8._0_8_ = local_1948[9] * local_1948[0x12];
      local_5c8._0_8_ = (double)local_5c8._0_8_ + dVar16;
      dVar14 = exp((double)local_1748._0_8_ * 1.74 + dVar28 * -5258.6141576593245);
      dVar14 = dVar14 * 6.14;
      local_1758 = dVar28 * 1.74 + local_1778 * 5258.6141576593245;
      uStack_1750 = 0;
      local_1788._0_8_ = local_1948[10] * local_1948[0x11];
      dVar25 = exp(((double)local_1638._0_8_ - local_538) + local_518);
      dVar25 = dVar14 / dVar25;
      dVar15 = dVar14 * (double)local_17a8._0_8_ - (double)local_1788._0_8_ * dVar25;
      dVar16 = local_1758 * dVar14 * (double)local_17a8._0_8_ -
               (local_1758 - ((local_1698 + dStack_1660) - (dStack_16a0 + local_1658)) * dVar28) *
               dVar25 * (double)local_1788._0_8_;
      local_1888[9] = local_1888[9] - dVar15;
      local_1888[10] = local_1888[10] + dVar15;
      local_1888[0x12] = local_1888[0x12] - dVar15;
      local_1888[0x11] = dVar15 + local_1888[0x11];
      dVar15 = local_1948[0x12] * dVar14;
      dStack_e10 = dStack_e10 - dVar15;
      local_e08 = local_e08 + dVar15;
      local_dd0 = local_dd0 + dVar15;
      local_dc8 = local_dc8 - dVar15;
      dVar15 = local_1948[0x11] * -dVar25;
      local_d60 = local_d60 - dVar15;
      local_d58 = local_d58 + dVar15;
      local_d20 = local_d20 + dVar15;
      local_d18 = local_d18 - dVar15;
      dVar25 = -dVar25 * local_1948[10];
      local_890 = local_890 - dVar25;
      local_888 = local_888 + dVar25;
      local_850 = local_850 + dVar25;
      local_848 = local_848 - dVar25;
      dVar14 = dVar14 * local_1948[9];
      local_7e0 = local_7e0 - dVar14;
      local_7d8 = local_7d8 + dVar14;
      local_7a0 = local_7a0 + dVar14;
      local_798 = local_798 - dVar14;
      local_618[9] = local_618[9] - dVar16;
      local_5c8._0_8_ = (double)local_5c8._0_8_ + dVar16;
      local_590 = local_590 + dVar16;
      local_588 = local_588 - dVar16;
      local_17a8._0_8_ = local_1948[3] * local_1948[0xd];
      local_1758 = exp(dVar28 * -201.28666632188802 + local_1738);
      local_1758 = local_1758 * 7600000.0;
      local_1788._0_8_ = local_1948[6] * local_1948[0xb];
      local_1638._8_4_ = (int)uStack_1770;
      local_1638._0_8_ = local_1778 * 201.28666632188802 + (double)local_1768._0_8_;
      local_1638._12_4_ = (int)((ulong)uStack_1770 >> 0x20);
      dVar14 = exp((dVar17 - local_14e8) + local_1518);
      dVar14 = local_1758 / dVar14;
      dVar25 = local_1758 * (double)local_17a8._0_8_ - (double)local_1788._0_8_ * dVar14;
      dVar15 = (double)local_1638._0_8_ * local_1758 * (double)local_17a8._0_8_ -
               ((double)local_1638._0_8_ -
               ((local_16b8 + dStack_1690) - (dStack_16d0 + dStack_1680)) * dVar28) * dVar14 *
               (double)local_1788._0_8_;
      local_1888[3] = local_1888[3] - dVar25;
      local_1888[6] = local_1888[6] + dVar25;
      local_1888[0xd] = local_1888[0xd] - dVar25;
      local_1888[0xb] = dVar25 + local_1888[0xb];
      dVar25 = local_1948[0xd] * local_1758;
      local_13e0[0x30] = local_13e0[0x30] - dVar25;
      local_13e0[0x33] = local_13e0[0x33] + dVar25;
      local_13e0[0x38] = local_13e0[0x38] + dVar25;
      local_13e0[0x3a] = local_13e0[0x3a] - dVar25;
      dVar25 = local_1948[0xb] * -dVar14;
      local_1050._0_8_ = (double)local_1050._0_8_ - dVar25;
      dStack_1038 = dStack_1038 + dVar25;
      local_1010 = local_1010 + dVar25;
      local_1000 = local_1000 - dVar25;
      dVar14 = -dVar14 * local_1948[6];
      local_ce0 = local_ce0 - dVar14;
      local_cc8 = local_cc8 + dVar14;
      dStack_ca0 = dStack_ca0 + dVar14;
      local_c90 = local_c90 - dVar14;
      dVar14 = local_1758 * local_1948[3];
      local_b80 = local_b80 - dVar14;
      local_b68 = local_b68 + dVar14;
      dStack_b40 = dStack_b40 + dVar14;
      local_b30 = local_b30 - dVar14;
      local_618[3] = local_618[3] - dVar15;
      local_618[6] = local_618[6] + dVar15;
      local_5c8._8_8_ = (double)local_5c8._8_8_ + dVar15;
      local_5b0 = local_5b0 - dVar15;
      local_17a8._0_8_ = local_1948[3] * local_1948[0xf];
      dVar14 = exp((double)local_1748._0_8_ * 7.6 + dVar28 * 1776.3548302906618);
      local_1638._0_8_ = dVar14 * 4.28e-19;
      local_1788._8_8_ = 0;
      local_1788._0_8_ = dVar28 * 7.6 + local_1778 * -1776.3548302906618;
      local_1748._0_8_ = local_1948[6] * local_1948[0xe];
      dVar14 = exp((dVar17 - local_1618) + local_568);
      dVar14 = (double)local_1638._0_8_ / dVar14;
      dVar25 = (double)local_1638._0_8_ * (double)local_17a8._0_8_ -
               (double)local_1748._0_8_ * dVar14;
      dVar15 = (double)local_1788._0_8_ * (double)local_1638._0_8_ * (double)local_17a8._0_8_ -
               ((double)local_1788._0_8_ -
               ((local_16b8 + local_1678) - (dStack_16d0 + dStack_1670)) * dVar28) * dVar14 *
               (double)local_1748._0_8_;
      local_1888[3] = local_1888[3] - dVar25;
      local_1888[6] = local_1888[6] + dVar25;
      local_1888[0xf] = local_1888[0xf] - dVar25;
      local_1888[0xe] = dVar25 + local_1888[0xe];
      dVar25 = local_1948[0xf] * (double)local_1638._0_8_;
      local_13e0[0x30] = local_13e0[0x30] - dVar25;
      local_13e0[0x33] = local_13e0[0x33] + dVar25;
      local_13e0[0x3b] = local_13e0[0x3b] + dVar25;
      local_13e0[0x3c] = local_13e0[0x3c] - dVar25;
      dVar25 = local_1948[0xe] * -dVar14;
      local_1050._0_8_ = (double)local_1050._0_8_ - dVar25;
      dStack_1038 = dStack_1038 + dVar25;
      local_ff8 = local_ff8 + dVar25;
      local_ff0 = local_ff0 - dVar25;
      dVar14 = -dVar14 * local_1948[6];
      local_ad0 = local_ad0 - dVar14;
      local_ab8 = local_ab8 + dVar14;
      local_a78 = local_a78 + dVar14;
      local_a70 = local_a70 - dVar14;
      dVar14 = (double)local_1638._0_8_ * local_1948[3];
      local_a20 = local_a20 - dVar14;
      local_a08 = local_a08 + dVar14;
      local_9c8 = local_9c8 + dVar14;
      local_9c0 = local_9c0 - dVar14;
      local_618[3] = local_618[3] - dVar15;
      local_618[6] = local_618[6] + dVar15;
      local_5a8 = local_5a8 + dVar15;
      local_5a0 = local_5a0 - dVar15;
      local_1748._0_8_ = local_1948[3] * local_1948[0x11];
      dVar14 = exp(dVar28 * -1949.96457999329 + local_1738);
      local_1788._0_8_ = dVar14;
      local_17a8._0_8_ = local_1948[6] * local_1948[0x10];
      dVar14 = exp((dVar17 - local_508) + local_538);
      dVar15 = (double)local_1788._0_8_ * 840000.0;
      dVar16 = local_1778 * 1949.96457999329 + (double)local_1768._0_8_;
      dVar14 = dVar15 / dVar14;
      dVar25 = dVar15 * (double)local_1748._0_8_ - (double)local_17a8._0_8_ * dVar14;
      local_1888[3] = local_1888[3] - dVar25;
      local_1888[6] = local_1888[6] + dVar25;
      dVar16 = dVar16 * dVar15 * (double)local_1748._0_8_ -
               (dVar16 - ((local_16b8 + local_1668) - (dStack_16d0 + dStack_1660)) * dVar28) *
               dVar14 * (double)local_17a8._0_8_;
      local_1888[0x10] = dVar25 + local_1888[0x10];
      local_1888[0x11] = local_1888[0x11] - dVar25;
      dVar25 = local_1948[0x11] * dVar15;
      local_13e0[0x30] = local_13e0[0x30] - dVar25;
      local_13e0[0x33] = local_13e0[0x33] + dVar25;
      local_13e0[0x3d] = local_13e0[0x3d] + dVar25;
      local_13e0[0x3e] = local_13e0[0x3e] - dVar25;
      dVar25 = local_1948[0x10] * -dVar14;
      local_1050._0_8_ = (double)local_1050._0_8_ - dVar25;
      dStack_1038 = dStack_1038 + dVar25;
      local_fe8 = local_fe8 + dVar25;
      dVar14 = -dVar14 * local_1948[6];
      local_fe0 = local_fe0 - dVar25;
      local_970 = local_970 - dVar14;
      local_958 = local_958 + dVar14;
      local_908 = local_908 + dVar14;
      local_900 = local_900 - dVar14;
      dVar15 = dVar15 * local_1948[3];
      local_8c0 = local_8c0 - dVar15;
      local_8a8 = local_8a8 + dVar15;
      local_858 = local_858 + dVar15;
      local_850 = local_850 - dVar15;
      local_618[3] = local_618[3] - dVar16;
      local_618[6] = local_618[6] + dVar16;
      local_598 = local_598 + dVar16;
      local_590 = local_590 - dVar16;
      if (iVar1 == 2) {
        if (1000.0 <= local_15f8) {
          local_3f8[0] = local_558 * 2.00255376e-14 +
                         local_4b8 * -1.79566394e-10 +
                         local_4c8 * 4.99456778e-07 + local_15f8 * -4.94024731e-05 + 3.3372792;
          local_3f8[1] = local_558 * 4.98197357e-22 +
                         local_4b8 * -4.73515235e-18 +
                         local_4c8 * 1.61561948e-14 + local_15f8 * -2.30842973e-11 + 2.50000001;
          local_3f8[2] = local_558 * 1.22833691e-15 +
                         local_4b8 * -1.00177799e-11 +
                         local_4c8 * 4.19484589e-08 + local_15f8 * -8.59741137e-05 + 2.56942078;
          local_3f8[3] = local_558 * -2.16717794e-14 +
                         local_4b8 * 2.09470555e-10 +
                         local_4c8 * -7.57966669e-07 + local_15f8 * 0.00148308754 + 3.28253784;
          local_3f8[4] = local_558 * 1.17412376e-14 +
                         local_4b8 * -8.79461556e-11 +
                         local_4c8 * 1.26505228e-07 + local_15f8 * 0.000548429716 + 3.09288767;
          local_3f8[5] = local_558 * 1.68200992e-14 +
                         local_4b8 * -9.7041987e-11 +
                         local_4c8 * -1.64072518e-07 + local_15f8 * 0.00217691804 + 3.03399249;
          local_3f8[6] = local_558 * -1.07908535e-14 +
                         local_4b8 * 1.1424637e-10 +
                         local_4c8 * -6.3365815e-07 + local_15f8 * 0.00223982013 + 4.0172109;
          local_3f8[7] = local_558 * -1.87727567e-14 +
                         local_4b8 * 2.60179549e-10 +
                         local_4c8 * -1.40894597e-06 + local_15f8 * 0.00365639292 + 2.87410113;
          local_3f8[8] = local_558 * -3.39716365e-14 +
                         local_4b8 * 4.17906e-10 +
                         local_4c8 * -2.01191947e-06 + local_15f8 * 0.00465588637 + 2.29203842;
          local_3f8[9] = local_558 * -4.67154394e-14 +
                         local_4b8 * 5.95684644e-10 +
                         local_4c8 * -2.98714348e-06 + local_15f8 * 0.00723990037 + 2.28571772;
          local_3f8[10] =
               local_558 * -1.0181523e-13 +
               local_4b8 * 1.22292535e-09 +
               local_4c8 * -5.73285809e-06 + local_15f8 * 0.0133909467 + 0.074851495;
          local_3f8[0xb] =
               local_558 * -2.03647716e-14 +
               local_4b8 * 2.30053008e-10 +
               local_4c8 * -9.98825771e-07 + local_15f8 * 0.00206252743 + 2.71518561;
          local_3f8[0xc] =
               local_558 * -4.72084164e-14 +
               local_4b8 * 5.23490188e-10 +
               local_4c8 * -2.21481404e-06 + local_15f8 * 0.00441437026 + 3.85746029;
          local_3f8[0xd] =
               local_558 * -5.33508711e-14 +
               local_4b8 * 5.89161778e-10 +
               local_4c8 * -2.48445613e-06 + local_15f8 * 0.00495695526 + 2.77217438;
          local_3f8[0xe] =
               local_558 * -8.8385564e-14 +
               local_4b8 * 1.00641212e-09 +
               local_4c8 * -4.42258813e-06 + local_15f8 * 0.00920000082 + 1.76069008;
          local_3f8[0xf] =
               local_558 * -2.112616e-14 +
               local_4b8 * 3.944431e-10 +
               local_4c8 * -2.656384e-06 + local_15f8 * 0.007871497 + 3.770799;
          local_3f8[0x10] =
               local_558 * -1.25706061e-13 +
               local_4b8 * 1.47222923e-09 +
               local_4c8 * -6.71077915e-06 + local_15f8 * 0.0146454151 + 2.03611116;
          local_3f8[0x11] =
               local_558 * -1.49641576e-13 +
               local_4b8 * 1.75217689e-09 +
               local_4c8 * -7.98206668e-06 + local_15f8 * 0.0173972722 + 1.95465642;
          dVar15 = local_4b8 * 2.21412001e-09 +
                   local_4c8 * -1.00256067e-05 + local_15f8 * 0.0216852677 + 1.0718815;
          dVar16 = local_4b8 * 1.0097038e-10 +
                   local_4c8 * -5.68476e-07 + local_15f8 * 0.0014879768 + 2.92664;
          dVar14 = -1.9000289e-13;
          dVar25 = -6.753351e-15;
        }
        else {
          local_3f8[0] = local_558 * -7.37611761e-12 +
                         local_4b8 * 2.01572094e-08 +
                         local_4c8 * -1.9478151e-05 + local_15f8 * 0.00798052075 + 2.34433112;
          local_3f8[1] = local_558 * -9.27732332e-22 +
                         local_4b8 * 2.30081632e-18 +
                         local_4c8 * -1.99591964e-15 + local_15f8 * 7.05332819e-13 + 2.5;
          local_3f8[2] = local_558 * 2.11265971e-12 +
                         local_4b8 * -6.12806624e-09 +
                         local_4c8 * 6.64306396e-06 + local_15f8 * -0.00327931884 + 3.1682671;
          local_3f8[3] = local_558 * 3.24372837e-12 +
                         local_4b8 * -9.68129509e-09 +
                         local_4c8 * 9.84730201e-06 + local_15f8 * -0.00299673416 + 3.78245636;
          local_3f8[4] = local_558 * 1.3641147e-12 +
                         local_4b8 * -3.88113333e-09 +
                         local_4c8 * 4.61793841e-06 + local_15f8 * -0.00240131752 + 3.99201543;
          local_3f8[5] = local_558 * 1.77197817e-12 +
                         local_4b8 * -5.48797062e-09 +
                         local_4c8 * 6.52040211e-06 + local_15f8 * -0.0020364341 + 4.19864056;
          local_3f8[6] = local_558 * 9.29225124e-12 +
                         local_4b8 * -2.42763894e-08 +
                         local_4c8 * 2.11582891e-05 + local_15f8 * -0.00474912051 + 4.30179801;
          local_3f8[7] = local_558 * 1.68741719e-12 +
                         local_4b8 * -3.85091153e-09 +
                         local_4c8 * 2.79489841e-06 + local_15f8 * 0.000968872143 + 3.76267867;
          local_3f8[8] = local_558 * 1.94314737e-12 +
                         local_4b8 * -6.68815981e-09 +
                         local_4c8 * 8.2329622e-06 + local_15f8 * -0.00236661419 + 4.19860411;
          local_3f8[9] = local_558 * 2.54385734e-12 +
                         local_4b8 * -6.87117425e-09 +
                         local_4c8 * 5.73021856e-06 + local_15f8 * 0.00201095175 + 3.6735904;
          local_3f8[10] =
               local_558 * 1.66693956e-11 +
               local_4b8 * -4.84743026e-08 +
               local_4c8 * 4.91800599e-05 + local_15f8 * -0.0136709788 + 5.14987613;
          local_3f8[0xb] =
               local_558 * -9.04424499e-13 +
               local_4b8 * 9.07005884e-10 +
               local_4c8 * 1.01681433e-06 + local_15f8 * -0.00061035368 + 3.57953347;
          local_3f8[0xc] =
               local_558 * -1.43699548e-13 +
               local_4b8 * 2.45919022e-09 +
               local_4c8 * -7.12356269e-06 + local_15f8 * 0.00898459677 + 2.35677352;
          local_3f8[0xd] =
               local_558 * 4.33768865e-12 +
               local_4b8 * -1.33144093e-08 +
               local_4c8 * 1.37799446e-05 + local_15f8 * -0.00324392532 + 4.22118584;
          local_3f8[0xe] =
               local_558 * 1.31772652e-11 +
               local_4b8 * -3.79285261e-08 +
               local_4c8 * 3.73220008e-05 + local_15f8 * -0.00990833369 + 4.79372315;
          local_3f8[0xf] =
               local_558 * 2.07561e-12 +
               local_4b8 * -7.377636e-09 +
               local_4c8 * 5.338472e-06 + local_15f8 * 0.007216595 + 2.106204;
          local_3f8[0x10] =
               local_558 * 2.69884373e-11 +
               local_4b8 * -6.91588753e-08 +
               local_4c8 * 5.70990292e-05 + local_15f8 * -0.00757052247 + 3.95920148;
          local_3f8[0x11] =
               local_558 * 2.30509004e-11 +
               local_4b8 * -5.99126606e-08 +
               local_4c8 * 4.97142807e-05 + local_15f8 * -0.00418658892 + 4.30646568;
          dVar15 = local_4b8 * -7.08466285e-08 +
                   local_4c8 * 5.99438288e-05 + local_15f8 * -0.0055015427 + 4.29142492;
          dVar16 = local_4b8 * 5.641515e-09 +
                   local_4c8 * -3.963222e-06 + local_15f8 * 0.0014082404 + 3.298677;
          dVar14 = 2.68685771e-11;
          dVar25 = -2.444854e-12;
        }
        local_3f8[0x12] = local_558 * dVar14 + dVar15;
        local_3f8[0x13] = local_558 * dVar25 + dVar16;
        local_3f8[0x14] = local_318 + (double)local_348._0_8_ + 2.5 + local_308 + local_2f8;
        if (1000.0 <= local_15f8) {
          local_4a8[0] = local_4b8 * 8.01021504e-14 +
                         local_4c8 * -5.38699182e-10 + local_15f8 * 9.98913556e-07 + -4.94024731e-05
          ;
          local_4a8[1] = local_4b8 * 1.99278943e-21 +
                         local_4c8 * -1.42054571e-17 + local_15f8 * 3.23123896e-14 + -2.30842973e-11
          ;
          local_4a8[2] = local_4b8 * 4.91334764e-15 +
                         local_4c8 * -3.00533397e-11 + local_15f8 * 8.38969178e-08 + -8.59741137e-05
          ;
          local_4a8[3] = local_4b8 * -8.66871176e-14 +
                         local_4c8 * 6.28411665e-10 + local_15f8 * -1.51593334e-06 + 0.00148308754;
          local_4a8[4] = local_4b8 * 4.69649504e-14 +
                         local_4c8 * -2.63838467e-10 + local_15f8 * 2.53010456e-07 + 0.000548429716;
          local_4a8[5] = local_4b8 * 6.72803968e-14 +
                         local_4c8 * -2.91125961e-10 + local_15f8 * -3.28145036e-07 + 0.00217691804;
          local_4a8[6] = local_4b8 * -4.3163414e-14 +
                         local_4c8 * 3.4273911e-10 + local_15f8 * -1.2673163e-06 + 0.00223982013;
          local_4a8[7] = local_4b8 * -7.50910268e-14 +
                         local_4c8 * 7.80538647e-10 + local_15f8 * -2.81789194e-06 + 0.00365639292;
          local_4a8[8] = local_4b8 * -1.35886546e-13 +
                         local_4c8 * 1.253718e-09 + local_15f8 * -4.02383894e-06 + 0.00465588637;
          local_4a8[9] = local_4b8 * -1.86861758e-13 +
                         local_4c8 * 1.78705393e-09 + local_15f8 * -5.97428696e-06 + 0.00723990037;
          local_4a8[10] =
               local_4b8 * -4.0726092e-13 +
               local_4c8 * 3.66877605e-09 + local_15f8 * -1.14657162e-05 + 0.0133909467;
          local_4a8[0xb] =
               local_4b8 * -8.14590864e-14 +
               local_4c8 * 6.90159024e-10 + local_15f8 * -1.99765154e-06 + 0.00206252743;
          local_4a8[0xc] =
               local_4b8 * -1.88833666e-13 +
               local_4c8 * 1.57047056e-09 + local_15f8 * -4.42962808e-06 + 0.00441437026;
          local_4a8[0xd] =
               local_4b8 * -2.13403484e-13 +
               local_4c8 * 1.76748533e-09 + local_15f8 * -4.96891226e-06 + 0.00495695526;
          local_4a8[0xe] =
               local_4b8 * -3.53542256e-13 +
               local_4c8 * 3.01923636e-09 + local_15f8 * -8.84517626e-06 + 0.00920000082;
          local_4a8[0xf] =
               local_4b8 * -8.450464e-14 +
               local_4c8 * 1.1833293e-09 + local_15f8 * -5.312768e-06 + 0.007871497;
          local_4a8[0x10] =
               local_4b8 * -5.02824244e-13 +
               local_4c8 * 4.41668769e-09 + local_15f8 * -1.34215583e-05 + 0.0146454151;
          local_4a8[0x11] =
               local_4b8 * -5.98566304e-13 +
               local_4c8 * 5.25653067e-09 + local_15f8 * -1.59641334e-05 + 0.0173972722;
          dVar15 = local_4c8 * 6.64236003e-09 + local_15f8 * -2.00512134e-05 + 0.0216852677;
          dVar16 = local_4c8 * 3.0291114e-10 + local_15f8 * -1.136952e-06 + 0.0014879768;
          dVar14 = -7.6001156e-13;
          dVar25 = -2.7013404e-14;
        }
        else {
          local_4a8[0] = local_4b8 * -2.95044704e-11 +
                         local_4c8 * 6.04716282e-08 + local_15f8 * -3.8956302e-05 + 0.00798052075;
          local_4a8[1] = local_4b8 * -3.71092933e-21 +
                         local_4c8 * 6.90244896e-18 + local_15f8 * -3.99183928e-15 + 7.05332819e-13;
          local_4a8[2] = local_4b8 * 8.45063884e-12 +
                         local_4c8 * -1.83841987e-08 + local_15f8 * 1.32861279e-05 + -0.00327931884;
          local_4a8[3] = local_4b8 * 1.29749135e-11 +
                         local_4c8 * -2.90438853e-08 + local_15f8 * 1.9694604e-05 + -0.00299673416;
          local_4a8[4] = local_4b8 * 5.4564588e-12 +
                         local_4c8 * -1.16434e-08 + local_15f8 * 9.23587682e-06 + -0.00240131752;
          local_4a8[5] = local_4b8 * 7.08791268e-12 +
                         local_4c8 * -1.64639119e-08 + local_15f8 * 1.30408042e-05 + -0.0020364341;
          local_4a8[6] = local_4b8 * 3.7169005e-11 +
                         local_4c8 * -7.28291682e-08 + local_15f8 * 4.23165782e-05 + -0.00474912051;
          local_4a8[7] = local_4b8 * 6.74966876e-12 +
                         local_4c8 * -1.15527346e-08 + local_15f8 * 5.58979682e-06 + 0.000968872143;
          local_4a8[8] = local_4b8 * 7.77258948e-12 +
                         local_4c8 * -2.00644794e-08 + local_15f8 * 1.64659244e-05 + -0.00236661419;
          local_4a8[9] = local_4b8 * 1.01754294e-11 +
                         local_4c8 * -2.06135228e-08 + local_15f8 * 1.14604371e-05 + 0.00201095175;
          local_4a8[10] =
               local_4b8 * 6.66775824e-11 +
               local_4c8 * -1.45422908e-07 + local_15f8 * 9.83601198e-05 + -0.0136709788;
          local_4a8[0xb] =
               local_4b8 * -3.617698e-12 +
               local_4c8 * 2.72101765e-09 + local_15f8 * 2.03362866e-06 + -0.00061035368;
          local_4a8[0xc] =
               local_4b8 * -5.74798192e-13 +
               local_4c8 * 7.37757066e-09 + local_15f8 * -1.42471254e-05 + 0.00898459677;
          local_4a8[0xd] =
               local_4b8 * 1.73507546e-11 +
               local_4c8 * -3.99432279e-08 + local_15f8 * 2.75598892e-05 + -0.00324392532;
          local_4a8[0xe] =
               local_4b8 * 5.27090608e-11 +
               local_4c8 * -1.13785578e-07 + local_15f8 * 7.46440016e-05 + -0.00990833369;
          local_4a8[0xf] =
               local_4b8 * 8.30244e-12 +
               local_4c8 * -2.2132908e-08 + local_15f8 * 1.0676944e-05 + 0.007216595;
          local_4a8[0x10] =
               local_4b8 * 1.07953749e-10 +
               local_4c8 * -2.07476626e-07 + local_15f8 * 0.000114198058 + -0.00757052247;
          local_4a8[0x11] =
               local_4b8 * 9.22036016e-11 +
               local_4c8 * -1.79737982e-07 + local_15f8 * 9.94285614e-05 + -0.00418658892;
          dVar15 = local_4c8 * -2.12539886e-07 + local_15f8 * 0.000119887658 + -0.0055015427;
          dVar16 = local_4c8 * 1.6924545e-08 + local_15f8 * -7.926444e-06 + 0.0014082404;
          dVar14 = 1.07474308e-10;
          dVar25 = -9.779416e-12;
        }
        local_4a8[0x12] = local_4b8 * dVar14 + dVar15;
        local_4a8[0x13] = local_4b8 * dVar25 + dVar16;
        local_4a8[0x14] = local_2f8 + local_308 + (double)local_348._0_8_ + 0.0;
        pdVar6 = &local_16e8;
      }
      else {
        if (1000.0 <= local_15f8) {
          local_3f8[0] = local_558 * 2.00255376e-14 +
                         local_4b8 * -1.79566394e-10 +
                         local_4c8 * 4.99456778e-07 + local_15f8 * -4.94024731e-05 + 2.3372792;
          local_3f8[1] = local_558 * 4.98197357e-22 +
                         local_4b8 * -4.73515235e-18 +
                         local_4c8 * 1.61561948e-14 + local_15f8 * -2.30842973e-11 + 1.50000001;
          local_3f8[2] = local_558 * 1.22833691e-15 +
                         local_4b8 * -1.00177799e-11 +
                         local_4c8 * 4.19484589e-08 + local_15f8 * -8.59741137e-05 + 1.56942078;
          local_3f8[3] = local_558 * -2.16717794e-14 +
                         local_4b8 * 2.09470555e-10 +
                         local_4c8 * -7.57966669e-07 + local_15f8 * 0.00148308754 + 2.28253784;
          local_3f8[4] = local_558 * 1.17412376e-14 +
                         local_4b8 * -8.79461556e-11 +
                         local_4c8 * 1.26505228e-07 + local_15f8 * 0.000548429716 + 2.09288767;
          local_3f8[5] = local_558 * 1.68200992e-14 +
                         local_4b8 * -9.7041987e-11 +
                         local_4c8 * -1.64072518e-07 + local_15f8 * 0.00217691804 + 2.03399249;
          local_3f8[6] = local_558 * -1.07908535e-14 +
                         local_4b8 * 1.1424637e-10 +
                         local_4c8 * -6.3365815e-07 + local_15f8 * 0.00223982013 + 3.0172109;
          local_3f8[7] = local_558 * -1.87727567e-14 +
                         local_4b8 * 2.60179549e-10 +
                         local_4c8 * -1.40894597e-06 + local_15f8 * 0.00365639292 + 1.87410113;
          local_3f8[8] = local_558 * -3.39716365e-14 +
                         local_4b8 * 4.17906e-10 +
                         local_4c8 * -2.01191947e-06 + local_15f8 * 0.00465588637 + 1.29203842;
          local_3f8[9] = local_558 * -4.67154394e-14 +
                         local_4b8 * 5.95684644e-10 +
                         local_4c8 * -2.98714348e-06 + local_15f8 * 0.00723990037 + 1.28571772;
          local_3f8[10] =
               local_558 * -1.0181523e-13 +
               local_4b8 * 1.22292535e-09 +
               local_4c8 * -5.73285809e-06 + local_15f8 * 0.0133909467 + -0.925148505;
          local_3f8[0xb] =
               local_558 * -2.03647716e-14 +
               local_4b8 * 2.30053008e-10 +
               local_4c8 * -9.98825771e-07 + local_15f8 * 0.00206252743 + 1.71518561;
          local_3f8[0xc] =
               local_558 * -4.72084164e-14 +
               local_4b8 * 5.23490188e-10 +
               local_4c8 * -2.21481404e-06 + local_15f8 * 0.00441437026 + 2.85746029;
          local_3f8[0xd] =
               local_558 * -5.33508711e-14 +
               local_4b8 * 5.89161778e-10 +
               local_4c8 * -2.48445613e-06 + local_15f8 * 0.00495695526 + 1.77217438;
          local_3f8[0xe] =
               local_558 * -8.8385564e-14 +
               local_4b8 * 1.00641212e-09 +
               local_4c8 * -4.42258813e-06 + local_15f8 * 0.00920000082 + 0.76069008;
          local_3f8[0xf] =
               local_558 * -2.112616e-14 +
               local_4b8 * 3.944431e-10 +
               local_4c8 * -2.656384e-06 + local_15f8 * 0.007871497 + 2.770799;
          local_3f8[0x10] =
               local_558 * -1.25706061e-13 +
               local_4b8 * 1.47222923e-09 +
               local_4c8 * -6.71077915e-06 + local_15f8 * 0.0146454151 + 1.03611116;
          local_3f8[0x11] =
               local_558 * -1.49641576e-13 +
               local_4b8 * 1.75217689e-09 +
               local_4c8 * -7.98206668e-06 + local_15f8 * 0.0173972722 + 0.95465642;
          dVar15 = local_4b8 * 2.21412001e-09 +
                   local_4c8 * -1.00256067e-05 + local_15f8 * 0.0216852677 + 0.0718815;
          dVar16 = local_4b8 * 1.0097038e-10 +
                   local_4c8 * -5.68476e-07 + local_15f8 * 0.0014879768 + 1.92664;
          dVar14 = -1.9000289e-13;
          dVar25 = -6.753351e-15;
        }
        else {
          local_3f8[0] = local_558 * -7.37611761e-12 +
                         local_4b8 * 2.01572094e-08 +
                         local_4c8 * -1.9478151e-05 + local_15f8 * 0.00798052075 + 1.34433112;
          local_3f8[1] = local_558 * -9.27732332e-22 +
                         local_4b8 * 2.30081632e-18 +
                         local_4c8 * -1.99591964e-15 + local_15f8 * 7.05332819e-13 + 1.5;
          local_3f8[2] = local_558 * 2.11265971e-12 +
                         local_4b8 * -6.12806624e-09 +
                         local_4c8 * 6.64306396e-06 + local_15f8 * -0.00327931884 + 2.1682671;
          local_3f8[3] = local_558 * 3.24372837e-12 +
                         local_4b8 * -9.68129509e-09 +
                         local_4c8 * 9.84730201e-06 + local_15f8 * -0.00299673416 + 2.78245636;
          local_3f8[4] = local_558 * 1.3641147e-12 +
                         local_4b8 * -3.88113333e-09 +
                         local_4c8 * 4.61793841e-06 + local_15f8 * -0.00240131752 + 2.99201543;
          local_3f8[5] = local_558 * 1.77197817e-12 +
                         local_4b8 * -5.48797062e-09 +
                         local_4c8 * 6.52040211e-06 + local_15f8 * -0.0020364341 + 3.19864056;
          local_3f8[6] = local_558 * 9.29225124e-12 +
                         local_4b8 * -2.42763894e-08 +
                         local_4c8 * 2.11582891e-05 + local_15f8 * -0.00474912051 + 3.30179801;
          local_3f8[7] = local_558 * 1.68741719e-12 +
                         local_4b8 * -3.85091153e-09 +
                         local_4c8 * 2.79489841e-06 + local_15f8 * 0.000968872143 + 2.76267867;
          local_3f8[8] = local_558 * 1.94314737e-12 +
                         local_4b8 * -6.68815981e-09 +
                         local_4c8 * 8.2329622e-06 + local_15f8 * -0.00236661419 + 3.19860411;
          local_3f8[9] = local_558 * 2.54385734e-12 +
                         local_4b8 * -6.87117425e-09 +
                         local_4c8 * 5.73021856e-06 + local_15f8 * 0.00201095175 + 2.6735904;
          local_3f8[10] =
               local_558 * 1.66693956e-11 +
               local_4b8 * -4.84743026e-08 +
               local_4c8 * 4.91800599e-05 + local_15f8 * -0.0136709788 + 4.14987613;
          local_3f8[0xb] =
               local_558 * -9.04424499e-13 +
               local_4b8 * 9.07005884e-10 +
               local_4c8 * 1.01681433e-06 + local_15f8 * -0.00061035368 + 2.57953347;
          local_3f8[0xc] =
               local_558 * -1.43699548e-13 +
               local_4b8 * 2.45919022e-09 +
               local_4c8 * -7.12356269e-06 + local_15f8 * 0.00898459677 + 1.35677352;
          local_3f8[0xd] =
               local_558 * 4.33768865e-12 +
               local_4b8 * -1.33144093e-08 +
               local_4c8 * 1.37799446e-05 + local_15f8 * -0.00324392532 + 3.22118584;
          local_3f8[0xe] =
               local_558 * 1.31772652e-11 +
               local_4b8 * -3.79285261e-08 +
               local_4c8 * 3.73220008e-05 + local_15f8 * -0.00990833369 + 3.79372315;
          local_3f8[0xf] =
               local_558 * 2.07561e-12 +
               local_4b8 * -7.377636e-09 +
               local_4c8 * 5.338472e-06 + local_15f8 * 0.007216595 + 1.106204;
          local_3f8[0x10] =
               local_558 * 2.69884373e-11 +
               local_4b8 * -6.91588753e-08 +
               local_4c8 * 5.70990292e-05 + local_15f8 * -0.00757052247 + 2.95920148;
          local_3f8[0x11] =
               local_558 * 2.30509004e-11 +
               local_4b8 * -5.99126606e-08 +
               local_4c8 * 4.97142807e-05 + local_15f8 * -0.00418658892 + 3.30646568;
          dVar15 = local_4b8 * -7.08466285e-08 +
                   local_4c8 * 5.99438288e-05 + local_15f8 * -0.0055015427 + 3.29142492;
          dVar16 = local_4b8 * 5.641515e-09 +
                   local_4c8 * -3.963222e-06 + local_15f8 * 0.0014082404 + 2.298677;
          dVar14 = 2.68685771e-11;
          dVar25 = -2.444854e-12;
        }
        local_3f8[0x12] = local_558 * dVar14 + dVar15;
        local_3f8[0x13] = local_558 * dVar25 + dVar16;
        local_3f8[0x14] = (double)local_348._0_8_ + 1.5 + local_308 + local_2f8 + local_318;
        if (1000.0 <= local_15f8) {
          local_4a8[0] = local_4b8 * 8.01021504e-14 +
                         local_4c8 * -5.38699182e-10 + local_15f8 * 9.98913556e-07 + -4.94024731e-05
          ;
          local_4a8[1] = local_4b8 * 1.99278943e-21 +
                         local_4c8 * -1.42054571e-17 + local_15f8 * 3.23123896e-14 + -2.30842973e-11
          ;
          local_4a8[2] = local_4b8 * 4.91334764e-15 +
                         local_4c8 * -3.00533397e-11 + local_15f8 * 8.38969178e-08 + -8.59741137e-05
          ;
          local_4a8[3] = local_4b8 * -8.66871176e-14 +
                         local_4c8 * 6.28411665e-10 + local_15f8 * -1.51593334e-06 + 0.00148308754;
          local_4a8[4] = local_4b8 * 4.69649504e-14 +
                         local_4c8 * -2.63838467e-10 + local_15f8 * 2.53010456e-07 + 0.000548429716;
          local_4a8[5] = local_4b8 * 6.72803968e-14 +
                         local_4c8 * -2.91125961e-10 + local_15f8 * -3.28145036e-07 + 0.00217691804;
          local_4a8[6] = local_4b8 * -4.3163414e-14 +
                         local_4c8 * 3.4273911e-10 + local_15f8 * -1.2673163e-06 + 0.00223982013;
          local_4a8[7] = local_4b8 * -7.50910268e-14 +
                         local_4c8 * 7.80538647e-10 + local_15f8 * -2.81789194e-06 + 0.00365639292;
          local_4a8[8] = local_4b8 * -1.35886546e-13 +
                         local_4c8 * 1.253718e-09 + local_15f8 * -4.02383894e-06 + 0.00465588637;
          local_4a8[9] = local_4b8 * -1.86861758e-13 +
                         local_4c8 * 1.78705393e-09 + local_15f8 * -5.97428696e-06 + 0.00723990037;
          local_4a8[10] =
               local_4b8 * -4.0726092e-13 +
               local_4c8 * 3.66877605e-09 + local_15f8 * -1.14657162e-05 + 0.0133909467;
          local_4a8[0xb] =
               local_4b8 * -8.14590864e-14 +
               local_4c8 * 6.90159024e-10 + local_15f8 * -1.99765154e-06 + 0.00206252743;
          local_4a8[0xc] =
               local_4b8 * -1.88833666e-13 +
               local_4c8 * 1.57047056e-09 + local_15f8 * -4.42962808e-06 + 0.00441437026;
          local_4a8[0xd] =
               local_4b8 * -2.13403484e-13 +
               local_4c8 * 1.76748533e-09 + local_15f8 * -4.96891226e-06 + 0.00495695526;
          local_4a8[0xe] =
               local_4b8 * -3.53542256e-13 +
               local_4c8 * 3.01923636e-09 + local_15f8 * -8.84517626e-06 + 0.00920000082;
          local_4a8[0xf] =
               local_4b8 * -8.450464e-14 +
               local_4c8 * 1.1833293e-09 + local_15f8 * -5.312768e-06 + 0.007871497;
          local_4a8[0x10] =
               local_4b8 * -5.02824244e-13 +
               local_4c8 * 4.41668769e-09 + local_15f8 * -1.34215583e-05 + 0.0146454151;
          local_4a8[0x11] =
               local_4b8 * -5.98566304e-13 +
               local_4c8 * 5.25653067e-09 + local_15f8 * -1.59641334e-05 + 0.0173972722;
          dVar15 = local_4c8 * 6.64236003e-09 + local_15f8 * -2.00512134e-05 + 0.0216852677;
          dVar16 = local_4c8 * 3.0291114e-10 + local_15f8 * -1.136952e-06 + 0.0014879768;
          dVar14 = -7.6001156e-13;
          dVar25 = -2.7013404e-14;
        }
        else {
          local_4a8[0] = local_4b8 * -2.95044704e-11 +
                         local_4c8 * 6.04716282e-08 + local_15f8 * -3.8956302e-05 + 0.00798052075;
          local_4a8[1] = local_4b8 * -3.71092933e-21 +
                         local_4c8 * 6.90244896e-18 + local_15f8 * -3.99183928e-15 + 7.05332819e-13;
          local_4a8[2] = local_4b8 * 8.45063884e-12 +
                         local_4c8 * -1.83841987e-08 + local_15f8 * 1.32861279e-05 + -0.00327931884;
          local_4a8[3] = local_4b8 * 1.29749135e-11 +
                         local_4c8 * -2.90438853e-08 + local_15f8 * 1.9694604e-05 + -0.00299673416;
          local_4a8[4] = local_4b8 * 5.4564588e-12 +
                         local_4c8 * -1.16434e-08 + local_15f8 * 9.23587682e-06 + -0.00240131752;
          local_4a8[5] = local_4b8 * 7.08791268e-12 +
                         local_4c8 * -1.64639119e-08 + local_15f8 * 1.30408042e-05 + -0.0020364341;
          local_4a8[6] = local_4b8 * 3.7169005e-11 +
                         local_4c8 * -7.28291682e-08 + local_15f8 * 4.23165782e-05 + -0.00474912051;
          local_4a8[7] = local_4b8 * 6.74966876e-12 +
                         local_4c8 * -1.15527346e-08 + local_15f8 * 5.58979682e-06 + 0.000968872143;
          local_4a8[8] = local_4b8 * 7.77258948e-12 +
                         local_4c8 * -2.00644794e-08 + local_15f8 * 1.64659244e-05 + -0.00236661419;
          local_4a8[9] = local_4b8 * 1.01754294e-11 +
                         local_4c8 * -2.06135228e-08 + local_15f8 * 1.14604371e-05 + 0.00201095175;
          local_4a8[10] =
               local_4b8 * 6.66775824e-11 +
               local_4c8 * -1.45422908e-07 + local_15f8 * 9.83601198e-05 + -0.0136709788;
          local_4a8[0xb] =
               local_4b8 * -3.617698e-12 +
               local_4c8 * 2.72101765e-09 + local_15f8 * 2.03362866e-06 + -0.00061035368;
          local_4a8[0xc] =
               local_4b8 * -5.74798192e-13 +
               local_4c8 * 7.37757066e-09 + local_15f8 * -1.42471254e-05 + 0.00898459677;
          local_4a8[0xd] =
               local_4b8 * 1.73507546e-11 +
               local_4c8 * -3.99432279e-08 + local_15f8 * 2.75598892e-05 + -0.00324392532;
          local_4a8[0xe] =
               local_4b8 * 5.27090608e-11 +
               local_4c8 * -1.13785578e-07 + local_15f8 * 7.46440016e-05 + -0.00990833369;
          local_4a8[0xf] =
               local_4b8 * 8.30244e-12 +
               local_4c8 * -2.2132908e-08 + local_15f8 * 1.0676944e-05 + 0.007216595;
          local_4a8[0x10] =
               local_4b8 * 1.07953749e-10 +
               local_4c8 * -2.07476626e-07 + local_15f8 * 0.000114198058 + -0.00757052247;
          local_4a8[0x11] =
               local_4b8 * 9.22036016e-11 +
               local_4c8 * -1.79737982e-07 + local_15f8 * 9.94285614e-05 + -0.00418658892;
          dVar15 = local_4c8 * -2.12539886e-07 + local_15f8 * 0.000119887658 + -0.0055015427;
          dVar16 = local_4c8 * 1.6924545e-08 + local_15f8 * -7.926444e-06 + 0.0014082404;
          dVar14 = 1.07474308e-10;
          dVar25 = -9.779416e-12;
        }
        local_4a8[0x12] = local_4b8 * dVar14 + dVar15;
        local_4a8[0x13] = local_4b8 * dVar25 + dVar16;
        local_4a8[0x14] = (double)local_348._0_8_ + 0.0 + local_308 + local_2f8;
        if (1000.0 <= local_15f8) {
          local_2e8 = dVar28 * -950.158922 +
                      local_558 * 4.00510752e-15 +
                      local_4b8 * -4.48915985e-11 +
                      local_4c8 * 1.66485593e-07 + local_15f8 * -2.47012365e-05 + 2.3372792;
          dStack_2e0 = dVar28 * 25473.6599 +
                       local_558 * 9.96394714e-23 +
                       local_4b8 * -1.18378809e-18 +
                       local_4c8 * 5.38539827e-15 + local_15f8 * -1.15421486e-11 + 1.50000001;
          local_2d8 = dVar28 * 29217.5791 +
                      local_558 * 2.45667382e-16 +
                      local_4b8 * -2.50444497e-12 +
                      local_4c8 * 1.39828196e-08 + local_15f8 * -4.29870569e-05 + 1.56942078;
          dStack_2d0 = dVar28 * -1088.45772 +
                       local_558 * -4.33435588e-15 +
                       local_4b8 * 5.23676387e-11 +
                       local_4c8 * -2.52655556e-07 + local_15f8 * 0.00074154377 + 2.28253784;
          local_2c8 = dVar28 * 3858.657 +
                      local_558 * 2.34824752e-15 +
                      local_4b8 * -2.19865389e-11 +
                      local_4c8 * 4.21684093e-08 + local_15f8 * 0.000274214858 + 2.09288767;
          dStack_2c0 = dVar28 * -30004.2971 +
                       local_558 * 3.36401984e-15 +
                       local_4b8 * -2.42604967e-11 +
                       local_4c8 * -5.46908393e-08 + local_15f8 * 0.00108845902 + 2.03399249;
          local_2b8 = dVar28 * 111.856713 +
                      local_558 * -2.1581707e-15 +
                      local_4b8 * 2.85615925e-11 +
                      local_4c8 * -2.11219383e-07 + local_15f8 * 0.00111991006 + 3.0172109;
          dStack_2b0 = dVar28 * 46263.604 +
                       local_558 * -3.75455134e-15 +
                       local_4b8 * 6.50448872e-11 +
                       local_4c8 * -4.69648657e-07 + local_15f8 * 0.00182819646 + 1.87410113;
          local_2a8 = dVar28 * 50925.9997 +
                      local_558 * -6.7943273e-15 +
                      local_4b8 * 1.044765e-10 +
                      local_4c8 * -6.70639823e-07 + local_15f8 * 0.00232794318 + 1.29203842;
          dStack_2a0 = dVar28 * 16775.5843 +
                       local_558 * -9.34308788e-15 +
                       local_4b8 * 1.48921161e-10 +
                       local_4c8 * -9.95714493e-07 + local_15f8 * 0.00361995018 + 1.28571772;
          local_298 = dVar28 * -9468.34459 +
                      local_558 * -2.0363046e-14 +
                      local_4b8 * 3.05731338e-10 +
                      local_4c8 * -1.9109527e-06 + local_15f8 * 0.00669547335 + -0.925148505;
          dStack_290 = dVar28 * -14151.8724 +
                       local_558 * -4.07295432e-15 +
                       local_4b8 * 5.7513252e-11 +
                       local_4c8 * -3.32941924e-07 + local_15f8 * 0.00103126372 + 1.71518561;
          local_288 = dVar28 * -48759.166 +
                      local_558 * -9.44168328e-15 +
                      local_4b8 * 1.30872547e-10 +
                      local_4c8 * -7.38271347e-07 + local_15f8 * 0.00220718513 + 2.85746029;
          dStack_280 = dVar28 * 4011.91815 +
                       local_558 * -1.06701742e-14 +
                       local_4b8 * 1.47290445e-10 +
                       local_4c8 * -8.28152043e-07 + local_15f8 * 0.00247847763 + 1.77217438;
          local_278 = dVar28 * -13995.8323 +
                      local_558 * -1.76771128e-14 +
                      local_4b8 * 2.5160303e-10 +
                      local_4c8 * -1.47419604e-06 + local_15f8 * 0.00460000041 + 0.76069008;
          dStack_270 = dVar28 * 127.83252 +
                       local_558 * -4.225232e-15 +
                       local_4b8 * 9.8610775e-11 +
                       local_4c8 * -8.85461333e-07 + local_15f8 * 0.0039357485 + 2.770799;
          local_268 = dVar28 * 4939.88614 +
                      local_558 * -2.51412122e-14 +
                      local_4b8 * 3.68057308e-10 +
                      local_4c8 * -2.23692638e-06 + local_15f8 * 0.00732270755 + 1.03611116;
          dStack_260 = dVar28 * 12857.52 +
                       local_558 * -2.99283152e-14 +
                       local_4b8 * 4.38044223e-10 +
                       local_4c8 * -2.66068889e-06 + local_15f8 * 0.0086986361 + 0.95465642;
          dVar15 = local_558 * -3.8000578e-14 +
                   local_4b8 * 5.53530003e-10 +
                   local_4c8 * -3.3418689e-06 + local_15f8 * 0.0108426339 + 0.0718815;
          dVar16 = local_558 * -1.3506702e-15 +
                   local_4b8 * 2.5242595e-11 +
                   local_4c8 * -1.89492e-07 + local_15f8 * 0.0007439884 + 1.92664;
          dVar14 = -11426.3932;
          dVar25 = -922.7977;
        }
        else {
          local_2e8 = dVar28 * -917.935173 +
                      local_558 * -1.47522352e-12 +
                      local_4b8 * 5.03930235e-09 +
                      local_4c8 * -6.492717e-06 + local_15f8 * 0.00399026037 + 1.34433112;
          dStack_2e0 = dVar28 * 25473.6599 +
                       local_558 * -1.85546466e-22 +
                       local_4b8 * 5.7520408e-19 +
                       local_4c8 * -6.65306547e-16 + local_15f8 * 3.52666409e-13 + 1.5;
          local_2d8 = dVar28 * 29122.2592 +
                      local_558 * 4.22531942e-13 +
                      local_4b8 * -1.53201656e-09 +
                      local_4c8 * 2.21435465e-06 + local_15f8 * -0.00163965942 + 2.1682671;
          dStack_2d0 = dVar28 * -1063.94356 +
                       local_558 * 6.48745674e-13 +
                       local_4b8 * -2.42032377e-09 +
                       local_4c8 * 3.282434e-06 + local_15f8 * -0.00149836708 + 2.78245636;
          local_2c8 = dVar28 * 3615.08056 +
                      local_558 * 2.7282294e-13 +
                      local_4b8 * -9.70283332e-10 +
                      local_4c8 * 1.5393128e-06 + local_15f8 * -0.00120065876 + 2.99201543;
          dStack_2c0 = dVar28 * -30293.7267 +
                       local_558 * 3.54395634e-13 +
                       local_4b8 * -1.37199266e-09 +
                       local_4c8 * 2.17346737e-06 + local_15f8 * -0.00101821705 + 3.19864056;
          local_2b8 = dVar28 * 294.80804 +
                      local_558 * 1.85845025e-12 +
                      local_4b8 * -6.06909735e-09 +
                      local_4c8 * 7.05276303e-06 + local_15f8 * -0.00237456025 + 3.30179801;
          dStack_2b0 = dVar28 * 46004.0401 +
                       local_558 * 3.37483438e-13 +
                       local_4b8 * -9.62727883e-10 +
                       local_4c8 * 9.31632803e-07 + local_15f8 * 0.000484436072 + 2.76267867;
          local_2a8 = dVar28 * 50496.8163 +
                      local_558 * 3.88629474e-13 +
                      local_4b8 * -1.67203995e-09 +
                      local_4c8 * 2.74432073e-06 + local_15f8 * -0.0011833071 + 3.19860411;
          dStack_2a0 = dVar28 * 16444.9988 +
                       local_558 * 5.08771468e-13 +
                       local_4b8 * -1.71779356e-09 +
                       local_4c8 * 1.91007285e-06 + local_15f8 * 0.00100547588 + 2.6735904;
          local_298 = dVar28 * -10246.6476 +
                      local_558 * 3.33387912e-12 +
                      local_4b8 * -1.21185757e-08 +
                      local_4c8 * 1.63933533e-05 + local_15f8 * -0.0068354894 + 4.14987613;
          dStack_290 = dVar28 * -14344.086 +
                       local_558 * -1.808849e-13 +
                       local_4b8 * 2.26751471e-10 +
                       local_4c8 * 3.3893811e-07 + local_15f8 * -0.00030517684 + 2.57953347;
          local_288 = dVar28 * -48371.9697 +
                      local_558 * -2.87399096e-14 +
                      local_4b8 * 6.14797555e-10 +
                      local_4c8 * -2.3745209e-06 + local_15f8 * 0.00449229839 + 1.35677352;
          dStack_280 = dVar28 * 3839.56496 +
                       local_558 * 8.6753773e-13 +
                       local_4b8 * -3.32860233e-09 +
                       local_4c8 * 4.59331487e-06 + local_15f8 * -0.00162196266 + 3.22118584;
          local_278 = dVar28 * -14308.9567 +
                      local_558 * 2.63545304e-12 +
                      local_4b8 * -9.48213152e-09 +
                      local_4c8 * 1.24406669e-05 + local_15f8 * -0.00495416684 + 3.79372315;
          dStack_270 = dVar28 * 978.6011 +
                       local_558 * 4.15122e-13 +
                       local_4b8 * -1.844409e-09 +
                       local_4c8 * 1.77949067e-06 + local_15f8 * 0.0036082975 + 1.106204;
          local_268 = dVar28 * 5089.77593 +
                      local_558 * 5.39768746e-12 +
                      local_4b8 * -1.72897188e-08 +
                      local_4c8 * 1.90330097e-05 + local_15f8 * -0.00378526124 + 2.95920148;
          dStack_260 = dVar28 * 12841.6265 +
                       local_558 * 4.61018008e-12 +
                       local_4b8 * -1.49781651e-08 +
                       local_4c8 * 1.65714269e-05 + local_15f8 * -0.00209329446 + 3.30646568;
          dVar15 = local_558 * 5.37371542e-12 +
                   local_4b8 * -1.77116571e-08 +
                   local_4c8 * 1.99812763e-05 + local_15f8 * -0.00275077135 + 3.29142492;
          dVar16 = local_558 * -4.889708e-13 +
                   local_4b8 * 1.41037875e-09 +
                   local_4c8 * -1.321074e-06 + local_15f8 * 0.0007041202 + 2.298677;
          dVar14 = -11522.2055;
          dVar25 = -1020.8999;
        }
        local_258 = dVar28 * dVar14 + dVar15;
        dStack_250 = dVar28 * dVar25 + dVar16;
        local_248 = dVar28 * -745.375 +
                    local_318 + local_2f8 + local_308 + (double)local_348._0_8_ + 1.5;
        pdVar6 = &local_2e8;
      }
      dVar25 = 0.0;
      dVar15 = 0.0;
      dVar14 = 0.0;
      lVar5 = 0;
      dVar16 = 0.0;
      do {
        dVar16 = dVar16 + *(double *)((long)local_3f8 + lVar5) *
                          *(double *)((long)local_1948 + lVar5);
        dVar17 = *(double *)((long)pdVar6 + lVar5);
        dVar25 = dVar25 + *(double *)((long)local_1948 + lVar5) *
                          *(double *)((long)local_4a8 + lVar5);
        dVar15 = dVar15 + *(double *)((long)local_1888 + lVar5) * dVar17;
        dVar14 = dVar14 + (*(double *)((long)local_3f8 + lVar5) - dVar17) * dVar28 *
                          *(double *)((long)local_1888 + lVar5) +
                          dVar17 * *(double *)((long)local_618 + lVar5);
        lVar5 = lVar5 + 8;
      } while (lVar5 != 0xa8);
      dVar15 = dVar15 * (1.0 / dVar16);
      dVar16 = local_15f8 * (1.0 / dVar16);
      dVar28 = dVar15 * dVar16;
      lVar5 = 0;
      pdVar7 = local_1488;
      do {
        dVar17 = 0.0;
        lVar10 = 0;
        do {
          dVar17 = dVar17 + pdVar6[lVar10] * pdVar7[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x15);
        local_13e0[lVar5 * 0x16] = local_3f8[lVar5] * dVar28 + dVar17 * -dVar16;
        lVar5 = lVar5 + 1;
        pdVar7 = pdVar7 + 0x16;
      } while (lVar5 != 0x15);
      local_570 = (dVar28 * dVar25 - dVar15) - dVar16 * dVar14;
      pdVar6 = local_13e0;
      lVar5 = 0;
      do {
        local_618[lVar5] = local_618[lVar5] * 1e-06;
        *pdVar6 = *pdVar6 * 1000000.0;
        lVar5 = lVar5 + 1;
        pdVar6 = pdVar6 + 0x16;
      } while (lVar5 != 0x15);
      lVar5 = *(long *)((long)local_4e0->content + 0x18);
      lVar10 = 0;
      pdVar6 = local_1488;
      do {
        lVar2 = *(long *)(lVar8 * 0xb0 + lVar5 + lVar10 * 8);
        dVar14 = local_238[lVar10];
        lVar11 = 0;
        do {
          *(double *)(lVar2 + lVar9 + lVar11 * 8) = (pdVar6[lVar11] * local_238[lVar11]) / dVar14;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x15);
        *(double *)(lVar2 + 0xa8 + lVar8 * 0xb0) =
             local_1488[lVar10 * 0x16 + 0x15] / local_238[lVar10];
        lVar10 = lVar10 + 1;
        pdVar6 = pdVar6 + 0x16;
      } while (lVar10 != 0x15);
      lVar8 = *(long *)(*(long *)((long)local_4e0->content + 0x18) + 0xa8 + lVar8 * 0xb0);
      lVar5 = 0;
      do {
        *(double *)(lVar8 + lVar9 + lVar5 * 8) = local_618[lVar5] * local_238[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x15);
      lVar8 = local_320 + 1;
      prVar4 = prVar4 + 0x16;
      lVar9 = lVar9 + 0xb0;
    } while (lVar8 != local_330);
  }
  return 0;
}

Assistant:

int
cJac(
  amrex::Real /* tn */,
  N_Vector u,
  N_Vector /* fu */,
  SUNMatrix J,
  void* user_data,
  N_Vector /* tmp1 */,
  N_Vector /* tmp2 */,
  N_Vector /* tmp3 */)
{
  BL_PROFILE("Pele::ReactorCvode::cJacDense()");

  // Make local copies of pointers to input data
  amrex::Real* ydata = N_VGetArrayPointer(u);

  // Make local copies of pointers in user_data
  auto* udata = static_cast<CVODEUserData*>(user_data);
  auto ncells = udata->ncells;
  auto reactor_type = udata->reactor_type;

  for (int tid = 0; tid < ncells; tid++) {
    // Offset in case several cells
    int offset = tid * (NUM_SPECIES + 1);

    // MW CGS
    amrex::Real mw[NUM_SPECIES] = {0.0};
    get_mw(mw);

    // rho MKS
    amrex::Real rho = 0.0;
    for (int i = 0; i < NUM_SPECIES; i++) {
      rho = rho + ydata[offset + i];
    }

    amrex::Real temp = ydata[offset + NUM_SPECIES];

    amrex::Real massfrac[NUM_SPECIES] = {0.0};
    // Yks
    for (int i = 0; i < NUM_SPECIES; i++) {
      massfrac[i] = ydata[offset + i] / rho;
    }

    // Jac
    amrex::Real Jmat_tmp[(NUM_SPECIES + 1) * (NUM_SPECIES + 1)] = {0.0};
    const int consP =
      static_cast<int>(reactor_type == ReactorTypes::h_reactor_type);
    auto eos = pele::physics::PhysicsType::eos();
    eos.RTY2JAC(rho, temp, massfrac, Jmat_tmp, consP);

    // fill the sunMat and scale
    for (int i = 0; i < NUM_SPECIES; i++) {
      // cppcheck-suppress cstyleCast
      amrex::Real* J_col = SM_COLUMN_D(J, offset + i);
      for (int k = 0; k < NUM_SPECIES; k++) {
        J_col[offset + k] = Jmat_tmp[i * (NUM_SPECIES + 1) + k] * mw[k] / mw[i];
      }
      J_col[offset + NUM_SPECIES] =
        Jmat_tmp[i * (NUM_SPECIES + 1) + NUM_SPECIES] / mw[i];
    }
    // cppcheck-suppress cstyleCast
    amrex::Real* J_col = SM_COLUMN_D(J, offset + NUM_SPECIES);
    for (int i = 0; i < NUM_SPECIES; i++) {
      J_col[offset + i] = Jmat_tmp[NUM_SPECIES * (NUM_SPECIES + 1) + i] * mw[i];
    }
    // J_col = SM_COLUMN_D(J, offset); // Never read
  }

  return (0);
}